

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

vbool<8>_conflict __thiscall
embree::avx512::InstanceArrayIntersectorKMB<8>::occluded
          (InstanceArrayIntersectorKMB<8> *this,vbool<8>_conflict *valid_i,Precalculations *pre,
          RayK<8> *ray,RayQueryContext *context,Primitive_conflict4 *prim)

{
  long *plVar1;
  BBox1f BVar2;
  int iVar3;
  Geometry *pGVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [12];
  byte bVar144;
  undefined8 in_RAX;
  ulong uVar146;
  long lVar147;
  byte bVar148;
  ulong uVar149;
  ulong uVar150;
  uint uVar151;
  undefined1 auVar152 [16];
  uint uVar232;
  uint uVar233;
  uint uVar235;
  float fVar236;
  uint uVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  uint uVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar160 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  uint uVar234;
  uint uVar247;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar248;
  float fVar249;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [16];
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar259;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined4 uVar263;
  undefined1 auVar264 [16];
  undefined1 auVar268 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar273 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar307 [32];
  undefined1 auVar306 [16];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 in_ZMM6 [64];
  float fVar310;
  float fVar311;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar326;
  float fVar327;
  undefined1 auVar314 [32];
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  undefined1 in_ZMM7 [64];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar334 [16];
  undefined1 auVar338 [32];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar342;
  undefined1 auVar341 [32];
  undefined1 in_ZMM10 [64];
  float fVar343;
  undefined1 auVar344 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  float fVar354;
  undefined1 auVar348 [32];
  undefined1 auVar345 [16];
  undefined1 auVar349 [32];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 in_ZMM11 [64];
  undefined1 auVar359 [16];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 in_ZMM14 [64];
  undefined1 auVar369 [64];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar372 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar373 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar386 [16];
  undefined1 in_ZMM31 [64];
  undefined1 auVar387 [64];
  vint<8> itime_k;
  RayQueryContext newcontext;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  uint uStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  uint uStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  uint uStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  uint uStack_84;
  _func_int *local_68;
  RTCRayQueryContext *local_60;
  RTCIntersectArguments *local_58;
  ulong uVar145;
  undefined1 auVar212 [32];
  undefined1 auVar161 [32];
  undefined1 auVar191 [32];
  undefined1 auVar193 [32];
  undefined1 auVar202 [32];
  
  auVar186 = in_ZMM10._0_32_;
  auVar159 = in_ZMM22._0_32_;
  auVar179 = in_ZMM21._0_32_;
  auVar181 = in_ZMM23._0_32_;
  auVar178 = in_ZMM20._0_32_;
  auVar158 = in_ZMM6._0_32_;
  auVar180 = in_ZMM26._0_32_;
  auVar182 = in_ZMM27._0_32_;
  auVar177 = in_ZMM16._0_32_;
  auVar176 = in_ZMM15._0_32_;
  auVar175 = in_ZMM13._0_32_;
  uVar151 = prim->primID_;
  uVar232 = prim->instID_;
  pGVar4 = (context->scene->geometries).items[uVar232].ptr;
  local_68 = *(_func_int **)&pGVar4->field_0x58;
  if ((local_68 != (_func_int *)0x0) ||
     ((uVar145 = (ulong)*(uint *)(*(long *)&pGVar4[1].time_range.upper +
                                 (long)pGVar4[1].intersectionFilterN * (ulong)uVar151),
      uVar145 != 0xffffffff &&
      (local_68 = pGVar4[1].super_RefCount._vptr_RefCount[uVar145], local_68 != (_func_int *)0x0))))
  {
    uVar233 = pGVar4->mask;
    auVar183._4_4_ = uVar233;
    auVar183._0_4_ = uVar233;
    auVar183._8_4_ = uVar233;
    auVar183._12_4_ = uVar233;
    auVar183._16_4_ = uVar233;
    auVar183._20_4_ = uVar233;
    auVar183._24_4_ = uVar233;
    auVar183._28_4_ = uVar233;
    uVar16 = vptestmd_avx512vl(auVar183,*(undefined1 (*) [32])(ray + 0x120));
    bVar144 = valid_i->v & (byte)uVar16;
    uVar145 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar144);
    if (bVar144 != 0) {
      pRVar5 = context->user;
      *this = (InstanceArrayIntersectorKMB<8>)0x0;
      if (pRVar5->instID[0] == 0xffffffff) {
        pRVar5->instID[0] = uVar232;
        pRVar5->instPrimID[0] = uVar151;
        uVar146 = (ulong)prim->primID_;
        if ((pGVar4->field_8).field_0x1 == '\x01') {
          BVar2 = pGVar4->time_range;
          auVar157._8_8_ = 0;
          auVar157._0_4_ = BVar2.lower;
          auVar157._4_4_ = BVar2.upper;
          fVar249 = BVar2.lower;
          auVar175._4_4_ = fVar249;
          auVar175._0_4_ = fVar249;
          auVar175._8_4_ = fVar249;
          auVar175._12_4_ = fVar249;
          auVar175._16_4_ = fVar249;
          auVar175._20_4_ = fVar249;
          auVar175._24_4_ = fVar249;
          auVar175._28_4_ = fVar249;
          fVar249 = pGVar4->fnumTimeSegments;
          auVar175 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar175);
          auVar152 = vmovshdup_avx(auVar157);
          auVar152 = vsubps_avx(auVar152,auVar157);
          auVar177._0_4_ = auVar152._0_4_;
          auVar177._4_4_ = auVar177._0_4_;
          auVar177._8_4_ = auVar177._0_4_;
          auVar177._12_4_ = auVar177._0_4_;
          auVar177._16_4_ = auVar177._0_4_;
          auVar177._20_4_ = auVar177._0_4_;
          auVar177._24_4_ = auVar177._0_4_;
          auVar177._28_4_ = auVar177._0_4_;
          auVar175 = vdivps_avx(auVar175,auVar177);
          auVar176._4_4_ = fVar249 * auVar175._4_4_;
          auVar176._0_4_ = fVar249 * auVar175._0_4_;
          auVar176._8_4_ = fVar249 * auVar175._8_4_;
          auVar176._12_4_ = fVar249 * auVar175._12_4_;
          auVar176._16_4_ = fVar249 * auVar175._16_4_;
          auVar176._20_4_ = fVar249 * auVar175._20_4_;
          auVar176._24_4_ = fVar249 * auVar175._24_4_;
          auVar176._28_4_ = auVar175._28_4_;
          auVar175 = vroundps_avx(auVar176,1);
          fVar249 = fVar249 + -1.0;
          auVar180._4_4_ = fVar249;
          auVar180._0_4_ = fVar249;
          auVar180._8_4_ = fVar249;
          auVar180._12_4_ = fVar249;
          auVar180._16_4_ = fVar249;
          auVar180._20_4_ = fVar249;
          auVar180._24_4_ = fVar249;
          auVar180._28_4_ = fVar249;
          auVar175 = vminps_avx(auVar175,auVar180);
          auVar278 = ZEXT1264(ZEXT412(0)) << 0x20;
          auVar175 = vmaxps_avx(auVar175,ZEXT1232(ZEXT412(0)) << 0x20);
          auVar176 = vsubps_avx(auVar176,auVar175);
          local_140 = vcvtps2dq_avx(auVar175);
          uVar151 = 0;
          for (uVar232 = (uint)bVar144; (uVar232 & 1) == 0; uVar232 = uVar232 >> 1 | 0x80000000) {
            uVar151 = uVar151 + 1;
          }
          auVar175 = vpbroadcastd_avx512vl();
          auVar285 = ZEXT3264(auVar175);
          uVar16 = vpcmpeqd_avx512vl(local_140,auVar175);
          fVar249 = auVar176._0_4_;
          fVar257 = auVar176._4_4_;
          fVar258 = auVar176._8_4_;
          fVar259 = auVar176._12_4_;
          fVar260 = auVar176._16_4_;
          fVar261 = auVar176._20_4_;
          fVar262 = auVar176._24_4_;
          if ((byte)(~bVar144 | (byte)uVar16) == 0xff) {
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28);
              auVar175 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28);
              local_140 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28);
              auVar158 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28);
              auVar186 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar270._8_8_ = 0;
              auVar270._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
              auVar300._8_8_ = 0;
              auVar300._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                            auVar270);
              auVar175 = ZEXT1632(auVar152);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),_DAT_01fefe80,
                                            auVar300);
              local_140 = ZEXT1632(auVar152);
              auVar271._8_8_ = 0;
              auVar271._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),_DAT_01fefe80
                                            ,auVar271);
              auVar158 = ZEXT1632(auVar152);
              auVar272._8_8_ = 0;
              auVar272._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),_DAT_01fefe80
                                            ,auVar272);
              auVar186 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar266._8_8_ = 0;
              auVar266._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
              auVar152 = vinsertps_avx(auVar266,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
              auVar267._8_8_ = 0;
              auVar267._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
              auVar153 = vpermt2ps_avx512vl(auVar267,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar147)));
              auVar305._8_8_ = 0;
              auVar305._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
              fVar343 = *(float *)(lVar6 + 0x24 + lVar147);
              fVar350 = *(float *)(lVar6 + 0x28 + lVar147);
              fVar352 = *(float *)(lVar6 + 0x2c + lVar147);
              auVar154 = vpermt2ps_avx512vl(auVar305,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
              fVar354 = *(float *)(lVar6 + 0x30 + lVar147);
              auVar157 = vfmadd231ss_fma(ZEXT416((uint)(fVar350 * fVar350)),ZEXT416((uint)fVar343),
                                         ZEXT416((uint)fVar343));
              auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar352),ZEXT416((uint)fVar352));
              auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar354),ZEXT416((uint)fVar354));
              auVar155 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar157._0_4_));
              fVar356 = auVar155._0_4_;
              fVar356 = fVar356 * 1.5 + fVar356 * fVar356 * fVar356 * auVar157._0_4_ * -0.5;
              auVar157 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar343 * fVar356)),0x30);
              auVar186 = ZEXT1632(auVar157);
              auVar157 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar350 * fVar356)),0x30);
              auVar175 = ZEXT1632(auVar157);
              auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar354 * fVar356)),0x30);
              auVar158 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
              auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar352 * fVar356)),0x30);
              local_140 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar175 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar147));
              local_140 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
              auVar158 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
              auVar186 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
            }
            local_260._4_4_ = auVar175._0_4_;
            auVar363._8_4_ = 1;
            auVar363._0_8_ = 0x100000001;
            auVar363._12_4_ = 1;
            auVar363._16_4_ = 1;
            auVar363._20_4_ = 1;
            auVar363._24_4_ = 1;
            auVar363._28_4_ = 1;
            auVar177 = vpermps_avx2(auVar363,auVar175);
            auVar368._8_4_ = 2;
            auVar368._0_8_ = 0x200000002;
            auVar368._12_4_ = 2;
            auVar368._16_4_ = 2;
            auVar368._20_4_ = 2;
            auVar368._24_4_ = 2;
            auVar368._28_4_ = 2;
            auVar180 = vpermps_avx2(auVar368,auVar175);
            auVar187 = vbroadcastss_avx512vl(ZEXT416(3));
            auVar188 = vpermps_avx512vl(auVar187,auVar175);
            local_2a0._4_4_ = local_140._0_4_;
            auVar175 = vpermps_avx2(auVar363,local_140);
            auVar182 = vpermps_avx2(auVar368,local_140);
            auVar189 = vpermps_avx512vl(auVar187,local_140);
            local_240._4_4_ = auVar158._0_4_;
            auVar183 = vpermps_avx2(auVar363,auVar158);
            auVar184 = vpermps_avx2(auVar368,auVar158);
            auVar200 = vpermps_avx512vl(auVar187,auVar158);
            local_280._4_4_ = auVar186._0_4_;
            auVar158 = vpermps_avx2(auVar363,auVar186);
            auVar185 = vpermps_avx2(auVar368,auVar186);
            auVar186 = vpermps_avx512vl(auVar187,auVar186);
            iVar3 = (int)plVar1[0xb];
            local_260._0_4_ = local_260._4_4_;
            local_260._8_4_ = local_260._4_4_;
            local_260._12_4_ = local_260._4_4_;
            local_260._16_4_ = local_260._4_4_;
            local_260._20_4_ = local_260._4_4_;
            local_260._24_4_ = local_260._4_4_;
            local_260._28_4_ = local_260._4_4_;
            local_280._0_4_ = local_280._4_4_;
            uStack_278._0_4_ = local_280._4_4_;
            uStack_278._4_4_ = local_280._4_4_;
            uStack_270._0_4_ = local_280._4_4_;
            uStack_270._4_4_ = local_280._4_4_;
            uStack_268._0_4_ = local_280._4_4_;
            uStack_268._4_4_ = local_280._4_4_;
            local_2a0._0_4_ = local_2a0._4_4_;
            local_2a0._8_4_ = local_2a0._4_4_;
            local_2a0._12_4_ = local_2a0._4_4_;
            local_2a0._16_4_ = local_2a0._4_4_;
            local_2a0._20_4_ = local_2a0._4_4_;
            local_2a0._24_4_ = local_2a0._4_4_;
            local_2a0._28_4_ = local_2a0._4_4_;
            local_240._0_4_ = local_240._4_4_;
            uStack_238._0_4_ = local_240._4_4_;
            uStack_238._4_4_ = local_240._4_4_;
            uStack_230._0_4_ = local_240._4_4_;
            uStack_230._4_4_ = local_240._4_4_;
            uStack_228._0_4_ = local_240._4_4_;
            uStack_228._4_4_ = local_240._4_4_;
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar147 = uVar146 * plVar1[9];
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28)
              ;
              auVar178 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28)
              ;
              auVar181 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28)
              ;
              auVar179 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28)
              ;
              auVar159 = ZEXT1632(auVar152);
            }
            else {
              auVar202._16_16_ = auVar186._16_16_;
              if (iVar3 == 0x9234) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar334._8_8_ = 0;
                auVar334._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                auVar359._8_8_ = 0;
                auVar359._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                              auVar334);
                auVar178 = ZEXT1632(auVar152);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                              _DAT_01fefe80,auVar359);
                auVar181 = ZEXT1632(auVar152);
                auVar335._8_8_ = 0;
                auVar335._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                              _DAT_01fefe80,auVar335);
                auVar179 = ZEXT1632(auVar152);
                auVar336._8_8_ = 0;
                auVar336._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                              _DAT_01fefe80,auVar336);
                auVar159 = ZEXT1632(auVar152);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar337._8_8_ = 0;
                auVar337._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vinsertps_avx(auVar337,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
                auVar344._8_8_ = 0;
                auVar344._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                auVar153 = vpermt2ps_avx512vl(auVar344,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar147)));
                uVar151 = *(uint *)(lVar6 + 0x24 + lVar147);
                uVar232 = *(uint *)(lVar6 + 0x28 + lVar147);
                uVar233 = *(uint *)(lVar6 + 0x2c + lVar147);
                auVar373._8_8_ = 0;
                auVar373._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar154 = vpermt2ps_avx512vl(auVar373,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                fVar343 = *(float *)(lVar6 + 0x30 + lVar147);
                auVar157 = vmulss_avx512f(ZEXT416(uVar232),ZEXT416(uVar232));
                auVar157 = vfmadd231ss_avx512f(auVar157,ZEXT416(uVar151),ZEXT416(uVar151));
                auVar157 = vfmadd231ss_avx512f(auVar157,ZEXT416(uVar233),ZEXT416(uVar233));
                auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar343),ZEXT416((uint)fVar343));
                auVar202._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
                auVar201._4_28_ = auVar202._4_28_;
                auVar201._0_4_ = auVar157._0_4_;
                auVar155 = vrsqrt14ss_avx512f(auVar202._0_16_,auVar201._0_16_);
                auVar156 = vmulss_avx512f(auVar155,ZEXT416(0x3fc00000));
                auVar157 = vmulss_avx512f(auVar155,ZEXT416((uint)(auVar157._0_4_ * -0.5)));
                auVar155 = vmulss_avx512f(auVar155,auVar155);
                auVar157 = vmulss_avx512f(auVar155,auVar157);
                auVar155 = vaddss_avx512f(auVar156,auVar157);
                auVar157 = vmulss_avx512f(ZEXT416(uVar151),auVar155);
                auVar157 = vinsertps_avx512f(auVar154,auVar157,0x30);
                auVar159 = ZEXT1632(auVar157);
                auVar157 = vmulss_avx512f(ZEXT416(uVar232),auVar155);
                auVar157 = vinsertps_avx512f(auVar153,auVar157,0x30);
                auVar178 = ZEXT1632(auVar157);
                auVar157 = vmulss_avx512f(ZEXT416(uVar233),auVar155);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416((uint)(fVar343 * auVar155._0_4_)),0x30
                                            );
                auVar179 = ZEXT1632(auVar152);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
                auVar152 = vinsertps_avx512f(auVar152,auVar157,0x30);
                auVar181 = ZEXT1632(auVar152);
              }
              else if (iVar3 == 0x9244) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar178 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar147));
                auVar181 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
                auVar179 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
                auVar159 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
              }
            }
            auVar203 = vpermps_avx512vl(auVar187,auVar178);
            auVar204 = vpermps_avx512vl(auVar187,auVar181);
            auVar205 = vpermps_avx512vl(auVar187,auVar179);
            auVar206 = vpermps_avx512vl(auVar187,auVar159);
            auVar207 = vmulps_avx512vl(auVar186,auVar206);
            auVar208 = vmulps_avx512vl(auVar188,auVar203);
            auVar209 = vmulps_avx512vl(auVar189,auVar204);
            auVar210 = vmulps_avx512vl(auVar200,auVar205);
            fVar343 = auVar210._0_4_;
            auVar347._0_4_ = fVar343 + auVar209._0_4_ + auVar208._0_4_ + auVar207._0_4_;
            fVar350 = auVar210._4_4_;
            auVar347._4_4_ = fVar350 + auVar209._4_4_ + auVar208._4_4_ + auVar207._4_4_;
            fVar352 = auVar210._8_4_;
            auVar347._8_4_ = fVar352 + auVar209._8_4_ + auVar208._8_4_ + auVar207._8_4_;
            fVar354 = auVar210._12_4_;
            auVar347._12_4_ = fVar354 + auVar209._12_4_ + auVar208._12_4_ + auVar207._12_4_;
            fVar356 = auVar210._16_4_;
            auVar347._16_4_ = fVar356 + auVar209._16_4_ + auVar208._16_4_ + auVar207._16_4_;
            fVar357 = auVar210._20_4_;
            auVar347._20_4_ = fVar357 + auVar209._20_4_ + auVar208._20_4_ + auVar207._20_4_;
            fVar358 = auVar210._24_4_;
            auVar347._24_4_ = fVar358 + auVar209._24_4_ + auVar208._24_4_ + auVar207._24_4_;
            auVar347._28_4_ = auVar210._28_4_ + auVar209._28_4_ + auVar208._28_4_ + auVar207._28_4_;
            auVar18._8_4_ = 0x7fffffff;
            auVar18._0_8_ = 0x7fffffff7fffffff;
            auVar18._12_4_ = 0x7fffffff;
            auVar18._16_4_ = 0x7fffffff;
            auVar18._20_4_ = 0x7fffffff;
            auVar18._24_4_ = 0x7fffffff;
            auVar18._28_4_ = 0x7fffffff;
            vandps_avx512vl(auVar347,auVar18);
            auVar209 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar19._8_4_ = 0xbb8d3753;
            auVar19._0_8_ = 0xbb8d3753bb8d3753;
            auVar19._12_4_ = 0xbb8d3753;
            auVar19._16_4_ = 0xbb8d3753;
            auVar19._20_4_ = 0xbb8d3753;
            auVar19._24_4_ = 0xbb8d3753;
            auVar19._28_4_ = 0xbb8d3753;
            auVar207 = vmulps_avx512vl(auVar210,auVar19);
            auVar20._8_4_ = 0x3c9df1b8;
            auVar20._0_8_ = 0x3c9df1b83c9df1b8;
            auVar20._12_4_ = 0x3c9df1b8;
            auVar20._16_4_ = 0x3c9df1b8;
            auVar20._20_4_ = 0x3c9df1b8;
            auVar20._24_4_ = 0x3c9df1b8;
            auVar20._28_4_ = 0x3c9df1b8;
            auVar207 = vaddps_avx512vl(auVar207,auVar20);
            auVar60._4_4_ = fVar350 * auVar207._4_4_;
            auVar60._0_4_ = fVar343 * auVar207._0_4_;
            auVar60._8_4_ = fVar352 * auVar207._8_4_;
            auVar60._12_4_ = fVar354 * auVar207._12_4_;
            auVar60._16_4_ = fVar356 * auVar207._16_4_;
            auVar60._20_4_ = fVar357 * auVar207._20_4_;
            auVar60._24_4_ = fVar358 * auVar207._24_4_;
            auVar60._28_4_ = auVar207._28_4_;
            auVar21._8_4_ = 0xbd37e81c;
            auVar21._0_8_ = 0xbd37e81cbd37e81c;
            auVar21._12_4_ = 0xbd37e81c;
            auVar21._16_4_ = 0xbd37e81c;
            auVar21._20_4_ = 0xbd37e81c;
            auVar21._24_4_ = 0xbd37e81c;
            auVar21._28_4_ = 0xbd37e81c;
            auVar207 = vaddps_avx512vl(auVar60,auVar21);
            auVar61._4_4_ = fVar350 * auVar207._4_4_;
            auVar61._0_4_ = fVar343 * auVar207._0_4_;
            auVar61._8_4_ = fVar352 * auVar207._8_4_;
            auVar61._12_4_ = fVar354 * auVar207._12_4_;
            auVar61._16_4_ = fVar356 * auVar207._16_4_;
            auVar61._20_4_ = fVar357 * auVar207._20_4_;
            auVar61._24_4_ = fVar358 * auVar207._24_4_;
            auVar61._28_4_ = auVar207._28_4_;
            auVar22._8_4_ = 0x3db3edac;
            auVar22._0_8_ = 0x3db3edac3db3edac;
            auVar22._12_4_ = 0x3db3edac;
            auVar22._16_4_ = 0x3db3edac;
            auVar22._20_4_ = 0x3db3edac;
            auVar22._24_4_ = 0x3db3edac;
            auVar22._28_4_ = 0x3db3edac;
            auVar207 = vaddps_avx512vl(auVar61,auVar22);
            auVar62._4_4_ = fVar350 * auVar207._4_4_;
            auVar62._0_4_ = fVar343 * auVar207._0_4_;
            auVar62._8_4_ = fVar352 * auVar207._8_4_;
            auVar62._12_4_ = fVar354 * auVar207._12_4_;
            auVar62._16_4_ = fVar356 * auVar207._16_4_;
            auVar62._20_4_ = fVar357 * auVar207._20_4_;
            auVar62._24_4_ = fVar358 * auVar207._24_4_;
            auVar62._28_4_ = auVar207._28_4_;
            auVar23._8_4_ = 0xbe5ba881;
            auVar23._0_8_ = 0xbe5ba881be5ba881;
            auVar23._12_4_ = 0xbe5ba881;
            auVar23._16_4_ = 0xbe5ba881;
            auVar23._20_4_ = 0xbe5ba881;
            auVar23._24_4_ = 0xbe5ba881;
            auVar23._28_4_ = 0xbe5ba881;
            auVar207 = vaddps_avx512vl(auVar62,auVar23);
            auVar63._4_4_ = fVar350 * auVar207._4_4_;
            auVar63._0_4_ = fVar343 * auVar207._0_4_;
            auVar63._8_4_ = fVar352 * auVar207._8_4_;
            auVar63._12_4_ = fVar354 * auVar207._12_4_;
            auVar63._16_4_ = fVar356 * auVar207._16_4_;
            auVar63._20_4_ = fVar357 * auVar207._20_4_;
            auVar63._24_4_ = fVar358 * auVar207._24_4_;
            auVar63._28_4_ = auVar207._28_4_;
            auVar24._8_4_ = 0x3fc90fd1;
            auVar24._0_8_ = 0x3fc90fd13fc90fd1;
            auVar24._12_4_ = 0x3fc90fd1;
            auVar24._16_4_ = 0x3fc90fd1;
            auVar24._20_4_ = 0x3fc90fd1;
            auVar24._24_4_ = 0x3fc90fd1;
            auVar24._28_4_ = 0x3fc90fd1;
            auVar208 = vaddps_avx512vl(auVar63,auVar24);
            uVar146 = vcmpps_avx512vl(auVar210,auVar209,6);
            auVar207 = vsubps_avx512vl(auVar209,auVar210);
            auVar207 = vsqrtps_avx(auVar207);
            auVar64._4_4_ = auVar207._4_4_ * auVar208._4_4_;
            auVar64._0_4_ = auVar207._0_4_ * auVar208._0_4_;
            auVar64._8_4_ = auVar207._8_4_ * auVar208._8_4_;
            auVar64._12_4_ = auVar207._12_4_ * auVar208._12_4_;
            auVar64._16_4_ = auVar207._16_4_ * auVar208._16_4_;
            auVar64._20_4_ = auVar207._20_4_ * auVar208._20_4_;
            auVar64._24_4_ = auVar207._24_4_ * auVar208._24_4_;
            auVar64._28_4_ = auVar208._28_4_;
            auVar339._8_4_ = 0x80000000;
            auVar339._0_8_ = 0x8000000080000000;
            auVar339._12_4_ = 0x80000000;
            auVar339._16_4_ = 0x80000000;
            auVar339._20_4_ = 0x80000000;
            auVar339._24_4_ = 0x80000000;
            auVar339._28_4_ = 0x80000000;
            auVar208 = vxorps_avx512vl(auVar347,auVar339);
            auVar328 = ZEXT816(0) << 0x40;
            auVar210 = vmaxps_avx512vl(auVar208,auVar347);
            uVar149 = vcmpps_avx512vl(auVar210,ZEXT1632(auVar328),1);
            auVar274._8_4_ = 0x3fc90fdb;
            auVar274._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar274._12_4_ = 0x3fc90fdb;
            auVar274._16_4_ = 0x3fc90fdb;
            auVar274._20_4_ = 0x3fc90fdb;
            auVar274._24_4_ = 0x3fc90fdb;
            auVar274._28_4_ = 0x3fc90fdb;
            auVar207 = vsubps_avx(auVar274,auVar64);
            auVar207 = vmaxps_avx(ZEXT1632(auVar328),auVar207);
            auVar211 = vxorps_avx512vl(auVar207,auVar339);
            bVar7 = (bool)((byte)uVar149 & 1);
            auVar212._0_4_ = (uint)bVar7 * auVar211._0_4_ | (uint)!bVar7 * auVar207._0_4_;
            bVar7 = (bool)((byte)(uVar149 >> 1) & 1);
            auVar212._4_4_ = (uint)bVar7 * auVar211._4_4_ | (uint)!bVar7 * auVar207._4_4_;
            bVar7 = (bool)((byte)(uVar149 >> 2) & 1);
            auVar212._8_4_ = (uint)bVar7 * auVar211._8_4_ | (uint)!bVar7 * auVar207._8_4_;
            bVar7 = (bool)((byte)(uVar149 >> 3) & 1);
            auVar212._12_4_ = (uint)bVar7 * auVar211._12_4_ | (uint)!bVar7 * auVar207._12_4_;
            bVar7 = (bool)((byte)(uVar149 >> 4) & 1);
            auVar212._16_4_ = (uint)bVar7 * auVar211._16_4_ | (uint)!bVar7 * auVar207._16_4_;
            bVar7 = (bool)((byte)(uVar149 >> 5) & 1);
            auVar212._20_4_ = (uint)bVar7 * auVar211._20_4_ | (uint)!bVar7 * auVar207._20_4_;
            bVar7 = (bool)((byte)(uVar149 >> 6) & 1);
            auVar212._24_4_ = (uint)bVar7 * auVar211._24_4_ | (uint)!bVar7 * auVar207._24_4_;
            bVar7 = SUB81(uVar149 >> 7,0);
            auVar212._28_4_ = (uint)bVar7 * auVar211._28_4_ | (uint)!bVar7 * auVar207._28_4_;
            auVar207 = vsubps_avx(auVar274,auVar212);
            auVar211 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
            bVar7 = (bool)((byte)uVar146 & 1);
            bVar8 = (bool)((byte)(uVar146 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar146 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar146 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar146 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar146 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar146 >> 6) & 1);
            uVar146 = vcmpps_avx512vl(auVar347,auVar208,1);
            auVar65._4_4_ =
                 (float)((uint)bVar8 * auVar211._4_4_ | (uint)!bVar8 * auVar207._4_4_) * fVar257;
            auVar65._0_4_ =
                 (float)((uint)bVar7 * auVar211._0_4_ | (uint)!bVar7 * auVar207._0_4_) * fVar249;
            auVar65._8_4_ =
                 (float)((uint)bVar9 * auVar211._8_4_ | (uint)!bVar9 * auVar207._8_4_) * fVar258;
            auVar65._12_4_ =
                 (float)((uint)bVar10 * auVar211._12_4_ | (uint)!bVar10 * auVar207._12_4_) * fVar259
            ;
            auVar65._16_4_ =
                 (float)((uint)bVar11 * auVar211._16_4_ | (uint)!bVar11 * auVar207._16_4_) * fVar260
            ;
            auVar65._20_4_ =
                 (float)((uint)bVar12 * auVar211._20_4_ | (uint)!bVar12 * auVar207._20_4_) * fVar261
            ;
            auVar65._24_4_ =
                 (float)((uint)bVar13 * auVar211._24_4_ | (uint)!bVar13 * auVar207._24_4_) * fVar262
            ;
            auVar65._28_4_ = auVar347._28_4_;
            auVar25._8_4_ = 0x3f22f983;
            auVar25._0_8_ = 0x3f22f9833f22f983;
            auVar25._12_4_ = 0x3f22f983;
            auVar25._16_4_ = 0x3f22f983;
            auVar25._20_4_ = 0x3f22f983;
            auVar25._24_4_ = 0x3f22f983;
            auVar25._28_4_ = 0x3f22f983;
            auVar211 = vmulps_avx512vl(auVar65,auVar25);
            auVar207 = vroundps_avx(auVar211,1);
            auVar66._4_4_ = auVar207._4_4_ * 1.5707964;
            auVar66._0_4_ = auVar207._0_4_ * 1.5707964;
            auVar66._8_4_ = auVar207._8_4_ * 1.5707964;
            auVar66._12_4_ = auVar207._12_4_ * 1.5707964;
            auVar66._16_4_ = auVar207._16_4_ * 1.5707964;
            auVar66._20_4_ = auVar207._20_4_ * 1.5707964;
            auVar66._24_4_ = auVar207._24_4_ * 1.5707964;
            auVar66._28_4_ = 0x3fc90fdb;
            auVar208 = vsubps_avx(auVar65,auVar66);
            auVar207 = vcvtps2dq_avx(auVar207);
            vandps_avx512vl(auVar207,auVar187);
            uVar17 = vptestnmd_avx512vl(auVar207,auVar363);
            auVar187 = vpslld_avx2(auVar207,0x1f);
            uVar150 = vpmovd2m_avx512vl(auVar187);
            uVar149 = vpcmpgtd_avx512vl(auVar211,auVar363);
            auVar187 = vpcmpeqd_avx2(auVar187,auVar187);
            auVar187 = vpaddd_avx2(auVar211,auVar187);
            uVar15 = vpcmpud_avx512vl(auVar187,auVar368,1);
            fVar343 = auVar208._0_4_ * auVar208._0_4_;
            fVar350 = auVar208._4_4_ * auVar208._4_4_;
            auVar67._4_4_ = fVar350;
            auVar67._0_4_ = fVar343;
            fVar352 = auVar208._8_4_ * auVar208._8_4_;
            auVar67._8_4_ = fVar352;
            fVar354 = auVar208._12_4_ * auVar208._12_4_;
            auVar67._12_4_ = fVar354;
            fVar356 = auVar208._16_4_ * auVar208._16_4_;
            auVar67._16_4_ = fVar356;
            fVar357 = auVar208._20_4_ * auVar208._20_4_;
            auVar67._20_4_ = fVar357;
            fVar358 = auVar208._24_4_ * auVar208._24_4_;
            auVar67._24_4_ = fVar358;
            auVar67._28_4_ = auVar187._28_4_;
            auVar26._8_4_ = 0xb2d70013;
            auVar26._0_8_ = 0xb2d70013b2d70013;
            auVar26._12_4_ = 0xb2d70013;
            auVar26._16_4_ = 0xb2d70013;
            auVar26._20_4_ = 0xb2d70013;
            auVar26._24_4_ = 0xb2d70013;
            auVar26._28_4_ = 0xb2d70013;
            auVar187 = vmulps_avx512vl(auVar67,auVar26);
            auVar27._8_4_ = 0x363938a8;
            auVar27._0_8_ = 0x363938a8363938a8;
            auVar27._12_4_ = 0x363938a8;
            auVar27._16_4_ = 0x363938a8;
            auVar27._20_4_ = 0x363938a8;
            auVar27._24_4_ = 0x363938a8;
            auVar27._28_4_ = 0x363938a8;
            auVar187 = vaddps_avx512vl(auVar187,auVar27);
            auVar28._8_4_ = 0xb48b634d;
            auVar28._0_8_ = 0xb48b634db48b634d;
            auVar28._12_4_ = 0xb48b634d;
            auVar28._16_4_ = 0xb48b634d;
            auVar28._20_4_ = 0xb48b634d;
            auVar28._24_4_ = 0xb48b634d;
            auVar28._28_4_ = 0xb48b634d;
            auVar207 = vmulps_avx512vl(auVar67,auVar28);
            auVar29._8_4_ = 0x37cfab9c;
            auVar29._0_8_ = 0x37cfab9c37cfab9c;
            auVar29._12_4_ = 0x37cfab9c;
            auVar29._16_4_ = 0x37cfab9c;
            auVar29._20_4_ = 0x37cfab9c;
            auVar29._24_4_ = 0x37cfab9c;
            auVar29._28_4_ = 0x37cfab9c;
            auVar207 = vaddps_avx512vl(auVar207,auVar29);
            auVar68._4_4_ = fVar350 * auVar187._4_4_;
            auVar68._0_4_ = fVar343 * auVar187._0_4_;
            auVar68._8_4_ = fVar352 * auVar187._8_4_;
            auVar68._12_4_ = fVar354 * auVar187._12_4_;
            auVar68._16_4_ = fVar356 * auVar187._16_4_;
            auVar68._20_4_ = fVar357 * auVar187._20_4_;
            auVar68._24_4_ = fVar358 * auVar187._24_4_;
            auVar68._28_4_ = auVar187._28_4_;
            auVar30._8_4_ = 0xb9501096;
            auVar30._0_8_ = 0xb9501096b9501096;
            auVar30._12_4_ = 0xb9501096;
            auVar30._16_4_ = 0xb9501096;
            auVar30._20_4_ = 0xb9501096;
            auVar30._24_4_ = 0xb9501096;
            auVar30._28_4_ = 0xb9501096;
            auVar187 = vaddps_avx512vl(auVar68,auVar30);
            auVar207 = vmulps_avx512vl(auVar67,auVar207);
            auVar31._8_4_ = 0xbab60981;
            auVar31._0_8_ = 0xbab60981bab60981;
            auVar31._12_4_ = 0xbab60981;
            auVar31._16_4_ = 0xbab60981;
            auVar31._20_4_ = 0xbab60981;
            auVar31._24_4_ = 0xbab60981;
            auVar31._28_4_ = 0xbab60981;
            auVar207 = vaddps_avx512vl(auVar207,auVar31);
            auVar69._4_4_ = fVar350 * auVar187._4_4_;
            auVar69._0_4_ = fVar343 * auVar187._0_4_;
            auVar69._8_4_ = fVar352 * auVar187._8_4_;
            auVar69._12_4_ = fVar354 * auVar187._12_4_;
            auVar69._16_4_ = fVar356 * auVar187._16_4_;
            auVar69._20_4_ = fVar357 * auVar187._20_4_;
            auVar69._24_4_ = fVar358 * auVar187._24_4_;
            auVar69._28_4_ = auVar187._28_4_;
            auVar32._8_4_ = 0x3c088898;
            auVar32._0_8_ = 0x3c0888983c088898;
            auVar32._12_4_ = 0x3c088898;
            auVar32._16_4_ = 0x3c088898;
            auVar32._20_4_ = 0x3c088898;
            auVar32._24_4_ = 0x3c088898;
            auVar32._28_4_ = 0x3c088898;
            auVar187 = vaddps_avx512vl(auVar69,auVar32);
            auVar207 = vmulps_avx512vl(auVar67,auVar207);
            auVar33._8_4_ = 0x3d2aaaa4;
            auVar33._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar33._12_4_ = 0x3d2aaaa4;
            auVar33._16_4_ = 0x3d2aaaa4;
            auVar33._20_4_ = 0x3d2aaaa4;
            auVar33._24_4_ = 0x3d2aaaa4;
            auVar33._28_4_ = 0x3d2aaaa4;
            auVar207 = vaddps_avx512vl(auVar207,auVar33);
            auVar70._4_4_ = fVar350 * auVar187._4_4_;
            auVar70._0_4_ = fVar343 * auVar187._0_4_;
            auVar70._8_4_ = fVar352 * auVar187._8_4_;
            auVar70._12_4_ = fVar354 * auVar187._12_4_;
            auVar70._16_4_ = fVar356 * auVar187._16_4_;
            auVar70._20_4_ = fVar357 * auVar187._20_4_;
            auVar70._24_4_ = fVar358 * auVar187._24_4_;
            auVar70._28_4_ = auVar187._28_4_;
            auVar34._8_4_ = 0xbe2aaaab;
            auVar34._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar34._12_4_ = 0xbe2aaaab;
            auVar34._16_4_ = 0xbe2aaaab;
            auVar34._20_4_ = 0xbe2aaaab;
            auVar34._24_4_ = 0xbe2aaaab;
            auVar34._28_4_ = 0xbe2aaaab;
            auVar187 = vaddps_avx512vl(auVar70,auVar34);
            auVar207 = vmulps_avx512vl(auVar67,auVar207);
            auVar360._8_4_ = 0xbf000000;
            auVar360._0_8_ = 0xbf000000bf000000;
            auVar360._12_4_ = 0xbf000000;
            auVar360._16_4_ = 0xbf000000;
            auVar360._20_4_ = 0xbf000000;
            auVar360._24_4_ = 0xbf000000;
            auVar360._28_4_ = 0xbf000000;
            auVar207 = vaddps_avx512vl(auVar207,auVar360);
            auVar187 = vmulps_avx512vl(auVar67,auVar187);
            auVar207 = vmulps_avx512vl(auVar67,auVar207);
            auVar187 = vaddps_avx512vl(auVar187,auVar209);
            auVar208 = vmulps_avx512vl(auVar208,auVar187);
            auVar207 = vaddps_avx512vl(auVar207,auVar209);
            auVar211 = vblendmps_avx512vl(auVar208,auVar207);
            bVar7 = (bool)((byte)uVar150 & 1);
            auVar213._0_4_ = (uint)bVar7 * auVar211._0_4_ | (uint)!bVar7 * auVar187._0_4_;
            bVar7 = (bool)((byte)(uVar150 >> 1) & 1);
            auVar213._4_4_ = (uint)bVar7 * auVar211._4_4_ | (uint)!bVar7 * auVar187._4_4_;
            bVar7 = (bool)((byte)(uVar150 >> 2) & 1);
            auVar213._8_4_ = (uint)bVar7 * auVar211._8_4_ | (uint)!bVar7 * auVar187._8_4_;
            bVar7 = (bool)((byte)(uVar150 >> 3) & 1);
            auVar213._12_4_ = (uint)bVar7 * auVar211._12_4_ | (uint)!bVar7 * auVar187._12_4_;
            bVar7 = (bool)((byte)(uVar150 >> 4) & 1);
            auVar213._16_4_ = (uint)bVar7 * auVar211._16_4_ | (uint)!bVar7 * auVar187._16_4_;
            bVar7 = (bool)((byte)(uVar150 >> 5) & 1);
            auVar213._20_4_ = (uint)bVar7 * auVar211._20_4_ | (uint)!bVar7 * auVar187._20_4_;
            bVar7 = (bool)((byte)(uVar150 >> 6) & 1);
            auVar213._24_4_ = (uint)bVar7 * auVar211._24_4_ | (uint)!bVar7 * auVar187._24_4_;
            bVar7 = (bool)((byte)(uVar150 >> 7) & 1);
            auVar213._28_4_ = (uint)bVar7 * auVar211._28_4_ | (uint)!bVar7 * auVar187._28_4_;
            bVar7 = (bool)((byte)uVar17 & 1);
            auVar214._0_4_ = (uint)bVar7 * auVar207._0_4_ | (uint)!bVar7 * auVar208._0_4_;
            bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar214._4_4_ = (uint)bVar7 * auVar207._4_4_ | (uint)!bVar7 * auVar208._4_4_;
            bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar214._8_4_ = (uint)bVar7 * auVar207._8_4_ | (uint)!bVar7 * auVar208._8_4_;
            bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar214._12_4_ = (uint)bVar7 * auVar207._12_4_ | (uint)!bVar7 * auVar208._12_4_;
            bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar214._16_4_ = (uint)bVar7 * auVar207._16_4_ | (uint)!bVar7 * auVar208._16_4_;
            bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar214._20_4_ = (uint)bVar7 * auVar207._20_4_ | (uint)!bVar7 * auVar208._20_4_;
            bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar214._24_4_ = (uint)bVar7 * auVar207._24_4_ | (uint)!bVar7 * auVar208._24_4_;
            bVar7 = SUB81(uVar17 >> 7,0);
            auVar214._28_4_ = (uint)bVar7 * auVar207._28_4_ | (uint)!bVar7 * auVar208._28_4_;
            auVar187 = vxorps_avx512vl(auVar206,auVar339);
            bVar144 = (byte)uVar146;
            auVar215._0_4_ =
                 (uint)(bVar144 & 1) * auVar187._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar206._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar215._4_4_ = (uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar206._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar215._8_4_ = (uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar206._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar215._12_4_ = (uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar206._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar215._16_4_ = (uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar206._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar215._20_4_ = (uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar206._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar215._24_4_ = (uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar206._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar215._28_4_ = (uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar206._28_4_;
            auVar187 = vxorps_avx512vl(auVar203,auVar339);
            auVar216._0_4_ =
                 (uint)(bVar144 & 1) * auVar187._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar203._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar216._4_4_ = (uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar203._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar216._8_4_ = (uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar203._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar216._12_4_ = (uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar203._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar216._16_4_ = (uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar203._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar216._20_4_ = (uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar203._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar216._24_4_ = (uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar203._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar216._28_4_ = (uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar203._28_4_;
            auVar187 = vfmsub213ps_avx512vl(auVar186,auVar210,auVar215);
            auVar207 = vfmsub213ps_avx512vl(auVar188,auVar210,auVar216);
            fVar343 = auVar187._0_4_;
            fVar356 = auVar187._4_4_;
            fVar310 = auVar187._8_4_;
            fVar316 = auVar187._12_4_;
            fVar319 = auVar187._16_4_;
            fVar322 = auVar187._20_4_;
            fVar325 = auVar187._24_4_;
            auVar187 = vmulps_avx512vl(auVar207,auVar207);
            auVar208 = vxorps_avx512vl(auVar204,auVar339);
            auVar217._0_4_ =
                 (uint)(bVar144 & 1) * auVar208._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar204._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar217._4_4_ = (uint)bVar7 * auVar208._4_4_ | (uint)!bVar7 * auVar204._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar217._8_4_ = (uint)bVar7 * auVar208._8_4_ | (uint)!bVar7 * auVar204._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar217._12_4_ = (uint)bVar7 * auVar208._12_4_ | (uint)!bVar7 * auVar204._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar217._16_4_ = (uint)bVar7 * auVar208._16_4_ | (uint)!bVar7 * auVar204._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar217._20_4_ = (uint)bVar7 * auVar208._20_4_ | (uint)!bVar7 * auVar204._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar217._24_4_ = (uint)bVar7 * auVar208._24_4_ | (uint)!bVar7 * auVar204._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar217._28_4_ = (uint)bVar7 * auVar208._28_4_ | (uint)!bVar7 * auVar204._28_4_;
            auVar208 = vfmsub213ps_avx512vl(auVar189,auVar210,auVar217);
            fVar350 = auVar208._0_4_;
            fVar357 = auVar208._4_4_;
            fVar311 = auVar208._8_4_;
            fVar317 = auVar208._12_4_;
            fVar320 = auVar208._16_4_;
            fVar323 = auVar208._20_4_;
            fVar326 = auVar208._24_4_;
            auVar208 = vxorps_avx512vl(auVar205,auVar339);
            auVar218._0_4_ =
                 (uint)(bVar144 & 1) * auVar208._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar205._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar218._4_4_ = (uint)bVar7 * auVar208._4_4_ | (uint)!bVar7 * auVar205._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar218._8_4_ = (uint)bVar7 * auVar208._8_4_ | (uint)!bVar7 * auVar205._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar218._12_4_ = (uint)bVar7 * auVar208._12_4_ | (uint)!bVar7 * auVar205._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar218._16_4_ = (uint)bVar7 * auVar208._16_4_ | (uint)!bVar7 * auVar205._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar218._20_4_ = (uint)bVar7 * auVar208._20_4_ | (uint)!bVar7 * auVar205._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar218._24_4_ = (uint)bVar7 * auVar208._24_4_ | (uint)!bVar7 * auVar205._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar218._28_4_ = (uint)bVar7 * auVar208._28_4_ | (uint)!bVar7 * auVar205._28_4_;
            auVar208 = vfmsub213ps_avx512vl(auVar200,auVar210,auVar218);
            fVar352 = auVar208._0_4_;
            fVar358 = auVar208._4_4_;
            fVar315 = auVar208._8_4_;
            fVar318 = auVar208._12_4_;
            fVar321 = auVar208._16_4_;
            fVar324 = auVar208._20_4_;
            fVar342 = auVar208._24_4_;
            auVar280._0_4_ =
                 fVar352 * fVar352 + fVar350 * fVar350 + fVar343 * fVar343 + auVar187._0_4_;
            auVar280._4_4_ =
                 fVar358 * fVar358 + fVar357 * fVar357 + fVar356 * fVar356 + auVar187._4_4_;
            auVar280._8_4_ =
                 fVar315 * fVar315 + fVar311 * fVar311 + fVar310 * fVar310 + auVar187._8_4_;
            auVar280._12_4_ =
                 fVar318 * fVar318 + fVar317 * fVar317 + fVar316 * fVar316 + auVar187._12_4_;
            auVar280._16_4_ =
                 fVar321 * fVar321 + fVar320 * fVar320 + fVar319 * fVar319 + auVar187._16_4_;
            auVar280._20_4_ =
                 fVar324 * fVar324 + fVar323 * fVar323 + fVar322 * fVar322 + auVar187._20_4_;
            auVar280._24_4_ =
                 fVar342 * fVar342 + fVar326 * fVar326 + fVar325 * fVar325 + auVar187._24_4_;
            auVar280._28_4_ =
                 auVar158._28_4_ + (float)local_240._4_4_ + (float)local_280._4_4_ + auVar187._28_4_
            ;
            auVar187 = vrsqrt14ps_avx512vl(auVar280);
            fVar354 = auVar187._0_4_;
            fVar327 = auVar187._4_4_;
            fVar236 = auVar187._8_4_;
            fVar239 = auVar187._12_4_;
            fVar240 = auVar187._16_4_;
            fVar241 = auVar187._20_4_;
            fVar238 = auVar187._24_4_;
            auVar71._4_4_ = fVar327 * fVar327 * fVar327 * auVar280._4_4_ * -0.5;
            auVar71._0_4_ = fVar354 * fVar354 * fVar354 * auVar280._0_4_ * -0.5;
            auVar71._8_4_ = fVar236 * fVar236 * fVar236 * auVar280._8_4_ * -0.5;
            auVar71._12_4_ = fVar239 * fVar239 * fVar239 * auVar280._12_4_ * -0.5;
            auVar71._16_4_ = fVar240 * fVar240 * fVar240 * auVar280._16_4_ * -0.5;
            auVar71._20_4_ = fVar241 * fVar241 * fVar241 * auVar280._20_4_ * -0.5;
            auVar71._24_4_ = fVar238 * fVar238 * fVar238 * auVar280._24_4_ * -0.5;
            auVar71._28_4_ = auVar280._28_4_;
            auVar312._8_4_ = 0x3fc00000;
            auVar312._0_8_ = 0x3fc000003fc00000;
            auVar312._12_4_ = 0x3fc00000;
            auVar312._16_4_ = 0x3fc00000;
            auVar312._20_4_ = 0x3fc00000;
            auVar312._24_4_ = 0x3fc00000;
            auVar312._28_4_ = 0x3fc00000;
            auVar152 = vfmadd231ps_fma(auVar71,auVar312,auVar187);
            fVar354 = auVar152._0_4_;
            fVar327 = auVar152._4_4_;
            auVar72._4_4_ = fVar356 * fVar327;
            auVar72._0_4_ = fVar343 * fVar354;
            fVar343 = auVar152._8_4_;
            auVar72._8_4_ = fVar310 * fVar343;
            fVar356 = auVar152._12_4_;
            auVar72._12_4_ = fVar316 * fVar356;
            auVar72._16_4_ = fVar319 * 0.0;
            auVar72._20_4_ = fVar322 * 0.0;
            auVar72._24_4_ = fVar325 * 0.0;
            auVar72._28_4_ = auVar187._28_4_;
            auVar207 = vmulps_avx512vl(auVar207,ZEXT1632(auVar152));
            auVar208 = vxorps_avx512vl(auVar214,auVar339);
            bVar7 = (bool)((byte)uVar15 & 1);
            auVar219._0_4_ = (uint)bVar7 * auVar208._0_4_ | !bVar7 * auVar214._0_4_;
            bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar219._4_4_ = (uint)bVar7 * auVar208._4_4_ | !bVar7 * auVar214._4_4_;
            bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar219._8_4_ = (uint)bVar7 * auVar208._8_4_ | !bVar7 * auVar214._8_4_;
            bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar219._12_4_ = (uint)bVar7 * auVar208._12_4_ | !bVar7 * auVar214._12_4_;
            bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar219._16_4_ = (uint)bVar7 * auVar208._16_4_ | !bVar7 * auVar214._16_4_;
            bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar219._20_4_ = (uint)bVar7 * auVar208._20_4_ | !bVar7 * auVar214._20_4_;
            bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar219._24_4_ = (uint)bVar7 * auVar208._24_4_ | !bVar7 * auVar214._24_4_;
            bVar7 = SUB81(uVar15 >> 7,0);
            auVar219._28_4_ = (uint)bVar7 * auVar208._28_4_ | !bVar7 * auVar214._28_4_;
            auVar208 = vxorps_avx512vl(auVar213,auVar339);
            bVar7 = (bool)((byte)uVar149 & 1);
            auVar220._0_4_ = (float)(bVar7 * auVar213._0_4_ | (uint)!bVar7 * auVar208._0_4_);
            bVar7 = (bool)((byte)(uVar149 >> 1) & 1);
            auVar220._4_4_ = (float)(bVar7 * auVar213._4_4_ | (uint)!bVar7 * auVar208._4_4_);
            bVar7 = (bool)((byte)(uVar149 >> 2) & 1);
            auVar220._8_4_ = (float)(bVar7 * auVar213._8_4_ | (uint)!bVar7 * auVar208._8_4_);
            bVar7 = (bool)((byte)(uVar149 >> 3) & 1);
            auVar220._12_4_ = (float)(bVar7 * auVar213._12_4_ | (uint)!bVar7 * auVar208._12_4_);
            bVar7 = (bool)((byte)(uVar149 >> 4) & 1);
            auVar220._16_4_ = (float)(bVar7 * auVar213._16_4_ | (uint)!bVar7 * auVar208._16_4_);
            bVar7 = (bool)((byte)(uVar149 >> 5) & 1);
            auVar220._20_4_ = (float)(bVar7 * auVar213._20_4_ | (uint)!bVar7 * auVar208._20_4_);
            bVar7 = (bool)((byte)(uVar149 >> 6) & 1);
            auVar220._24_4_ = (float)(bVar7 * auVar213._24_4_ | (uint)!bVar7 * auVar208._24_4_);
            bVar7 = SUB81(uVar149 >> 7,0);
            auVar220._28_4_ = bVar7 * auVar213._28_4_ | (uint)!bVar7 * auVar208._28_4_;
            auVar208 = vmulps_avx512vl(auVar72,auVar220);
            auVar203 = vmulps_avx512vl(auVar207,auVar220);
            auVar73._4_4_ = fVar357 * fVar327 * auVar220._4_4_;
            auVar73._0_4_ = fVar350 * fVar354 * auVar220._0_4_;
            auVar73._8_4_ = fVar311 * fVar343 * auVar220._8_4_;
            auVar73._12_4_ = fVar317 * fVar356 * auVar220._12_4_;
            auVar73._16_4_ = fVar320 * 0.0 * auVar220._16_4_;
            auVar73._20_4_ = fVar323 * 0.0 * auVar220._20_4_;
            auVar73._24_4_ = fVar326 * 0.0 * auVar220._24_4_;
            auVar73._28_4_ = 0x80000000;
            auVar74._4_4_ = fVar358 * fVar327 * auVar220._4_4_;
            auVar74._0_4_ = fVar352 * fVar354 * auVar220._0_4_;
            auVar74._8_4_ = fVar315 * fVar343 * auVar220._8_4_;
            auVar74._12_4_ = fVar318 * fVar356 * auVar220._12_4_;
            auVar74._16_4_ = fVar321 * 0.0 * auVar220._16_4_;
            auVar74._20_4_ = fVar324 * 0.0 * auVar220._20_4_;
            auVar74._24_4_ = fVar342 * 0.0 * auVar220._24_4_;
            auVar74._28_4_ = auVar207._28_4_;
            auVar207 = vfmadd231ps_avx512vl(auVar208,auVar219,auVar186);
            auVar208 = vfmadd231ps_avx512vl(auVar203,auVar219,auVar188);
            auVar203 = vfmadd231ps_avx512vl(auVar73,auVar219,auVar189);
            auVar204 = vfmadd231ps_avx512vl(auVar74,auVar200,auVar219);
            auVar205 = vsubps_avx512vl(auVar215,auVar186);
            auVar186 = vfmadd213ps_avx512vl(auVar205,auVar176,auVar186);
            auVar205 = vsubps_avx512vl(auVar216,auVar188);
            auVar188 = vfmadd213ps_avx512vl(auVar205,auVar176,auVar188);
            auVar205 = vsubps_avx512vl(auVar217,auVar189);
            auVar189 = vfmadd213ps_avx512vl(auVar205,auVar176,auVar189);
            auVar205 = vsubps_avx512vl(auVar218,auVar200);
            auVar205 = vfmadd213ps_avx512vl(auVar205,auVar176,auVar200);
            auVar75._4_4_ = auVar186._4_4_ * auVar186._4_4_;
            auVar75._0_4_ = auVar186._0_4_ * auVar186._0_4_;
            auVar75._8_4_ = auVar186._8_4_ * auVar186._8_4_;
            auVar75._12_4_ = auVar186._12_4_ * auVar186._12_4_;
            auVar75._16_4_ = auVar186._16_4_ * auVar186._16_4_;
            auVar75._20_4_ = auVar186._20_4_ * auVar186._20_4_;
            auVar75._24_4_ = auVar186._24_4_ * auVar186._24_4_;
            auVar75._28_4_ = auVar187._28_4_;
            auVar187 = vmulps_avx512vl(auVar188,auVar188);
            auVar187 = vaddps_avx512vl(auVar75,auVar187);
            auVar206 = vmulps_avx512vl(auVar189,auVar189);
            auVar187 = vaddps_avx512vl(auVar206,auVar187);
            auVar206 = vmulps_avx512vl(auVar205,auVar205);
            auVar187 = vaddps_avx512vl(auVar206,auVar187);
            auVar206 = vrsqrt14ps_avx512vl(auVar187);
            auVar76._4_4_ = auVar187._4_4_ * -0.5 * auVar206._4_4_;
            auVar76._0_4_ = auVar187._0_4_ * -0.5 * auVar206._0_4_;
            auVar76._8_4_ = auVar187._8_4_ * -0.5 * auVar206._8_4_;
            auVar76._12_4_ = auVar187._12_4_ * -0.5 * auVar206._12_4_;
            auVar76._16_4_ = auVar187._16_4_ * -0.5 * auVar206._16_4_;
            auVar76._20_4_ = auVar187._20_4_ * -0.5 * auVar206._20_4_;
            auVar76._24_4_ = auVar187._24_4_ * -0.5 * auVar206._24_4_;
            auVar76._28_4_ = 0xbf000000;
            auVar187 = vmulps_avx512vl(auVar206,auVar206);
            auVar187 = vmulps_avx512vl(auVar187,auVar76);
            auVar152 = vfmadd231ps_fma(auVar187,auVar206,auVar312);
            auVar35._8_4_ = 0x3f7fdf3b;
            auVar35._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar35._12_4_ = 0x3f7fdf3b;
            auVar35._16_4_ = 0x3f7fdf3b;
            auVar35._20_4_ = 0x3f7fdf3b;
            auVar35._24_4_ = 0x3f7fdf3b;
            auVar35._28_4_ = 0x3f7fdf3b;
            uVar146 = vcmpps_avx512vl(auVar210,auVar35,6);
            auVar186 = vmulps_avx512vl(auVar186,ZEXT1632(auVar152));
            bVar144 = (byte)uVar146;
            auVar221._0_4_ =
                 (uint)(bVar144 & 1) * auVar186._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar207._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar221._4_4_ = (uint)bVar7 * auVar186._4_4_ | (uint)!bVar7 * auVar207._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar221._8_4_ = (uint)bVar7 * auVar186._8_4_ | (uint)!bVar7 * auVar207._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar221._12_4_ = (uint)bVar7 * auVar186._12_4_ | (uint)!bVar7 * auVar207._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar221._16_4_ = (uint)bVar7 * auVar186._16_4_ | (uint)!bVar7 * auVar207._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar221._20_4_ = (uint)bVar7 * auVar186._20_4_ | (uint)!bVar7 * auVar207._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar221._24_4_ = (uint)bVar7 * auVar186._24_4_ | (uint)!bVar7 * auVar207._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar221._28_4_ = (uint)bVar7 * auVar186._28_4_ | (uint)!bVar7 * auVar207._28_4_;
            auVar186 = vmulps_avx512vl(auVar188,ZEXT1632(auVar152));
            auVar222._0_4_ =
                 (uint)(bVar144 & 1) * auVar186._0_4_ | (uint)!(bool)(bVar144 & 1) * auVar208._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar222._4_4_ = (uint)bVar7 * auVar186._4_4_ | (uint)!bVar7 * auVar208._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar222._8_4_ = (uint)bVar7 * auVar186._8_4_ | (uint)!bVar7 * auVar208._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar222._12_4_ = (uint)bVar7 * auVar186._12_4_ | (uint)!bVar7 * auVar208._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar222._16_4_ = (uint)bVar7 * auVar186._16_4_ | (uint)!bVar7 * auVar208._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar222._20_4_ = (uint)bVar7 * auVar186._20_4_ | (uint)!bVar7 * auVar208._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar222._24_4_ = (uint)bVar7 * auVar186._24_4_ | (uint)!bVar7 * auVar208._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar222._28_4_ = (uint)bVar7 * auVar186._28_4_ | (uint)!bVar7 * auVar208._28_4_;
            auVar186 = vbroadcastss_avx512vl(auVar178._0_16_);
            auVar187 = vmulps_avx512vl(auVar189,ZEXT1632(auVar152));
            auVar223._0_4_ =
                 (float)((uint)(bVar144 & 1) * auVar187._0_4_ |
                        (uint)!(bool)(bVar144 & 1) * auVar203._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar223._4_4_ = (float)((uint)bVar7 * auVar187._4_4_ | (uint)!bVar7 * auVar203._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar223._8_4_ = (float)((uint)bVar7 * auVar187._8_4_ | (uint)!bVar7 * auVar203._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar223._12_4_ =
                 (float)((uint)bVar7 * auVar187._12_4_ | (uint)!bVar7 * auVar203._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar223._16_4_ =
                 (float)((uint)bVar7 * auVar187._16_4_ | (uint)!bVar7 * auVar203._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar223._20_4_ =
                 (float)((uint)bVar7 * auVar187._20_4_ | (uint)!bVar7 * auVar203._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar223._24_4_ =
                 (float)((uint)bVar7 * auVar187._24_4_ | (uint)!bVar7 * auVar203._24_4_);
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar223._28_4_ = (uint)bVar7 * auVar187._28_4_ | (uint)!bVar7 * auVar203._28_4_;
            auVar187 = vpermps_avx512vl(auVar363,auVar178);
            auVar178 = vpermps_avx512vl(auVar368,auVar178);
            auVar188 = vmulps_avx512vl(auVar205,ZEXT1632(auVar152));
            auVar224._0_4_ =
                 (float)((uint)(bVar144 & 1) * auVar188._0_4_ |
                        (uint)!(bool)(bVar144 & 1) * auVar204._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar224._4_4_ = (float)((uint)bVar7 * auVar188._4_4_ | (uint)!bVar7 * auVar204._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar224._8_4_ = (float)((uint)bVar7 * auVar188._8_4_ | (uint)!bVar7 * auVar204._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar224._12_4_ =
                 (float)((uint)bVar7 * auVar188._12_4_ | (uint)!bVar7 * auVar204._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar224._16_4_ =
                 (float)((uint)bVar7 * auVar188._16_4_ | (uint)!bVar7 * auVar204._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar224._20_4_ =
                 (float)((uint)bVar7 * auVar188._20_4_ | (uint)!bVar7 * auVar204._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar224._24_4_ =
                 (float)((uint)bVar7 * auVar188._24_4_ | (uint)!bVar7 * auVar204._24_4_);
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar224._28_4_ = (uint)bVar7 * auVar188._28_4_ | (uint)!bVar7 * auVar204._28_4_;
            auVar188 = vbroadcastss_avx512vl(auVar181._0_16_);
            auVar189 = vpermps_avx512vl(auVar363,auVar181);
            auVar181 = vpermps_avx512vl(auVar368,auVar181);
            auVar207 = vsubps_avx512vl(auVar209,auVar176);
            auVar77._4_4_ = fVar257 * auVar186._4_4_;
            auVar77._0_4_ = fVar249 * auVar186._0_4_;
            auVar77._8_4_ = fVar258 * auVar186._8_4_;
            auVar77._12_4_ = fVar259 * auVar186._12_4_;
            auVar77._16_4_ = fVar260 * auVar186._16_4_;
            auVar77._20_4_ = fVar261 * auVar186._20_4_;
            auVar77._24_4_ = fVar262 * auVar186._24_4_;
            auVar77._28_4_ = auVar186._28_4_;
            auVar208 = vfmadd213ps_avx512vl(local_260,auVar207,auVar77);
            auVar186 = vbroadcastss_avx512vl(auVar179._0_16_);
            auVar78._4_4_ = fVar257 * auVar187._4_4_;
            auVar78._0_4_ = fVar249 * auVar187._0_4_;
            auVar78._8_4_ = fVar258 * auVar187._8_4_;
            auVar78._12_4_ = fVar259 * auVar187._12_4_;
            auVar78._16_4_ = fVar260 * auVar187._16_4_;
            auVar78._20_4_ = fVar261 * auVar187._20_4_;
            auVar78._24_4_ = fVar262 * auVar187._24_4_;
            auVar78._28_4_ = auVar187._28_4_;
            auVar177 = vfmadd213ps_avx512vl(auVar177,auVar207,auVar78);
            auVar187 = vpermps_avx512vl(auVar363,auVar179);
            auVar179 = vpermps_avx512vl(auVar368,auVar179);
            auVar203 = vpermps_avx512vl(auVar363,auVar159);
            auVar204 = vpermps_avx512vl(auVar368,auVar159);
            auVar159 = vbroadcastss_avx512vl(auVar159._0_16_);
            auVar79._4_4_ = fVar257 * auVar178._4_4_;
            auVar79._0_4_ = fVar249 * auVar178._0_4_;
            auVar79._8_4_ = fVar258 * auVar178._8_4_;
            auVar79._12_4_ = fVar259 * auVar178._12_4_;
            auVar79._16_4_ = fVar260 * auVar178._16_4_;
            auVar79._20_4_ = fVar261 * auVar178._20_4_;
            auVar79._24_4_ = fVar262 * auVar178._24_4_;
            auVar79._28_4_ = auVar178._28_4_;
            auVar180 = vfmadd213ps_avx512vl(auVar180,auVar207,auVar79);
            auVar80._4_4_ = fVar257 * auVar188._4_4_;
            auVar80._0_4_ = fVar249 * auVar188._0_4_;
            auVar80._8_4_ = fVar258 * auVar188._8_4_;
            auVar80._12_4_ = fVar259 * auVar188._12_4_;
            auVar80._16_4_ = fVar260 * auVar188._16_4_;
            auVar80._20_4_ = fVar261 * auVar188._20_4_;
            auVar80._24_4_ = fVar262 * auVar188._24_4_;
            auVar80._28_4_ = auVar178._28_4_;
            auVar81._4_4_ = fVar257 * auVar189._4_4_;
            auVar81._0_4_ = fVar249 * auVar189._0_4_;
            auVar81._8_4_ = fVar258 * auVar189._8_4_;
            auVar81._12_4_ = fVar259 * auVar189._12_4_;
            auVar81._16_4_ = fVar260 * auVar189._16_4_;
            auVar81._20_4_ = fVar261 * auVar189._20_4_;
            fVar343 = auVar188._28_4_;
            auVar81._24_4_ = fVar262 * auVar189._24_4_;
            auVar81._28_4_ = fVar343;
            auVar82._4_4_ = fVar257 * auVar181._4_4_;
            auVar82._0_4_ = fVar249 * auVar181._0_4_;
            auVar82._8_4_ = fVar258 * auVar181._8_4_;
            auVar82._12_4_ = fVar259 * auVar181._12_4_;
            auVar82._16_4_ = fVar260 * auVar181._16_4_;
            auVar82._20_4_ = fVar261 * auVar181._20_4_;
            auVar82._24_4_ = fVar262 * auVar181._24_4_;
            auVar82._28_4_ = auVar189._28_4_;
            auVar178 = vfmadd213ps_avx512vl(local_2a0,auVar207,auVar80);
            auVar152 = vfmadd213ps_fma(auVar175,auVar207,auVar81);
            auVar157 = vfmadd213ps_fma(auVar182,auVar207,auVar82);
            auVar83._4_4_ = fVar257 * auVar186._4_4_;
            auVar83._0_4_ = fVar249 * auVar186._0_4_;
            auVar83._8_4_ = fVar258 * auVar186._8_4_;
            auVar83._12_4_ = fVar259 * auVar186._12_4_;
            auVar83._16_4_ = fVar260 * auVar186._16_4_;
            auVar83._20_4_ = fVar261 * auVar186._20_4_;
            auVar83._24_4_ = fVar262 * auVar186._24_4_;
            auVar83._28_4_ = auVar186._28_4_;
            auVar84._4_4_ = fVar257 * auVar187._4_4_;
            auVar84._0_4_ = fVar249 * auVar187._0_4_;
            auVar84._8_4_ = fVar258 * auVar187._8_4_;
            auVar84._12_4_ = fVar259 * auVar187._12_4_;
            auVar84._16_4_ = fVar260 * auVar187._16_4_;
            auVar84._20_4_ = fVar261 * auVar187._20_4_;
            auVar84._24_4_ = fVar262 * auVar187._24_4_;
            auVar84._28_4_ = auVar187._28_4_;
            auVar175 = vmulps_avx512vl(auVar176,auVar179);
            auVar179 = vfmadd213ps_avx512vl(_local_240,auVar207,auVar83);
            auVar153 = vfmadd213ps_fma(auVar183,auVar207,auVar84);
            auVar181 = vfmadd213ps_avx512vl(auVar184,auVar207,auVar175);
            auVar186 = vmulps_avx512vl(auVar176,auVar159);
            auVar85._4_4_ = auVar203._4_4_ * fVar257;
            auVar85._0_4_ = auVar203._0_4_ * fVar249;
            auVar85._8_4_ = auVar203._8_4_ * fVar258;
            auVar85._12_4_ = auVar203._12_4_ * fVar259;
            auVar85._16_4_ = auVar203._16_4_ * fVar260;
            auVar85._20_4_ = auVar203._20_4_ * fVar261;
            auVar85._24_4_ = auVar203._24_4_ * fVar262;
            auVar85._28_4_ = auVar187._28_4_;
            auVar141._4_4_ = auVar204._4_4_ * fVar257;
            auVar141._0_4_ = auVar204._0_4_ * fVar249;
            auVar141._8_4_ = auVar204._8_4_ * fVar258;
            auVar141._12_4_ = auVar204._12_4_ * fVar259;
            auVar141._16_4_ = auVar204._16_4_ * fVar260;
            auVar141._20_4_ = auVar204._20_4_ * fVar261;
            auVar141._24_4_ = auVar204._24_4_ * fVar262;
            auVar141._28_4_ = auVar176._28_4_;
            auVar159 = vfmadd213ps_avx512vl(_local_280,auVar207,auVar186);
            auVar182 = vfmadd213ps_avx512vl(auVar158,auVar207,auVar85);
            auVar183 = vfmadd213ps_avx512vl(auVar185,auVar207,auVar141);
            auVar176 = vmulps_avx512vl(auVar221,auVar221);
            auVar184 = vmulps_avx512vl(auVar222,auVar222);
            auVar252._0_4_ = auVar176._0_4_ + auVar184._0_4_;
            auVar252._4_4_ = auVar176._4_4_ + auVar184._4_4_;
            auVar252._8_4_ = auVar176._8_4_ + auVar184._8_4_;
            auVar252._12_4_ = auVar176._12_4_ + auVar184._12_4_;
            auVar252._16_4_ = auVar176._16_4_ + auVar184._16_4_;
            auVar252._20_4_ = auVar176._20_4_ + auVar184._20_4_;
            auVar252._24_4_ = auVar176._24_4_ + auVar184._24_4_;
            auVar252._28_4_ = auVar176._28_4_ + auVar184._28_4_;
            auVar86._4_4_ = auVar223._4_4_ * auVar223._4_4_;
            auVar86._0_4_ = auVar223._0_4_ * auVar223._0_4_;
            auVar86._8_4_ = auVar223._8_4_ * auVar223._8_4_;
            auVar86._12_4_ = auVar223._12_4_ * auVar223._12_4_;
            auVar86._16_4_ = auVar223._16_4_ * auVar223._16_4_;
            auVar86._20_4_ = auVar223._20_4_ * auVar223._20_4_;
            auVar86._24_4_ = auVar223._24_4_ * auVar223._24_4_;
            auVar86._28_4_ = auVar175._28_4_;
            auVar158 = vsubps_avx(auVar252,auVar86);
            auVar87._4_4_ = auVar224._4_4_ * auVar224._4_4_;
            auVar87._0_4_ = auVar224._0_4_ * auVar224._0_4_;
            auVar87._8_4_ = auVar224._8_4_ * auVar224._8_4_;
            auVar87._12_4_ = auVar224._12_4_ * auVar224._12_4_;
            auVar87._16_4_ = auVar224._16_4_ * auVar224._16_4_;
            auVar87._20_4_ = auVar224._20_4_ * auVar224._20_4_;
            auVar87._24_4_ = auVar224._24_4_ * auVar224._24_4_;
            auVar87._28_4_ = fVar343;
            auVar158 = vsubps_avx(auVar158,auVar87);
            auVar186 = vmulps_avx512vl(auVar222,auVar223);
            auVar185 = vmulps_avx512vl(auVar221,auVar224);
            fVar249 = auVar186._0_4_ + auVar185._0_4_;
            fVar257 = auVar186._4_4_ + auVar185._4_4_;
            fVar258 = auVar186._8_4_ + auVar185._8_4_;
            fVar259 = auVar186._12_4_ + auVar185._12_4_;
            fVar260 = auVar186._16_4_ + auVar185._16_4_;
            fVar261 = auVar186._20_4_ + auVar185._20_4_;
            fVar262 = auVar186._24_4_ + auVar185._24_4_;
            fVar350 = auVar186._28_4_ + auVar185._28_4_;
            auVar253._0_4_ = fVar249 + fVar249;
            auVar253._4_4_ = fVar257 + fVar257;
            auVar253._8_4_ = fVar258 + fVar258;
            auVar253._12_4_ = fVar259 + fVar259;
            auVar253._16_4_ = fVar260 + fVar260;
            auVar253._20_4_ = fVar261 + fVar261;
            auVar253._24_4_ = fVar262 + fVar262;
            auVar253._28_4_ = fVar350 + fVar350;
            auVar187 = vmulps_avx512vl(auVar222,auVar224);
            auVar188 = vmulps_avx512vl(auVar221,auVar223);
            auVar189 = vsubps_avx512vl(auVar187,auVar188);
            auVar189 = vaddps_avx512vl(auVar189,auVar189);
            auVar186 = vsubps_avx(auVar186,auVar185);
            auVar307._0_4_ = auVar186._0_4_ + auVar186._0_4_;
            auVar307._4_4_ = auVar186._4_4_ + auVar186._4_4_;
            auVar307._8_4_ = auVar186._8_4_ + auVar186._8_4_;
            auVar307._12_4_ = auVar186._12_4_ + auVar186._12_4_;
            auVar307._16_4_ = auVar186._16_4_ + auVar186._16_4_;
            auVar307._20_4_ = auVar186._20_4_ + auVar186._20_4_;
            auVar307._24_4_ = auVar186._24_4_ + auVar186._24_4_;
            auVar307._28_4_ = auVar186._28_4_ + auVar186._28_4_;
            auVar186 = vsubps_avx(auVar176,auVar184);
            auVar281._0_4_ = auVar223._0_4_ * auVar223._0_4_ + auVar186._0_4_;
            auVar281._4_4_ = auVar223._4_4_ * auVar223._4_4_ + auVar186._4_4_;
            auVar281._8_4_ = auVar223._8_4_ * auVar223._8_4_ + auVar186._8_4_;
            auVar281._12_4_ = auVar223._12_4_ * auVar223._12_4_ + auVar186._12_4_;
            auVar281._16_4_ = auVar223._16_4_ * auVar223._16_4_ + auVar186._16_4_;
            auVar281._20_4_ = auVar223._20_4_ * auVar223._20_4_ + auVar186._20_4_;
            auVar281._24_4_ = auVar223._24_4_ * auVar223._24_4_ + auVar186._24_4_;
            auVar281._28_4_ = auVar175._28_4_ + auVar186._28_4_;
            auVar175 = vsubps_avx(auVar281,auVar87);
            auVar88._4_4_ = auVar223._4_4_ * auVar224._4_4_;
            auVar88._0_4_ = auVar223._0_4_ * auVar224._0_4_;
            auVar88._8_4_ = auVar223._8_4_ * auVar224._8_4_;
            auVar88._12_4_ = auVar223._12_4_ * auVar224._12_4_;
            auVar88._16_4_ = auVar223._16_4_ * auVar224._16_4_;
            auVar88._20_4_ = auVar223._20_4_ * auVar224._20_4_;
            auVar88._24_4_ = auVar223._24_4_ * auVar224._24_4_;
            auVar88._28_4_ = auVar281._28_4_;
            auVar176 = vmulps_avx512vl(auVar221,auVar222);
            fVar249 = auVar223._0_4_ * auVar224._0_4_ + auVar176._0_4_;
            fVar257 = auVar223._4_4_ * auVar224._4_4_ + auVar176._4_4_;
            fVar258 = auVar223._8_4_ * auVar224._8_4_ + auVar176._8_4_;
            fVar259 = auVar223._12_4_ * auVar224._12_4_ + auVar176._12_4_;
            fVar260 = auVar223._16_4_ * auVar224._16_4_ + auVar176._16_4_;
            fVar261 = auVar223._20_4_ * auVar224._20_4_ + auVar176._20_4_;
            fVar262 = auVar223._24_4_ * auVar224._24_4_ + auVar176._24_4_;
            fVar350 = auVar281._28_4_ + auVar176._28_4_;
            auVar340._0_4_ = fVar249 + fVar249;
            auVar340._4_4_ = fVar257 + fVar257;
            auVar340._8_4_ = fVar258 + fVar258;
            auVar340._12_4_ = fVar259 + fVar259;
            auVar340._16_4_ = fVar260 + fVar260;
            auVar340._20_4_ = fVar261 + fVar261;
            auVar340._24_4_ = fVar262 + fVar262;
            auVar340._28_4_ = fVar350 + fVar350;
            auVar184 = vaddps_avx512vl(auVar187,auVar188);
            auVar361._0_4_ = auVar184._0_4_ + auVar184._0_4_;
            auVar361._4_4_ = auVar184._4_4_ + auVar184._4_4_;
            auVar361._8_4_ = auVar184._8_4_ + auVar184._8_4_;
            auVar361._12_4_ = auVar184._12_4_ + auVar184._12_4_;
            auVar361._16_4_ = auVar184._16_4_ + auVar184._16_4_;
            auVar361._20_4_ = auVar184._20_4_ + auVar184._20_4_;
            auVar361._24_4_ = auVar184._24_4_ + auVar184._24_4_;
            auVar361._28_4_ = auVar184._28_4_ + auVar184._28_4_;
            auVar176 = vsubps_avx(auVar88,auVar176);
            auVar176 = vaddps_avx512vl(auVar176,auVar176);
            auVar186 = vsubps_avx(auVar186,auVar86);
            auVar275._0_4_ = auVar224._0_4_ * auVar224._0_4_ + auVar186._0_4_;
            auVar275._4_4_ = auVar224._4_4_ * auVar224._4_4_ + auVar186._4_4_;
            auVar275._8_4_ = auVar224._8_4_ * auVar224._8_4_ + auVar186._8_4_;
            auVar275._12_4_ = auVar224._12_4_ * auVar224._12_4_ + auVar186._12_4_;
            auVar275._16_4_ = auVar224._16_4_ * auVar224._16_4_ + auVar186._16_4_;
            auVar275._20_4_ = auVar224._20_4_ * auVar224._20_4_ + auVar186._20_4_;
            auVar275._24_4_ = auVar224._24_4_ * auVar224._24_4_ + auVar186._24_4_;
            auVar275._28_4_ = fVar343 + auVar186._28_4_;
            auVar185 = ZEXT1632(auVar328);
            auVar186 = vmulps_avx512vl(auVar189,auVar185);
            auVar154 = vxorps_avx512vl(auVar200._0_16_,auVar200._0_16_);
            auVar184 = vfmadd213ps_avx512vl(ZEXT1632(auVar154),auVar253,auVar186);
            auVar348._0_4_ = auVar253._0_4_ + auVar186._0_4_;
            auVar348._4_4_ = auVar253._4_4_ + auVar186._4_4_;
            auVar348._8_4_ = auVar253._8_4_ + auVar186._8_4_;
            auVar348._12_4_ = auVar253._12_4_ + auVar186._12_4_;
            auVar348._16_4_ = auVar253._16_4_ + auVar186._16_4_;
            auVar348._20_4_ = auVar253._20_4_ + auVar186._20_4_;
            auVar348._24_4_ = auVar253._24_4_ + auVar186._24_4_;
            fVar249 = auVar186._28_4_;
            auVar348._28_4_ = auVar253._28_4_ + fVar249;
            auVar186 = vfmadd213ps_avx512vl(auVar253,auVar185,auVar189);
            auVar156 = vfmadd231ps_fma(auVar348,auVar158,auVar185);
            auVar306 = vfmadd231ps_fma(auVar186,auVar185,auVar158);
            auVar189 = ZEXT1632(auVar328);
            auVar89._4_4_ = auVar340._4_4_ * 0.0;
            auVar89._0_4_ = auVar340._0_4_ * 0.0;
            auVar89._8_4_ = auVar340._8_4_ * 0.0;
            auVar89._12_4_ = auVar340._12_4_ * 0.0;
            auVar89._16_4_ = auVar340._16_4_ * 0.0;
            auVar89._20_4_ = auVar340._20_4_ * 0.0;
            auVar89._24_4_ = auVar340._24_4_ * 0.0;
            auVar89._28_4_ = fVar249;
            auVar154 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar175,auVar89);
            auVar186 = vaddps_avx512vl(auVar175,auVar89);
            auVar155 = vfmadd213ps_fma(auVar175,auVar189,auVar340);
            auVar175 = vaddps_avx512vl(auVar307,ZEXT1632(auVar154));
            auVar186 = vfmadd231ps_avx512vl(auVar186,auVar307,auVar189);
            auVar154 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar189,auVar307);
            auVar90._4_4_ = auVar275._4_4_ * 0.0;
            auVar90._0_4_ = auVar275._0_4_ * 0.0;
            auVar90._8_4_ = auVar275._8_4_ * 0.0;
            auVar90._12_4_ = auVar275._12_4_ * 0.0;
            auVar90._16_4_ = auVar275._16_4_ * 0.0;
            auVar90._20_4_ = auVar275._20_4_ * 0.0;
            auVar90._24_4_ = auVar275._24_4_ * 0.0;
            auVar90._28_4_ = fVar249;
            auVar185 = vfmadd213ps_avx512vl(ZEXT832(0) << 0x20,auVar176,auVar90);
            auVar187 = vaddps_avx512vl(auVar176,auVar90);
            auVar176 = vfmadd213ps_avx512vl(auVar176,auVar189,auVar275);
            auVar276._0_4_ = auVar361._0_4_ + auVar185._0_4_;
            auVar276._4_4_ = auVar361._4_4_ + auVar185._4_4_;
            auVar276._8_4_ = auVar361._8_4_ + auVar185._8_4_;
            auVar276._12_4_ = auVar361._12_4_ + auVar185._12_4_;
            auVar276._16_4_ = auVar361._16_4_ + auVar185._16_4_;
            auVar276._20_4_ = auVar361._20_4_ + auVar185._20_4_;
            auVar276._24_4_ = auVar361._24_4_ + auVar185._24_4_;
            auVar276._28_4_ = auVar361._28_4_ + auVar185._28_4_;
            auVar155 = vfmadd231ps_fma(auVar187,auVar361,auVar189);
            auVar176 = vfmadd231ps_avx512vl(auVar176,auVar189,auVar361);
            auVar177 = vaddps_avx512vl(auVar177,auVar189);
            auVar207 = ZEXT1632(auVar328);
            auVar185 = vaddps_avx512vl(auVar180,auVar207);
            auVar187 = vaddps_avx512vl(ZEXT1632(auVar157),auVar207);
            auVar180 = vmulps_avx512vl(auVar276,auVar207);
            auVar91._28_4_ = auVar361._28_4_;
            auVar91._0_28_ =
                 ZEXT1628(CONCAT412(auVar155._12_4_ * 0.0,
                                    CONCAT48(auVar155._8_4_ * 0.0,
                                             CONCAT44(auVar155._4_4_ * 0.0,auVar155._0_4_ * 0.0))));
            auVar189 = vmulps_avx512vl(auVar176,auVar207);
            auVar200 = vfmadd213ps_avx512vl(ZEXT432(0) << 0x20,auVar175,auVar180);
            auVar157 = vxorps_avx512vl(auVar188._0_16_,auVar188._0_16_);
            auVar188 = vfmadd213ps_avx512vl(ZEXT1632(auVar157),auVar186,auVar91);
            auVar157 = vfmadd213ps_fma(auVar207,ZEXT1632(auVar154),auVar189);
            auVar180 = vfmadd231ps_avx512vl(auVar180,ZEXT1632(auVar152),auVar175);
            auVar207 = vfmadd231ps_avx512vl(auVar91,ZEXT1632(auVar152),auVar186);
            auVar152 = vfmadd213ps_fma(ZEXT1632(auVar152),ZEXT1632(auVar154),auVar189);
            auVar189 = vmulps_avx512vl(auVar181,auVar276);
            auVar203 = vmulps_avx512vl(auVar181,ZEXT1632(auVar155));
            auVar181 = vmulps_avx512vl(auVar181,auVar176);
            auVar189 = vfmadd231ps_avx512vl(auVar189,ZEXT1632(auVar153),auVar175);
            auVar203 = vfmadd231ps_avx512vl(auVar203,ZEXT1632(auVar153),auVar186);
            auVar153 = vfmadd231ps_fma(auVar181,ZEXT1632(auVar154),ZEXT1632(auVar153));
            auVar181 = vmulps_avx512vl(auVar183,auVar276);
            auVar204 = vmulps_avx512vl(auVar183,ZEXT1632(auVar155));
            auVar176 = vmulps_avx512vl(auVar183,auVar176);
            auVar175 = vfmadd231ps_avx512vl(auVar181,auVar182,auVar175);
            auVar186 = vfmadd231ps_avx512vl(auVar204,auVar182,auVar186);
            auVar176 = vfmadd231ps_avx512vl(auVar176,auVar182,ZEXT1632(auVar154));
            auVar158 = vaddps_avx512vl(auVar158,auVar184);
            auVar182 = vfmadd231ps_avx512vl(auVar200,auVar208,auVar158);
            auVar181 = vfmadd231ps_avx512vl(auVar188,auVar208,ZEXT1632(auVar156));
            auVar183 = vfmadd231ps_avx512vl(ZEXT1632(auVar157),ZEXT1632(auVar306),auVar208);
            auVar184 = vfmadd231ps_avx512vl(auVar180,auVar178,auVar158);
            auVar188 = vfmadd231ps_avx512vl(auVar207,auVar178,ZEXT1632(auVar156));
            auVar178 = vfmadd231ps_avx512vl(ZEXT1632(auVar152),ZEXT1632(auVar306),auVar178);
            auVar189 = vfmadd231ps_avx512vl(auVar189,auVar179,auVar158);
            auVar200 = vfmadd231ps_avx512vl(auVar203,auVar179,ZEXT1632(auVar156));
            auVar179 = vfmadd231ps_avx512vl(ZEXT1632(auVar153),ZEXT1632(auVar306),auVar179);
            auVar175 = vfmadd231ps_avx512vl(auVar175,auVar159,auVar158);
            auVar180 = vaddps_avx512vl(auVar177,auVar175);
            auVar186 = vfmadd231ps_avx512vl(auVar186,auVar159,ZEXT1632(auVar156));
            auVar185 = vaddps_avx512vl(auVar185,auVar186);
            auVar186 = vfmadd231ps_avx512vl(auVar176,auVar159,ZEXT1632(auVar306));
            auVar187 = vaddps_avx512vl(auVar187,auVar186);
            auVar254._0_4_ = auVar200._0_4_ * auVar178._0_4_;
            auVar254._4_4_ = auVar200._4_4_ * auVar178._4_4_;
            auVar254._8_4_ = auVar200._8_4_ * auVar178._8_4_;
            auVar254._12_4_ = auVar200._12_4_ * auVar178._12_4_;
            auVar254._16_4_ = auVar200._16_4_ * auVar178._16_4_;
            auVar254._20_4_ = auVar200._20_4_ * auVar178._20_4_;
            auVar254._24_4_ = auVar200._24_4_ * auVar178._24_4_;
            auVar254._28_4_ = 0;
            auVar157 = vfmsub231ps_fma(auVar254,auVar188,auVar179);
            auVar175 = vmulps_avx512vl(auVar179,auVar184);
            auVar153 = vfmsub231ps_fma(auVar175,auVar178,auVar189);
            auVar92._4_4_ = auVar188._4_4_ * auVar189._4_4_;
            auVar92._0_4_ = auVar188._0_4_ * auVar189._0_4_;
            auVar92._8_4_ = auVar188._8_4_ * auVar189._8_4_;
            auVar92._12_4_ = auVar188._12_4_ * auVar189._12_4_;
            auVar92._16_4_ = auVar188._16_4_ * auVar189._16_4_;
            auVar92._20_4_ = auVar188._20_4_ * auVar189._20_4_;
            auVar92._24_4_ = auVar188._24_4_ * auVar189._24_4_;
            auVar92._28_4_ = auVar186._28_4_;
            auVar159 = vfmsub231ps_avx512vl(auVar92,auVar184,auVar200);
            fVar249 = auVar183._0_4_;
            fVar257 = auVar183._4_4_;
            auVar93._4_4_ = fVar257 * auVar189._4_4_;
            auVar93._0_4_ = fVar249 * auVar189._0_4_;
            fVar258 = auVar183._8_4_;
            auVar93._8_4_ = fVar258 * auVar189._8_4_;
            fVar259 = auVar183._12_4_;
            auVar93._12_4_ = fVar259 * auVar189._12_4_;
            fVar260 = auVar183._16_4_;
            auVar93._16_4_ = fVar260 * auVar189._16_4_;
            fVar261 = auVar183._20_4_;
            auVar93._20_4_ = fVar261 * auVar189._20_4_;
            fVar262 = auVar183._24_4_;
            auVar93._24_4_ = fVar262 * auVar189._24_4_;
            auVar93._28_4_ = auVar158._28_4_;
            auVar154 = vfmsub231ps_fma(auVar93,auVar182,auVar179);
            auVar158 = vmulps_avx512vl(auVar181,auVar179);
            auVar155 = vfmsub231ps_fma(auVar158,auVar200,auVar183);
            auVar333._0_4_ = auVar182._0_4_ * auVar200._0_4_;
            auVar333._4_4_ = auVar182._4_4_ * auVar200._4_4_;
            auVar333._8_4_ = auVar182._8_4_ * auVar200._8_4_;
            auVar333._12_4_ = auVar182._12_4_ * auVar200._12_4_;
            auVar333._16_4_ = auVar182._16_4_ * auVar200._16_4_;
            auVar333._20_4_ = auVar182._20_4_ * auVar200._20_4_;
            auVar333._24_4_ = auVar182._24_4_ * auVar200._24_4_;
            auVar333._28_4_ = 0;
            auVar207 = vfmsub231ps_avx512vl(auVar333,auVar181,auVar189);
            auVar94._4_4_ = auVar188._4_4_ * fVar257;
            auVar94._0_4_ = auVar188._0_4_ * fVar249;
            auVar94._8_4_ = auVar188._8_4_ * fVar258;
            auVar94._12_4_ = auVar188._12_4_ * fVar259;
            auVar94._16_4_ = auVar188._16_4_ * fVar260;
            auVar94._20_4_ = auVar188._20_4_ * fVar261;
            auVar94._24_4_ = auVar188._24_4_ * fVar262;
            auVar94._28_4_ = auVar189._28_4_;
            auVar175 = vfmsub231ps_avx512vl(auVar94,auVar181,auVar178);
            auVar95._4_4_ = auVar182._4_4_ * auVar178._4_4_;
            auVar95._0_4_ = auVar182._0_4_ * auVar178._0_4_;
            auVar95._8_4_ = auVar182._8_4_ * auVar178._8_4_;
            auVar95._12_4_ = auVar182._12_4_ * auVar178._12_4_;
            auVar95._16_4_ = auVar182._16_4_ * auVar178._16_4_;
            auVar95._20_4_ = auVar182._20_4_ * auVar178._20_4_;
            auVar95._24_4_ = auVar182._24_4_ * auVar178._24_4_;
            auVar95._28_4_ = auVar200._28_4_;
            auVar178 = vfmsub231ps_avx512vl(auVar95,auVar183,auVar184);
            auVar158 = vmulps_avx512vl(auVar184,auVar181);
            auVar183 = vfmsub231ps_avx512vl(auVar158,auVar182,auVar188);
            auVar96._4_4_ = fVar257 * auVar159._4_4_;
            auVar96._0_4_ = fVar249 * auVar159._0_4_;
            auVar96._8_4_ = fVar258 * auVar159._8_4_;
            auVar96._12_4_ = fVar259 * auVar159._12_4_;
            auVar96._16_4_ = fVar260 * auVar159._16_4_;
            auVar96._20_4_ = fVar261 * auVar159._20_4_;
            auVar96._24_4_ = fVar262 * auVar159._24_4_;
            auVar96._28_4_ = auVar188._28_4_;
            auVar158 = vfmadd231ps_avx512vl(auVar96,ZEXT1632(auVar153),auVar181);
            auVar152 = vfmadd231ps_fma(auVar158,ZEXT1632(auVar157),auVar182);
            auVar158 = vdivps_avx(ZEXT1632(auVar157),ZEXT1632(auVar152));
            auVar186 = vdivps_avx(ZEXT1632(auVar155),ZEXT1632(auVar152));
            auVar179 = ZEXT1632(auVar152);
            auVar175 = vdivps_avx(auVar175,auVar179);
            auVar176 = vdivps_avx(ZEXT1632(auVar153),auVar179);
            auVar177 = vdivps_avx(ZEXT1632(auVar154),auVar179);
            auVar178 = vdivps_avx(auVar178,auVar179);
            auVar181 = ZEXT1632(auVar152);
            auVar179 = vdivps_avx(auVar159,auVar181);
            auVar159 = vdivps_avx(auVar207,auVar181);
            auVar181 = vdivps_avx512vl(auVar183,auVar181);
            fVar249 = auVar187._0_4_;
            fVar257 = auVar187._4_4_;
            auVar97._4_4_ = fVar257 * auVar179._4_4_;
            auVar97._0_4_ = fVar249 * auVar179._0_4_;
            fVar258 = auVar187._8_4_;
            auVar97._8_4_ = fVar258 * auVar179._8_4_;
            fVar259 = auVar187._12_4_;
            auVar97._12_4_ = fVar259 * auVar179._12_4_;
            fVar260 = auVar187._16_4_;
            auVar97._16_4_ = fVar260 * auVar179._16_4_;
            fVar261 = auVar187._20_4_;
            auVar97._20_4_ = fVar261 * auVar179._20_4_;
            fVar262 = auVar187._24_4_;
            auVar97._24_4_ = fVar262 * auVar179._24_4_;
            auVar97._28_4_ = auVar207._28_4_;
            auVar98._4_4_ = fVar257 * auVar159._4_4_;
            auVar98._0_4_ = fVar249 * auVar159._0_4_;
            auVar98._8_4_ = fVar258 * auVar159._8_4_;
            auVar98._12_4_ = fVar259 * auVar159._12_4_;
            auVar98._16_4_ = fVar260 * auVar159._16_4_;
            auVar98._20_4_ = fVar261 * auVar159._20_4_;
            auVar98._24_4_ = fVar262 * auVar159._24_4_;
            auVar98._28_4_ = auVar182._28_4_;
            auVar362._0_4_ = fVar249 * auVar181._0_4_;
            auVar362._4_4_ = fVar257 * auVar181._4_4_;
            auVar362._8_4_ = fVar258 * auVar181._8_4_;
            auVar362._12_4_ = fVar259 * auVar181._12_4_;
            auVar362._16_4_ = fVar260 * auVar181._16_4_;
            auVar362._20_4_ = fVar261 * auVar181._20_4_;
            auVar362._24_4_ = fVar262 * auVar181._24_4_;
            auVar362._28_4_ = 0;
            auVar152 = vfmadd231ps_fma(auVar97,auVar185,auVar176);
            auVar153 = vfmadd231ps_fma(auVar98,auVar185,auVar177);
            auVar157 = vfmadd231ps_fma(auVar362,auVar178,auVar185);
          }
          else {
            uVar149 = uVar145 & 0xffffffff;
            do {
              uVar151 = 0;
              for (uVar232 = (uint)uVar149 & 0xff; (uVar232 & 1) == 0;
                  uVar232 = uVar232 >> 1 | 0x80000000) {
                uVar151 = uVar151 + 1;
              }
              plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                               (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
              iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                              (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
              if (iVar3 == 0x9134) {
                lVar6 = *plVar1;
                lVar147 = plVar1[2] * uVar146;
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28);
                in_ZMM6 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28);
                in_ZMM8 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28);
                auVar285 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28);
                in_ZMM10 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0x9234) {
                lVar6 = *plVar1;
                lVar147 = plVar1[2] * uVar146;
                auVar152._8_8_ = 0;
                auVar152._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                auVar153._8_8_ = 0;
                auVar153._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                              auVar152);
                in_ZMM6 = ZEXT1664(auVar152);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                              _DAT_01fefe80,auVar153);
                in_ZMM8 = ZEXT1664(auVar152);
                auVar154._8_8_ = 0;
                auVar154._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                              _DAT_01fefe80,auVar154);
                auVar285 = ZEXT1664(auVar152);
                auVar155._8_8_ = 0;
                auVar155._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                              _DAT_01fefe80,auVar155);
                in_ZMM10 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = *plVar1;
                lVar147 = plVar1[2] * uVar146;
                auVar156._8_8_ = 0;
                auVar156._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar157 = vinsertps_avx512f(auVar156,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
                in_ZMM16 = ZEXT1664(auVar157);
                auVar306._8_8_ = 0;
                auVar306._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                auVar153 = vpermt2ps_avx512vl(auVar306,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar147)));
                auVar328._8_8_ = 0;
                auVar328._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar154 = vpermt2ps_avx512vl(auVar328,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                fVar343 = *(float *)(lVar6 + 0x24 + lVar147);
                fVar350 = *(float *)(lVar6 + 0x28 + lVar147);
                fVar352 = *(float *)(lVar6 + 0x2c + lVar147);
                fVar354 = *(float *)(lVar6 + 0x30 + lVar147);
                auVar152 = vfmadd231ss_fma(ZEXT416((uint)(fVar350 * fVar350)),ZEXT416((uint)fVar343)
                                           ,ZEXT416((uint)fVar343));
                auVar152 = vfmadd231ss_fma(auVar152,ZEXT416((uint)fVar352),ZEXT416((uint)fVar352));
                auVar152 = vfmadd231ss_fma(auVar152,ZEXT416((uint)fVar354),ZEXT416((uint)fVar354));
                auVar366._4_12_ = ZEXT812(0) << 0x20;
                auVar366._0_4_ = auVar152._0_4_;
                auVar155 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar366);
                fVar356 = auVar155._0_4_;
                fVar356 = fVar356 * 1.5 + fVar356 * fVar356 * fVar356 * auVar152._0_4_ * -0.5;
                auVar152 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar343 * fVar356)),0x30);
                in_ZMM10 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar356 * fVar350)),0x30);
                in_ZMM6 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx512f(auVar157,ZEXT416((uint)(fVar354 * fVar356)),0x30);
                auVar285 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
                auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar352 * fVar356)),0x30);
                in_ZMM8 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0x9244) {
                lVar6 = *plVar1;
                lVar147 = plVar1[2] * uVar146;
                in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar147));
                in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
                auVar285 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
                in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
              }
              auVar158 = vpbroadcastd_avx512vl();
              uVar16 = vpcmpeqd_avx512vl(auVar158,local_140);
              iVar3 = (int)plVar1[0xb];
              if (iVar3 == 0x9134) {
                lVar6 = plVar1[7];
                lVar147 = plVar1[9] * uVar146;
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28);
                in_ZMM5 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28);
                in_ZMM7 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28);
                in_ZMM9 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28);
                in_ZMM4 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0x9234) {
                lVar6 = plVar1[7];
                lVar147 = plVar1[9] * uVar146;
                auVar290._8_8_ = 0;
                auVar290._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                auVar331._8_8_ = 0;
                auVar331._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                              auVar290);
                in_ZMM5 = ZEXT1664(auVar152);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                              _DAT_01fefe80,auVar331);
                in_ZMM7 = ZEXT1664(auVar152);
                auVar291._8_8_ = 0;
                auVar291._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                              _DAT_01fefe80,auVar291);
                in_ZMM9 = ZEXT1664(auVar152);
                auVar345._8_8_ = 0;
                auVar345._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                              _DAT_01fefe80,auVar345);
                in_ZMM4 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = plVar1[7];
                lVar147 = plVar1[9] * uVar146;
                auVar292._8_8_ = 0;
                auVar292._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vinsertps_avx(auVar292,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
                auVar301._8_8_ = 0;
                auVar301._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                auVar153 = vpermt2ps_avx512vl(auVar301,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar147)));
                auVar293._8_8_ = 0;
                auVar293._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar154 = vpermt2ps_avx512vl(auVar293,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                fVar343 = *(float *)(lVar6 + 0x24 + lVar147);
                fVar350 = *(float *)(lVar6 + 0x28 + lVar147);
                fVar352 = *(float *)(lVar6 + 0x2c + lVar147);
                fVar354 = *(float *)(lVar6 + 0x30 + lVar147);
                auVar157 = vfmadd231ss_fma(ZEXT416((uint)(fVar350 * fVar350)),ZEXT416((uint)fVar343)
                                           ,ZEXT416((uint)fVar343));
                auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar352),ZEXT416((uint)fVar352));
                auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar354),ZEXT416((uint)fVar354));
                auVar158._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
                auVar186._4_28_ = auVar158._4_28_;
                auVar186._0_4_ = auVar157._0_4_;
                auVar155 = vrsqrt14ss_avx512f(auVar158._0_16_,auVar186._0_16_);
                auVar156 = vmulss_avx512f(auVar155,ZEXT416(0x3fc00000));
                in_ZMM16 = ZEXT1664(auVar156);
                fVar356 = auVar155._0_4_;
                auVar157 = vaddss_avx512f(auVar156,ZEXT416((uint)(auVar157._0_4_ * -0.5 * fVar356 *
                                                                 fVar356 * fVar356)));
                fVar356 = auVar157._0_4_;
                auVar157 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar343 * fVar356)),0x30);
                in_ZMM4 = ZEXT1664(auVar157);
                auVar157 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar350 * fVar356)),0x30);
                in_ZMM5 = ZEXT1664(auVar157);
                auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar354 * fVar356)),0x30);
                in_ZMM9 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
                auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar352 * fVar356)),0x30);
                in_ZMM7 = ZEXT1664(auVar152);
              }
              else if (iVar3 == 0x9244) {
                lVar6 = plVar1[7];
                lVar147 = plVar1[9] * uVar146;
                in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar147));
                in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
                in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
                in_ZMM4 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
              }
              bVar148 = (byte)uVar149 & (byte)uVar16;
              bVar144 = ~bVar148 & (byte)uVar149;
              uVar149 = (ulong)bVar144;
              auVar158 = vbroadcastss_avx512vl(in_ZMM6._0_16_);
              auVar178._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM18._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar178._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar178._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar178._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM18._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar178._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM18._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar178._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM18._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar178._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM18._24_4_;
              auVar178._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM18._28_4_;
              in_ZMM18 = ZEXT3264(auVar178);
              auVar206._8_4_ = 1;
              auVar206._0_8_ = 0x100000001;
              auVar206._12_4_ = 1;
              auVar206._16_4_ = 1;
              auVar206._20_4_ = 1;
              auVar206._24_4_ = 1;
              auVar206._28_4_ = 1;
              auVar186 = in_ZMM6._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              auVar179._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM17._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar179._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM17._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar179._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM17._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar179._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM17._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar179._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM17._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar179._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM17._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar179._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM17._24_4_;
              auVar179._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM17._28_4_;
              in_ZMM17 = ZEXT3264(auVar179);
              auVar209._8_4_ = 2;
              auVar209._0_8_ = 0x200000002;
              auVar209._12_4_ = 2;
              auVar209._16_4_ = 2;
              auVar209._20_4_ = 2;
              auVar209._24_4_ = 2;
              auVar209._28_4_ = 2;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_160._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_160._4_4_;
              local_160._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_160._0_4_;
              local_160._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_160._8_4_;
              local_160._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_160._12_4_;
              local_160._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_160._16_4_;
              local_160._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_160._20_4_;
              local_160._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_160._24_4_;
              local_160._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_160._28_4_;
              auVar210._8_4_ = 3;
              auVar210._0_8_ = 0x300000003;
              auVar210._12_4_ = 3;
              auVar210._16_4_ = 3;
              auVar210._20_4_ = 3;
              auVar210._24_4_ = 3;
              auVar210._28_4_ = 3;
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar159._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM28._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar159._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM28._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar159._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM28._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar159._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM28._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar159._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM28._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar159._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM28._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar159._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM28._24_4_;
              auVar159._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM28._28_4_;
              in_ZMM28 = ZEXT3264(auVar159);
              auVar158 = vbroadcastss_avx512vl(in_ZMM8._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_200._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_200._4_4_;
              local_200._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_200._0_4_;
              local_200._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_200._8_4_;
              local_200._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_200._12_4_;
              local_200._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_200._16_4_;
              local_200._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_200._20_4_;
              local_200._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_200._24_4_;
              local_200._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_200._28_4_;
              auVar186 = in_ZMM8._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_260._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_260._4_4_;
              local_260._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_260._0_4_;
              local_260._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_260._8_4_;
              local_260._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_260._12_4_;
              local_260._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_260._16_4_;
              local_260._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_260._20_4_;
              local_260._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_260._24_4_;
              local_260._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_260._28_4_;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_1e0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_1e0._4_4_;
              local_1e0._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_1e0._0_4_;
              local_1e0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_1e0._8_4_;
              local_1e0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_1e0._12_4_;
              local_1e0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_1e0._16_4_;
              local_1e0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_1e0._20_4_;
              local_1e0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_1e0._24_4_;
              local_1e0._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_1e0._28_4_;
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar181._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM26._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar181._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM26._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar181._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM26._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar181._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM26._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar181._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM26._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar181._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM26._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar181._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM26._24_4_;
              auVar181._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM26._28_4_;
              in_ZMM26 = ZEXT3264(auVar181);
              auVar158 = vbroadcastss_avx512vl(auVar285._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_2a0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_2a0._4_4_;
              local_2a0._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_2a0._0_4_;
              local_2a0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_2a0._8_4_;
              local_2a0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_2a0._12_4_;
              local_2a0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_2a0._16_4_;
              local_2a0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_2a0._20_4_;
              local_2a0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_2a0._24_4_;
              local_2a0._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_2a0._28_4_;
              auVar186 = auVar285._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_220._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_220._4_4_;
              local_220._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_220._0_4_;
              local_220._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_220._8_4_;
              local_220._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_220._12_4_;
              local_220._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_220._16_4_;
              local_220._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_220._20_4_;
              local_220._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_220._24_4_;
              local_220._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_220._28_4_;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_1c0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_1c0._4_4_;
              local_1c0._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_1c0._0_4_;
              local_1c0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_1c0._8_4_;
              local_1c0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_1c0._12_4_;
              local_1c0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_1c0._16_4_;
              local_1c0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_1c0._20_4_;
              local_1c0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_1c0._24_4_;
              local_1c0._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_1c0._28_4_;
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar182._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM22._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar182._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar182._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar182._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM22._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar182._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM22._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar182._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM22._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar182._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM22._24_4_;
              auVar182._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM22._28_4_;
              in_ZMM22 = ZEXT3264(auVar182);
              auVar158 = vbroadcastss_avx512vl(in_ZMM10._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_280._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_280._4_4_;
              local_280._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_280._0_4_;
              uStack_278._0_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)uStack_278;
              uStack_278._4_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * uStack_278._4_4_;
              uStack_270._0_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)uStack_270;
              uStack_270._4_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * uStack_270._4_4_;
              uStack_268._0_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)uStack_268;
              uStack_268._4_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * uStack_268._4_4_;
              auVar186 = in_ZMM10._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_240._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_240._4_4_;
              local_240._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_240._0_4_;
              uStack_238._0_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * (int)uStack_238;
              uStack_238._4_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * uStack_238._4_4_;
              uStack_230._0_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * (int)uStack_230;
              uStack_230._4_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * uStack_230._4_4_;
              uStack_228._0_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * (int)uStack_228;
              uStack_228._4_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * uStack_228._4_4_;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              local_2c0._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * local_2c0._4_4_;
              local_2c0._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * local_2c0._0_4_;
              local_2c0._8_4_ = (uint)bVar8 * auVar158._8_4_ | (uint)!bVar8 * local_2c0._8_4_;
              local_2c0._12_4_ = (uint)bVar9 * auVar158._12_4_ | (uint)!bVar9 * local_2c0._12_4_;
              local_2c0._16_4_ = (uint)bVar10 * auVar158._16_4_ | (uint)!bVar10 * local_2c0._16_4_;
              local_2c0._20_4_ = (uint)bVar11 * auVar158._20_4_ | (uint)!bVar11 * local_2c0._20_4_;
              local_2c0._24_4_ = (uint)bVar12 * auVar158._24_4_ | (uint)!bVar12 * local_2c0._24_4_;
              local_2c0._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * local_2c0._28_4_;
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar184._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM25._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar184._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM25._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar184._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM25._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar184._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM25._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar184._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM25._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar184._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM25._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar184._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM25._24_4_;
              auVar184._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM25._28_4_;
              in_ZMM25 = ZEXT3264(auVar184);
              auVar158 = vbroadcastss_avx512vl(in_ZMM5._0_16_);
              auVar185._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM27._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar185._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM27._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar185._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM27._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar185._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM27._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar185._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM27._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar185._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM27._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar185._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM27._24_4_;
              auVar185._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM27._28_4_;
              in_ZMM27 = ZEXT3264(auVar185);
              auVar186 = in_ZMM5._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              auVar187._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM24._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar187._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar187._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar187._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM24._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar187._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM24._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar187._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM24._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar187._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM24._24_4_;
              auVar187._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM24._28_4_;
              in_ZMM24 = ZEXT3264(auVar187);
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              auVar188._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM23._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar188._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar188._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar188._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM23._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar188._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM23._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar188._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM23._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar188._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM23._24_4_;
              auVar188._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM23._28_4_;
              in_ZMM23 = ZEXT3264(auVar188);
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar189._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * auVar278._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar189._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * auVar278._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar189._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * auVar278._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar189._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * auVar278._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar189._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * auVar278._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar189._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * auVar278._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar189._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * auVar278._24_4_;
              auVar189._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * auVar278._28_4_;
              auVar278 = ZEXT3264(auVar189);
              auVar158 = vbroadcastss_avx512vl(in_ZMM7._0_16_);
              auVar200._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM21._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar200._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar200._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar200._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM21._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar200._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM21._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar200._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM21._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar200._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM21._24_4_;
              auVar200._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM21._28_4_;
              in_ZMM21 = ZEXT3264(auVar200);
              auVar186 = in_ZMM7._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              auVar207._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM20._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar207._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar207._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar207._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM20._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar207._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM20._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar207._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM20._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar207._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM20._24_4_;
              auVar207._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM20._28_4_;
              in_ZMM20 = ZEXT3264(auVar207);
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              auVar208._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM19._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar208._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar208._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar208._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM19._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar208._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM19._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar208._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM19._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar208._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM19._24_4_;
              auVar208._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM19._28_4_;
              in_ZMM19 = ZEXT3264(auVar208);
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar203._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM31._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar203._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM31._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar203._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM31._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar203._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM31._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar203._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM31._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar203._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM31._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar203._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM31._24_4_;
              auVar203._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM31._28_4_;
              in_ZMM31 = ZEXT3264(auVar203);
              auVar158 = vbroadcastss_avx512vl(in_ZMM9._0_16_);
              local_120 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar148 & 1) * (int)local_120);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_11c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_11c);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_118 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_118);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_114 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_114);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_110 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_110);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_10c = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_10c);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_108 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_108);
              uStack_104 = (uint)(bVar148 >> 7) * auVar158._28_4_ |
                           !(bool)(bVar148 >> 7) * uStack_104;
              auVar186 = in_ZMM9._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              local_100 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar148 & 1) * (int)local_100);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_fc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_fc);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_f8 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_f8);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_f4 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_f4);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_f0 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_f0);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_ec = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_ec);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_e8 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_e8);
              uStack_e4 = (uint)(bVar148 >> 7) * auVar158._28_4_ | !(bool)(bVar148 >> 7) * uStack_e4
              ;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              local_e0 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar148 & 1) * (int)local_e0);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_dc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_dc);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_d8 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_d8);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_d4 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_d4);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_d0 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_d0);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_cc = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_cc);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_c8 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_c8);
              uStack_c4 = (uint)(bVar148 >> 7) * auVar158._28_4_ | !(bool)(bVar148 >> 7) * uStack_c4
              ;
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar204._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM29._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar204._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar204._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar204._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM29._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar204._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM29._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar204._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM29._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar204._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM29._24_4_;
              auVar204._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM29._28_4_;
              in_ZMM29 = ZEXT3264(auVar204);
              auVar158 = vbroadcastss_avx512vl(in_ZMM4._0_16_);
              local_c0 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar148 & 1) * (int)local_c0);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_bc = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_bc);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_b8 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_b8);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_b4 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_b4);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_b0 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_b0);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_ac = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_ac);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_a8 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_a8);
              uStack_a4 = (uint)(bVar148 >> 7) * auVar158._28_4_ | !(bool)(bVar148 >> 7) * uStack_a4
              ;
              auVar186 = in_ZMM4._0_32_;
              auVar158 = vpermps_avx512vl(auVar206,auVar186);
              local_a0 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                (uint)!(bool)(bVar148 & 1) * (int)local_a0);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_9c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_9c);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_98 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_98);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_94 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_94);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_90 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_90);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_8c = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_8c);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_88 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_88);
              uStack_84 = (uint)(bVar148 >> 7) * auVar158._28_4_ | !(bool)(bVar148 >> 7) * uStack_84
              ;
              auVar158 = vpermps_avx512vl(auVar209,auVar186);
              local_180 = (float)((uint)(bVar148 & 1) * auVar158._0_4_ |
                                 (uint)!(bool)(bVar148 & 1) * (int)local_180);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              fStack_17c = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fStack_17c);
              bVar7 = (bool)(bVar148 >> 2 & 1);
              fStack_178 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fStack_178);
              bVar7 = (bool)(bVar148 >> 3 & 1);
              fStack_174 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fStack_174);
              bVar7 = (bool)(bVar148 >> 4 & 1);
              fStack_170 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fStack_170);
              bVar7 = (bool)(bVar148 >> 5 & 1);
              fStack_16c = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fStack_16c);
              bVar7 = (bool)(bVar148 >> 6 & 1);
              fStack_168 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fStack_168);
              fStack_164 = (float)((uint)(bVar148 >> 7) * auVar158._28_4_ |
                                  (uint)!(bool)(bVar148 >> 7) * (int)fStack_164);
              auVar158 = vpermps_avx512vl(auVar210,auVar186);
              auVar205._0_4_ =
                   (uint)(bVar148 & 1) * auVar158._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM30._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar205._4_4_ = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * in_ZMM30._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar205._8_4_ = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * in_ZMM30._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar205._12_4_ = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * in_ZMM30._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar205._16_4_ = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * in_ZMM30._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar205._20_4_ = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * in_ZMM30._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar205._24_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * in_ZMM30._24_4_;
              auVar205._28_4_ =
                   (uint)(bVar148 >> 7) * auVar158._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM30._28_4_;
              in_ZMM30 = ZEXT3264(auVar205);
            } while (bVar144 != 0);
            auVar158 = vmulps_avx512vl(auVar205,auVar184);
            auVar186 = vmulps_avx512vl(auVar189,auVar159);
            auVar175 = vmulps_avx512vl(auVar203,auVar181);
            auVar177 = vmulps_avx512vl(auVar204,auVar182);
            fVar343 = auVar177._0_4_;
            auVar269._0_4_ = fVar343 + auVar175._0_4_ + auVar186._0_4_ + auVar158._0_4_;
            fVar350 = auVar177._4_4_;
            auVar269._4_4_ = fVar350 + auVar175._4_4_ + auVar186._4_4_ + auVar158._4_4_;
            fVar352 = auVar177._8_4_;
            auVar269._8_4_ = fVar352 + auVar175._8_4_ + auVar186._8_4_ + auVar158._8_4_;
            fVar354 = auVar177._12_4_;
            auVar269._12_4_ = fVar354 + auVar175._12_4_ + auVar186._12_4_ + auVar158._12_4_;
            fVar356 = auVar177._16_4_;
            auVar269._16_4_ = fVar356 + auVar175._16_4_ + auVar186._16_4_ + auVar158._16_4_;
            fVar357 = auVar177._20_4_;
            auVar269._20_4_ = fVar357 + auVar175._20_4_ + auVar186._20_4_ + auVar158._20_4_;
            fVar358 = auVar177._24_4_;
            auVar269._24_4_ = fVar358 + auVar175._24_4_ + auVar186._24_4_ + auVar158._24_4_;
            auVar269._28_4_ = auVar177._28_4_ + auVar175._28_4_ + auVar186._28_4_ + auVar158._28_4_;
            auVar302._8_4_ = 0x80000000;
            auVar302._0_8_ = 0x8000000080000000;
            auVar302._12_4_ = 0x80000000;
            auVar302._16_4_ = 0x80000000;
            auVar302._20_4_ = 0x80000000;
            auVar302._24_4_ = 0x80000000;
            auVar302._28_4_ = 0x80000000;
            uVar146 = CONCAT44(auVar269._4_4_,auVar269._0_4_);
            auVar282._0_8_ = uVar146 ^ 0x8000000080000000;
            auVar282._8_4_ = -auVar269._8_4_;
            auVar282._12_4_ = -auVar269._12_4_;
            auVar282._16_4_ = -auVar269._16_4_;
            auVar282._20_4_ = -auVar269._20_4_;
            auVar282._24_4_ = -auVar269._24_4_;
            auVar282._28_4_ = -auVar269._28_4_;
            uVar146 = vcmpps_avx512vl(auVar269,auVar282,1);
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
            auVar211._16_4_ = 0x7fffffff;
            auVar211._20_4_ = 0x7fffffff;
            auVar211._24_4_ = 0x7fffffff;
            auVar211._28_4_ = 0x7fffffff;
            vandps_avx512vl(auVar269,auVar211);
            auVar36._8_4_ = 0xbb8d3753;
            auVar36._0_8_ = 0xbb8d3753bb8d3753;
            auVar36._12_4_ = 0xbb8d3753;
            auVar36._16_4_ = 0xbb8d3753;
            auVar36._20_4_ = 0xbb8d3753;
            auVar36._24_4_ = 0xbb8d3753;
            auVar36._28_4_ = 0xbb8d3753;
            auVar158 = vmulps_avx512vl(auVar177,auVar36);
            auVar37._8_4_ = 0x3c9df1b8;
            auVar37._0_8_ = 0x3c9df1b83c9df1b8;
            auVar37._12_4_ = 0x3c9df1b8;
            auVar37._16_4_ = 0x3c9df1b8;
            auVar37._20_4_ = 0x3c9df1b8;
            auVar37._24_4_ = 0x3c9df1b8;
            auVar37._28_4_ = 0x3c9df1b8;
            auVar158 = vaddps_avx512vl(auVar158,auVar37);
            auVar99._4_4_ = fVar350 * auVar158._4_4_;
            auVar99._0_4_ = fVar343 * auVar158._0_4_;
            auVar99._8_4_ = fVar352 * auVar158._8_4_;
            auVar99._12_4_ = fVar354 * auVar158._12_4_;
            auVar99._16_4_ = fVar356 * auVar158._16_4_;
            auVar99._20_4_ = fVar357 * auVar158._20_4_;
            auVar99._24_4_ = fVar358 * auVar158._24_4_;
            auVar99._28_4_ = auVar158._28_4_;
            auVar38._8_4_ = 0xbd37e81c;
            auVar38._0_8_ = 0xbd37e81cbd37e81c;
            auVar38._12_4_ = 0xbd37e81c;
            auVar38._16_4_ = 0xbd37e81c;
            auVar38._20_4_ = 0xbd37e81c;
            auVar38._24_4_ = 0xbd37e81c;
            auVar38._28_4_ = 0xbd37e81c;
            auVar158 = vaddps_avx512vl(auVar99,auVar38);
            auVar100._4_4_ = fVar350 * auVar158._4_4_;
            auVar100._0_4_ = fVar343 * auVar158._0_4_;
            auVar100._8_4_ = fVar352 * auVar158._8_4_;
            auVar100._12_4_ = fVar354 * auVar158._12_4_;
            auVar100._16_4_ = fVar356 * auVar158._16_4_;
            auVar100._20_4_ = fVar357 * auVar158._20_4_;
            auVar100._24_4_ = fVar358 * auVar158._24_4_;
            auVar100._28_4_ = auVar158._28_4_;
            auVar39._8_4_ = 0x3db3edac;
            auVar39._0_8_ = 0x3db3edac3db3edac;
            auVar39._12_4_ = 0x3db3edac;
            auVar39._16_4_ = 0x3db3edac;
            auVar39._20_4_ = 0x3db3edac;
            auVar39._24_4_ = 0x3db3edac;
            auVar39._28_4_ = 0x3db3edac;
            auVar158 = vaddps_avx512vl(auVar100,auVar39);
            auVar186 = vmaxps_avx(auVar282,auVar269);
            auVar101._4_4_ = fVar350 * auVar158._4_4_;
            auVar101._0_4_ = fVar343 * auVar158._0_4_;
            auVar101._8_4_ = fVar352 * auVar158._8_4_;
            auVar101._12_4_ = fVar354 * auVar158._12_4_;
            auVar101._16_4_ = fVar356 * auVar158._16_4_;
            auVar101._20_4_ = fVar357 * auVar158._20_4_;
            auVar101._24_4_ = fVar358 * auVar158._24_4_;
            auVar101._28_4_ = auVar269._28_4_;
            auVar40._8_4_ = 0xbe5ba881;
            auVar40._0_8_ = 0xbe5ba881be5ba881;
            auVar40._12_4_ = 0xbe5ba881;
            auVar40._16_4_ = 0xbe5ba881;
            auVar40._20_4_ = 0xbe5ba881;
            auVar40._24_4_ = 0xbe5ba881;
            auVar40._28_4_ = 0xbe5ba881;
            auVar158 = vaddps_avx512vl(auVar101,auVar40);
            auVar283._8_4_ = 0x3f800000;
            auVar283._0_8_ = 0x3f8000003f800000;
            auVar283._12_4_ = 0x3f800000;
            auVar283._16_4_ = 0x3f800000;
            auVar283._20_4_ = 0x3f800000;
            auVar283._24_4_ = 0x3f800000;
            auVar283._28_4_ = 0x3f800000;
            uVar149 = vcmpps_avx512vl(auVar177,auVar283,6);
            auVar102._4_4_ = fVar350 * auVar158._4_4_;
            auVar102._0_4_ = fVar343 * auVar158._0_4_;
            auVar102._8_4_ = fVar352 * auVar158._8_4_;
            auVar102._12_4_ = fVar354 * auVar158._12_4_;
            auVar102._16_4_ = fVar356 * auVar158._16_4_;
            auVar102._20_4_ = fVar357 * auVar158._20_4_;
            auVar102._24_4_ = fVar358 * auVar158._24_4_;
            auVar102._28_4_ = auVar158._28_4_;
            auVar41._8_4_ = 0x3fc90fd1;
            auVar41._0_8_ = 0x3fc90fd13fc90fd1;
            auVar41._12_4_ = 0x3fc90fd1;
            auVar41._16_4_ = 0x3fc90fd1;
            auVar41._20_4_ = 0x3fc90fd1;
            auVar41._24_4_ = 0x3fc90fd1;
            auVar41._28_4_ = 0x3fc90fd1;
            auVar175 = vaddps_avx512vl(auVar102,auVar41);
            auVar158 = vsubps_avx(auVar283,auVar177);
            auVar158 = vsqrtps_avx(auVar158);
            auVar103._4_4_ = auVar158._4_4_ * auVar175._4_4_;
            auVar103._0_4_ = auVar158._0_4_ * auVar175._0_4_;
            auVar103._8_4_ = auVar158._8_4_ * auVar175._8_4_;
            auVar103._12_4_ = auVar158._12_4_ * auVar175._12_4_;
            auVar103._16_4_ = auVar158._16_4_ * auVar175._16_4_;
            auVar103._20_4_ = auVar158._20_4_ * auVar175._20_4_;
            auVar103._24_4_ = auVar158._24_4_ * auVar175._24_4_;
            auVar103._28_4_ = auVar158._28_4_;
            uVar15 = vcmpps_avx512vl(auVar186,ZEXT832(0) << 0x20,1);
            auVar313._8_4_ = 0x3fc90fdb;
            auVar313._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar313._12_4_ = 0x3fc90fdb;
            auVar313._16_4_ = 0x3fc90fdb;
            auVar313._20_4_ = 0x3fc90fdb;
            auVar313._24_4_ = 0x3fc90fdb;
            auVar313._28_4_ = 0x3fc90fdb;
            auVar158 = vsubps_avx(auVar313,auVar103);
            auVar158 = vmaxps_avx(ZEXT832(0) << 0x20,auVar158);
            auVar175 = vxorps_avx512vl(auVar158,auVar302);
            bVar7 = (bool)((byte)uVar15 & 1);
            auVar225._0_4_ = (uint)bVar7 * auVar175._0_4_ | (uint)!bVar7 * auVar158._0_4_;
            bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar225._4_4_ = (uint)bVar7 * auVar175._4_4_ | (uint)!bVar7 * auVar158._4_4_;
            bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar225._8_4_ = (uint)bVar7 * auVar175._8_4_ | (uint)!bVar7 * auVar158._8_4_;
            bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar225._12_4_ = (uint)bVar7 * auVar175._12_4_ | (uint)!bVar7 * auVar158._12_4_;
            bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar225._16_4_ = (uint)bVar7 * auVar175._16_4_ | (uint)!bVar7 * auVar158._16_4_;
            bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar225._20_4_ = (uint)bVar7 * auVar175._20_4_ | (uint)!bVar7 * auVar158._20_4_;
            bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar225._24_4_ = (uint)bVar7 * auVar175._24_4_ | (uint)!bVar7 * auVar158._24_4_;
            bVar7 = SUB81(uVar15 >> 7,0);
            auVar225._28_4_ = (uint)bVar7 * auVar175._28_4_ | (uint)!bVar7 * auVar158._28_4_;
            auVar158 = vsubps_avx(auVar313,auVar225);
            auVar175 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
            bVar7 = (bool)((byte)uVar149 & 1);
            bVar8 = (bool)((byte)(uVar149 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar149 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar149 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar149 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar149 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar149 >> 6) & 1);
            bVar14 = SUB81(uVar149 >> 7,0);
            auVar104._4_4_ =
                 fVar257 * (float)((uint)bVar8 * auVar175._4_4_ | (uint)!bVar8 * auVar158._4_4_);
            auVar104._0_4_ =
                 fVar249 * (float)((uint)bVar7 * auVar175._0_4_ | (uint)!bVar7 * auVar158._0_4_);
            auVar104._8_4_ =
                 fVar258 * (float)((uint)bVar9 * auVar175._8_4_ | (uint)!bVar9 * auVar158._8_4_);
            auVar104._12_4_ =
                 fVar259 * (float)((uint)bVar10 * auVar175._12_4_ | (uint)!bVar10 * auVar158._12_4_)
            ;
            auVar104._16_4_ =
                 fVar260 * (float)((uint)bVar11 * auVar175._16_4_ | (uint)!bVar11 * auVar158._16_4_)
            ;
            auVar104._20_4_ =
                 fVar261 * (float)((uint)bVar12 * auVar175._20_4_ | (uint)!bVar12 * auVar158._20_4_)
            ;
            auVar104._24_4_ =
                 fVar262 * (float)((uint)bVar13 * auVar175._24_4_ | (uint)!bVar13 * auVar158._24_4_)
            ;
            auVar104._28_4_ = (uint)bVar14 * auVar175._28_4_ | (uint)!bVar14 * auVar158._28_4_;
            auVar42._8_4_ = 0x3f22f983;
            auVar42._0_8_ = 0x3f22f9833f22f983;
            auVar42._12_4_ = 0x3f22f983;
            auVar42._16_4_ = 0x3f22f983;
            auVar42._20_4_ = 0x3f22f983;
            auVar42._24_4_ = 0x3f22f983;
            auVar42._28_4_ = 0x3f22f983;
            auVar158 = vmulps_avx512vl(auVar104,auVar42);
            auVar158 = vroundps_avx(auVar158,1);
            auVar105._4_4_ = auVar158._4_4_ * 1.5707964;
            auVar105._0_4_ = auVar158._0_4_ * 1.5707964;
            auVar105._8_4_ = auVar158._8_4_ * 1.5707964;
            auVar105._12_4_ = auVar158._12_4_ * 1.5707964;
            auVar105._16_4_ = auVar158._16_4_ * 1.5707964;
            auVar105._20_4_ = auVar158._20_4_ * 1.5707964;
            auVar105._24_4_ = auVar158._24_4_ * 1.5707964;
            auVar105._28_4_ = 0x3fc90fdb;
            auVar175 = vsubps_avx(auVar104,auVar105);
            auVar158 = vcvtps2dq_avx(auVar158);
            auVar177 = vpslld_avx2(auVar158,0x1f);
            uVar150 = vpmovd2m_avx512vl(auVar177);
            auVar329._8_4_ = 1;
            auVar329._0_8_ = 0x100000001;
            auVar329._12_4_ = 1;
            auVar329._16_4_ = 1;
            auVar329._20_4_ = 1;
            auVar329._24_4_ = 1;
            auVar329._28_4_ = 1;
            uVar17 = vptestnmd_avx512vl(auVar158,auVar329);
            auVar43._8_4_ = 3;
            auVar43._0_8_ = 0x300000003;
            auVar43._12_4_ = 3;
            auVar43._16_4_ = 3;
            auVar43._20_4_ = 3;
            auVar43._24_4_ = 3;
            auVar43._28_4_ = 3;
            auVar177 = vpandd_avx512vl(auVar158,auVar43);
            uVar149 = vpcmpgtd_avx512vl(auVar177,auVar329);
            auVar158 = vpcmpeqd_avx2(auVar329,auVar329);
            auVar158 = vpaddd_avx2(auVar158,auVar177);
            auVar44._8_4_ = 2;
            auVar44._0_8_ = 0x200000002;
            auVar44._12_4_ = 2;
            auVar44._16_4_ = 2;
            auVar44._20_4_ = 2;
            auVar44._24_4_ = 2;
            auVar44._28_4_ = 2;
            uVar15 = vpcmpud_avx512vl(auVar158,auVar44,1);
            fVar343 = auVar175._0_4_;
            fVar310 = fVar343 * fVar343;
            fVar350 = auVar175._4_4_;
            fVar315 = fVar350 * fVar350;
            auVar106._4_4_ = fVar315;
            auVar106._0_4_ = fVar310;
            fVar352 = auVar175._8_4_;
            fVar317 = fVar352 * fVar352;
            auVar106._8_4_ = fVar317;
            fVar354 = auVar175._12_4_;
            fVar319 = fVar354 * fVar354;
            auVar106._12_4_ = fVar319;
            fVar356 = auVar175._16_4_;
            fVar321 = fVar356 * fVar356;
            auVar106._16_4_ = fVar321;
            fVar357 = auVar175._20_4_;
            fVar323 = fVar357 * fVar357;
            auVar106._20_4_ = fVar323;
            fVar358 = auVar175._24_4_;
            fVar327 = auVar158._28_4_;
            fVar325 = fVar358 * fVar358;
            auVar106._24_4_ = fVar325;
            auVar106._28_4_ = fVar327;
            auVar45._8_4_ = 0xb2d70013;
            auVar45._0_8_ = 0xb2d70013b2d70013;
            auVar45._12_4_ = 0xb2d70013;
            auVar45._16_4_ = 0xb2d70013;
            auVar45._20_4_ = 0xb2d70013;
            auVar45._24_4_ = 0xb2d70013;
            auVar45._28_4_ = 0xb2d70013;
            auVar158 = vmulps_avx512vl(auVar106,auVar45);
            auVar46._8_4_ = 0x363938a8;
            auVar46._0_8_ = 0x363938a8363938a8;
            auVar46._12_4_ = 0x363938a8;
            auVar46._16_4_ = 0x363938a8;
            auVar46._20_4_ = 0x363938a8;
            auVar46._24_4_ = 0x363938a8;
            auVar46._28_4_ = 0x363938a8;
            auVar158 = vaddps_avx512vl(auVar158,auVar46);
            auVar47._8_4_ = 0xb48b634d;
            auVar47._0_8_ = 0xb48b634db48b634d;
            auVar47._12_4_ = 0xb48b634d;
            auVar47._16_4_ = 0xb48b634d;
            auVar47._20_4_ = 0xb48b634d;
            auVar47._24_4_ = 0xb48b634d;
            auVar47._28_4_ = 0xb48b634d;
            auVar175 = vmulps_avx512vl(auVar106,auVar47);
            auVar48._8_4_ = 0x37cfab9c;
            auVar48._0_8_ = 0x37cfab9c37cfab9c;
            auVar48._12_4_ = 0x37cfab9c;
            auVar48._16_4_ = 0x37cfab9c;
            auVar48._20_4_ = 0x37cfab9c;
            auVar48._24_4_ = 0x37cfab9c;
            auVar48._28_4_ = 0x37cfab9c;
            auVar175 = vaddps_avx512vl(auVar175,auVar48);
            auVar107._4_4_ = auVar158._4_4_ * fVar315;
            auVar107._0_4_ = auVar158._0_4_ * fVar310;
            auVar107._8_4_ = auVar158._8_4_ * fVar317;
            auVar107._12_4_ = auVar158._12_4_ * fVar319;
            auVar107._16_4_ = auVar158._16_4_ * fVar321;
            auVar107._20_4_ = auVar158._20_4_ * fVar323;
            auVar107._24_4_ = auVar158._24_4_ * fVar325;
            auVar107._28_4_ = auVar158._28_4_;
            auVar49._8_4_ = 0xb9501096;
            auVar49._0_8_ = 0xb9501096b9501096;
            auVar49._12_4_ = 0xb9501096;
            auVar49._16_4_ = 0xb9501096;
            auVar49._20_4_ = 0xb9501096;
            auVar49._24_4_ = 0xb9501096;
            auVar49._28_4_ = 0xb9501096;
            auVar158 = vaddps_avx512vl(auVar107,auVar49);
            auVar108._4_4_ = auVar175._4_4_ * fVar315;
            auVar108._0_4_ = auVar175._0_4_ * fVar310;
            auVar108._8_4_ = auVar175._8_4_ * fVar317;
            auVar108._12_4_ = auVar175._12_4_ * fVar319;
            auVar108._16_4_ = auVar175._16_4_ * fVar321;
            auVar108._20_4_ = auVar175._20_4_ * fVar323;
            auVar108._24_4_ = auVar175._24_4_ * fVar325;
            auVar108._28_4_ = auVar175._28_4_;
            auVar50._8_4_ = 0xbab60981;
            auVar50._0_8_ = 0xbab60981bab60981;
            auVar50._12_4_ = 0xbab60981;
            auVar50._16_4_ = 0xbab60981;
            auVar50._20_4_ = 0xbab60981;
            auVar50._24_4_ = 0xbab60981;
            auVar50._28_4_ = 0xbab60981;
            auVar175 = vaddps_avx512vl(auVar108,auVar50);
            auVar109._4_4_ = auVar158._4_4_ * fVar315;
            auVar109._0_4_ = auVar158._0_4_ * fVar310;
            auVar109._8_4_ = auVar158._8_4_ * fVar317;
            auVar109._12_4_ = auVar158._12_4_ * fVar319;
            auVar109._16_4_ = auVar158._16_4_ * fVar321;
            auVar109._20_4_ = auVar158._20_4_ * fVar323;
            auVar109._24_4_ = auVar158._24_4_ * fVar325;
            auVar109._28_4_ = auVar158._28_4_;
            auVar51._8_4_ = 0x3c088898;
            auVar51._0_8_ = 0x3c0888983c088898;
            auVar51._12_4_ = 0x3c088898;
            auVar51._16_4_ = 0x3c088898;
            auVar51._20_4_ = 0x3c088898;
            auVar51._24_4_ = 0x3c088898;
            auVar51._28_4_ = 0x3c088898;
            auVar158 = vaddps_avx512vl(auVar109,auVar51);
            auVar110._4_4_ = auVar175._4_4_ * fVar315;
            auVar110._0_4_ = auVar175._0_4_ * fVar310;
            auVar110._8_4_ = auVar175._8_4_ * fVar317;
            auVar110._12_4_ = auVar175._12_4_ * fVar319;
            auVar110._16_4_ = auVar175._16_4_ * fVar321;
            auVar110._20_4_ = auVar175._20_4_ * fVar323;
            auVar110._24_4_ = auVar175._24_4_ * fVar325;
            auVar110._28_4_ = auVar175._28_4_;
            auVar52._8_4_ = 0x3d2aaaa4;
            auVar52._0_8_ = 0x3d2aaaa43d2aaaa4;
            auVar52._12_4_ = 0x3d2aaaa4;
            auVar52._16_4_ = 0x3d2aaaa4;
            auVar52._20_4_ = 0x3d2aaaa4;
            auVar52._24_4_ = 0x3d2aaaa4;
            auVar52._28_4_ = 0x3d2aaaa4;
            auVar175 = vaddps_avx512vl(auVar110,auVar52);
            auVar111._4_4_ = auVar158._4_4_ * fVar315;
            auVar111._0_4_ = auVar158._0_4_ * fVar310;
            auVar111._8_4_ = auVar158._8_4_ * fVar317;
            auVar111._12_4_ = auVar158._12_4_ * fVar319;
            auVar111._16_4_ = auVar158._16_4_ * fVar321;
            auVar111._20_4_ = auVar158._20_4_ * fVar323;
            auVar111._24_4_ = auVar158._24_4_ * fVar325;
            auVar111._28_4_ = auVar158._28_4_;
            auVar53._8_4_ = 0xbe2aaaab;
            auVar53._0_8_ = 0xbe2aaaabbe2aaaab;
            auVar53._12_4_ = 0xbe2aaaab;
            auVar53._16_4_ = 0xbe2aaaab;
            auVar53._20_4_ = 0xbe2aaaab;
            auVar53._24_4_ = 0xbe2aaaab;
            auVar53._28_4_ = 0xbe2aaaab;
            auVar158 = vaddps_avx512vl(auVar111,auVar53);
            fVar342 = in_ZMM10._28_4_ + -0.5;
            fVar311 = (auVar175._0_4_ * fVar310 + -0.5) * fVar310;
            fVar316 = (auVar175._4_4_ * fVar315 + -0.5) * fVar315;
            fVar318 = (auVar175._8_4_ * fVar317 + -0.5) * fVar317;
            fVar320 = (auVar175._12_4_ * fVar319 + -0.5) * fVar319;
            fVar322 = (auVar175._16_4_ * fVar321 + -0.5) * fVar321;
            fVar324 = (auVar175._20_4_ * fVar323 + -0.5) * fVar323;
            fVar326 = (auVar175._24_4_ * fVar325 + -0.5) * fVar325;
            fVar343 = (auVar158._0_4_ * fVar310 + 1.0) * fVar343;
            fVar350 = (auVar158._4_4_ * fVar315 + 1.0) * fVar350;
            auVar112._4_4_ = fVar350;
            auVar112._0_4_ = fVar343;
            fVar352 = (auVar158._8_4_ * fVar317 + 1.0) * fVar352;
            auVar112._8_4_ = fVar352;
            fVar354 = (auVar158._12_4_ * fVar319 + 1.0) * fVar354;
            auVar112._12_4_ = fVar354;
            fVar356 = (auVar158._16_4_ * fVar321 + 1.0) * fVar356;
            auVar112._16_4_ = fVar356;
            fVar357 = (auVar158._20_4_ * fVar323 + 1.0) * fVar357;
            auVar112._20_4_ = fVar357;
            fVar358 = (auVar158._24_4_ * fVar325 + 1.0) * fVar358;
            auVar112._24_4_ = fVar358;
            auVar112._28_4_ = fVar342;
            auVar308._0_4_ = fVar311 + 1.0;
            auVar308._4_4_ = fVar316 + 1.0;
            auVar308._8_4_ = fVar318 + 1.0;
            auVar308._12_4_ = fVar320 + 1.0;
            auVar308._16_4_ = fVar322 + 1.0;
            auVar308._20_4_ = fVar324 + 1.0;
            auVar308._24_4_ = fVar326 + 1.0;
            auVar308._28_4_ = fVar327 + 1.0;
            auVar158 = vblendmps_avx512vl(auVar112,auVar308);
            bVar7 = (bool)((byte)uVar150 & 1);
            uVar151 = (uint)bVar7 * auVar158._0_4_ | (uint)!bVar7 * (int)fVar311;
            bVar7 = (bool)((byte)(uVar150 >> 1) & 1);
            uVar232 = (uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * (int)fVar316;
            bVar7 = (bool)((byte)(uVar150 >> 2) & 1);
            uVar233 = (uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * (int)fVar318;
            bVar7 = (bool)((byte)(uVar150 >> 3) & 1);
            uVar234 = (uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * (int)fVar320;
            bVar7 = (bool)((byte)(uVar150 >> 4) & 1);
            uVar235 = (uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * (int)fVar322;
            bVar7 = (bool)((byte)(uVar150 >> 5) & 1);
            uVar237 = (uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * (int)fVar324;
            bVar7 = (bool)((byte)(uVar150 >> 6) & 1);
            uVar242 = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)fVar326;
            bVar7 = (bool)((byte)(uVar150 >> 7) & 1);
            uVar247 = (uint)bVar7 * auVar158._28_4_ | (uint)!bVar7 * (int)fVar327;
            bVar7 = (bool)((byte)uVar17 & 1);
            auVar226._0_4_ = (uint)bVar7 * (int)auVar308._0_4_ | (uint)!bVar7 * (int)fVar343;
            bVar7 = (bool)((byte)(uVar17 >> 1) & 1);
            auVar226._4_4_ = (uint)bVar7 * (int)auVar308._4_4_ | (uint)!bVar7 * (int)fVar350;
            bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
            auVar226._8_4_ = (uint)bVar7 * (int)auVar308._8_4_ | (uint)!bVar7 * (int)fVar352;
            bVar7 = (bool)((byte)(uVar17 >> 3) & 1);
            auVar226._12_4_ = (uint)bVar7 * (int)auVar308._12_4_ | (uint)!bVar7 * (int)fVar354;
            bVar7 = (bool)((byte)(uVar17 >> 4) & 1);
            auVar226._16_4_ = (uint)bVar7 * (int)auVar308._16_4_ | (uint)!bVar7 * (int)fVar356;
            bVar7 = (bool)((byte)(uVar17 >> 5) & 1);
            auVar226._20_4_ = (uint)bVar7 * (int)auVar308._20_4_ | (uint)!bVar7 * (int)fVar357;
            bVar7 = (bool)((byte)(uVar17 >> 6) & 1);
            auVar226._24_4_ = (uint)bVar7 * (int)auVar308._24_4_ | (uint)!bVar7 * (int)fVar358;
            bVar7 = SUB81(uVar17 >> 7,0);
            auVar226._28_4_ = (uint)bVar7 * (int)auVar308._28_4_ | (uint)!bVar7 * (int)fVar342;
            auVar158 = vxorps_avx512vl(auVar205,auVar302);
            bVar144 = (byte)uVar146;
            auVar227._0_4_ =
                 (uint)(bVar144 & 1) * auVar158._0_4_ | !(bool)(bVar144 & 1) * auVar205._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar227._4_4_ = (uint)bVar7 * auVar158._4_4_ | !bVar7 * auVar205._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar227._8_4_ = (uint)bVar7 * auVar158._8_4_ | !bVar7 * auVar205._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar227._12_4_ = (uint)bVar7 * auVar158._12_4_ | !bVar7 * auVar205._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar227._16_4_ = (uint)bVar7 * auVar158._16_4_ | !bVar7 * auVar205._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar227._20_4_ = (uint)bVar7 * auVar158._20_4_ | !bVar7 * auVar205._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar227._24_4_ = (uint)bVar7 * auVar158._24_4_ | !bVar7 * auVar205._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar227._28_4_ = (uint)bVar7 * auVar158._28_4_ | !bVar7 * auVar205._28_4_;
            auVar158 = vxorps_avx512vl(auVar189,auVar302);
            auVar228._0_4_ =
                 (uint)(bVar144 & 1) * auVar158._0_4_ | !(bool)(bVar144 & 1) * auVar189._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar228._4_4_ = (uint)bVar7 * auVar158._4_4_ | !bVar7 * auVar189._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar228._8_4_ = (uint)bVar7 * auVar158._8_4_ | !bVar7 * auVar189._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar228._12_4_ = (uint)bVar7 * auVar158._12_4_ | !bVar7 * auVar189._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar228._16_4_ = (uint)bVar7 * auVar158._16_4_ | !bVar7 * auVar189._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar228._20_4_ = (uint)bVar7 * auVar158._20_4_ | !bVar7 * auVar189._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar228._24_4_ = (uint)bVar7 * auVar158._24_4_ | !bVar7 * auVar189._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar228._28_4_ = (uint)bVar7 * auVar158._28_4_ | !bVar7 * auVar189._28_4_;
            auVar158 = vfmsub213ps_avx512vl(auVar184,auVar186,auVar227);
            auVar152 = vfmsub213ps_fma(auVar159,auVar186,auVar228);
            fVar343 = auVar158._0_4_;
            fVar357 = auVar158._4_4_;
            fVar315 = auVar158._8_4_;
            fVar320 = auVar158._12_4_;
            fVar325 = auVar158._16_4_;
            fVar239 = auVar158._20_4_;
            fVar244 = auVar158._24_4_;
            fVar350 = auVar152._0_4_;
            fVar358 = auVar152._4_4_;
            fVar316 = auVar152._8_4_;
            fVar321 = auVar152._12_4_;
            auVar175 = vxorps_avx512vl(auVar203,auVar302);
            auVar229._0_4_ =
                 (uint)(bVar144 & 1) * auVar175._0_4_ | !(bool)(bVar144 & 1) * auVar203._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar229._4_4_ = (uint)bVar7 * auVar175._4_4_ | !bVar7 * auVar203._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar229._8_4_ = (uint)bVar7 * auVar175._8_4_ | !bVar7 * auVar203._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar229._12_4_ = (uint)bVar7 * auVar175._12_4_ | !bVar7 * auVar203._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar229._16_4_ = (uint)bVar7 * auVar175._16_4_ | !bVar7 * auVar203._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar229._20_4_ = (uint)bVar7 * auVar175._20_4_ | !bVar7 * auVar203._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar229._24_4_ = (uint)bVar7 * auVar175._24_4_ | !bVar7 * auVar203._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar229._28_4_ = (uint)bVar7 * auVar175._28_4_ | !bVar7 * auVar203._28_4_;
            auVar175 = vfmsub213ps_avx512vl(auVar181,auVar186,auVar229);
            fVar352 = auVar175._0_4_;
            fVar327 = auVar175._4_4_;
            fVar317 = auVar175._8_4_;
            fVar322 = auVar175._12_4_;
            fVar326 = auVar175._16_4_;
            fVar240 = auVar175._20_4_;
            fVar245 = auVar175._24_4_;
            auVar175 = vxorps_avx512vl(auVar204,auVar302);
            auVar230._0_4_ =
                 (uint)(bVar144 & 1) * auVar175._0_4_ | !(bool)(bVar144 & 1) * auVar204._0_4_;
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            auVar230._4_4_ = (uint)bVar7 * auVar175._4_4_ | !bVar7 * auVar204._4_4_;
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            auVar230._8_4_ = (uint)bVar7 * auVar175._8_4_ | !bVar7 * auVar204._8_4_;
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            auVar230._12_4_ = (uint)bVar7 * auVar175._12_4_ | !bVar7 * auVar204._12_4_;
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            auVar230._16_4_ = (uint)bVar7 * auVar175._16_4_ | !bVar7 * auVar204._16_4_;
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            auVar230._20_4_ = (uint)bVar7 * auVar175._20_4_ | !bVar7 * auVar204._20_4_;
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            auVar230._24_4_ = (uint)bVar7 * auVar175._24_4_ | !bVar7 * auVar204._24_4_;
            bVar7 = SUB81(uVar146 >> 7,0);
            auVar230._28_4_ = (uint)bVar7 * auVar175._28_4_ | !bVar7 * auVar204._28_4_;
            auVar175 = vfmsub213ps_avx512vl(auVar182,auVar186,auVar230);
            fVar354 = auVar175._0_4_;
            fVar310 = auVar175._4_4_;
            fVar318 = auVar175._8_4_;
            fVar323 = auVar175._12_4_;
            fVar342 = auVar175._16_4_;
            fVar241 = auVar175._20_4_;
            fVar246 = auVar175._24_4_;
            auVar349._0_4_ =
                 fVar354 * fVar354 + fVar352 * fVar352 + fVar343 * fVar343 + fVar350 * fVar350;
            auVar349._4_4_ =
                 fVar310 * fVar310 + fVar327 * fVar327 + fVar357 * fVar357 + fVar358 * fVar358;
            auVar349._8_4_ =
                 fVar318 * fVar318 + fVar317 * fVar317 + fVar315 * fVar315 + fVar316 * fVar316;
            auVar349._12_4_ =
                 fVar323 * fVar323 + fVar322 * fVar322 + fVar320 * fVar320 + fVar321 * fVar321;
            auVar349._16_4_ = fVar342 * fVar342 + fVar326 * fVar326 + fVar325 * fVar325 + 0.0;
            auVar349._20_4_ = fVar241 * fVar241 + fVar240 * fVar240 + fVar239 * fVar239 + 0.0;
            auVar349._24_4_ = fVar246 * fVar246 + fVar245 * fVar245 + fVar244 * fVar244 + 0.0;
            auVar349._28_4_ = fStack_164 + 1.4013e-45 + 2.8026e-45 + 4.2039e-45;
            auVar175 = vrsqrt14ps_avx512vl(auVar349);
            fVar356 = auVar175._0_4_;
            fVar311 = auVar175._4_4_;
            fVar319 = auVar175._8_4_;
            fVar324 = auVar175._12_4_;
            fVar236 = auVar175._16_4_;
            fVar238 = auVar175._20_4_;
            fVar243 = auVar175._24_4_;
            auVar113._4_4_ = auVar349._4_4_ * -0.5 * fVar311 * fVar311 * fVar311;
            auVar113._0_4_ = auVar349._0_4_ * -0.5 * fVar356 * fVar356 * fVar356;
            auVar113._8_4_ = auVar349._8_4_ * -0.5 * fVar319 * fVar319 * fVar319;
            auVar113._12_4_ = auVar349._12_4_ * -0.5 * fVar324 * fVar324 * fVar324;
            auVar113._16_4_ = auVar349._16_4_ * -0.5 * fVar236 * fVar236 * fVar236;
            auVar113._20_4_ = auVar349._20_4_ * -0.5 * fVar238 * fVar238 * fVar238;
            auVar113._24_4_ = auVar349._24_4_ * -0.5 * fVar243 * fVar243 * fVar243;
            auVar113._28_4_ = auVar349._28_4_;
            auVar370._8_4_ = 0x3fc00000;
            auVar370._0_8_ = 0x3fc000003fc00000;
            auVar370._12_4_ = 0x3fc00000;
            auVar370._16_4_ = 0x3fc00000;
            auVar370._20_4_ = 0x3fc00000;
            auVar370._24_4_ = 0x3fc00000;
            auVar370._28_4_ = 0x3fc00000;
            auVar152 = vfmadd231ps_fma(auVar113,auVar370,auVar175);
            fVar248 = auVar152._0_4_;
            fVar351 = auVar152._4_4_;
            fVar353 = auVar152._8_4_;
            fVar355 = auVar152._12_4_;
            auVar177 = vxorps_avx512vl(auVar226,auVar302);
            bVar7 = (bool)((byte)uVar15 & 1);
            auVar231._0_4_ = (uint)bVar7 * auVar177._0_4_ | !bVar7 * auVar226._0_4_;
            bVar7 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar231._4_4_ = (uint)bVar7 * auVar177._4_4_ | !bVar7 * auVar226._4_4_;
            bVar7 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar231._8_4_ = (uint)bVar7 * auVar177._8_4_ | !bVar7 * auVar226._8_4_;
            bVar7 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar231._12_4_ = (uint)bVar7 * auVar177._12_4_ | !bVar7 * auVar226._12_4_;
            bVar7 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar231._16_4_ = (uint)bVar7 * auVar177._16_4_ | !bVar7 * auVar226._16_4_;
            bVar7 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar231._20_4_ = (uint)bVar7 * auVar177._20_4_ | !bVar7 * auVar226._20_4_;
            bVar7 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar231._24_4_ = (uint)bVar7 * auVar177._24_4_ | !bVar7 * auVar226._24_4_;
            bVar7 = SUB81(uVar15 >> 7,0);
            auVar231._28_4_ = (uint)bVar7 * auVar177._28_4_ | !bVar7 * auVar226._28_4_;
            bVar7 = (bool)((byte)uVar149 & 1);
            fVar356 = (float)(bVar7 * uVar151 | (uint)!bVar7 * (uVar151 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 1) & 1);
            fVar311 = (float)(bVar7 * uVar232 | (uint)!bVar7 * (uVar232 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 2) & 1);
            fVar319 = (float)(bVar7 * uVar233 | (uint)!bVar7 * (uVar233 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 3) & 1);
            fVar324 = (float)(bVar7 * uVar234 | (uint)!bVar7 * (uVar234 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 4) & 1);
            fVar236 = (float)(bVar7 * uVar235 | (uint)!bVar7 * (uVar235 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 5) & 1);
            fVar238 = (float)(bVar7 * uVar237 | (uint)!bVar7 * (uVar237 ^ 0x80000000));
            bVar7 = (bool)((byte)(uVar149 >> 6) & 1);
            fVar243 = (float)(bVar7 * uVar242 | (uint)!bVar7 * (uVar242 ^ 0x80000000));
            bVar7 = SUB81(uVar149 >> 7,0);
            auVar114._4_4_ = fVar311 * fVar351 * fVar357;
            auVar114._0_4_ = fVar356 * fVar248 * fVar343;
            auVar114._8_4_ = fVar319 * fVar353 * fVar315;
            auVar114._12_4_ = fVar324 * fVar355 * fVar320;
            auVar114._16_4_ = fVar236 * fVar325 * 0.0;
            auVar114._20_4_ = fVar238 * fVar239 * 0.0;
            auVar114._24_4_ = fVar243 * fVar244 * 0.0;
            auVar114._28_4_ = 0x80000000;
            auVar115._4_4_ = fVar358 * fVar351 * fVar311;
            auVar115._0_4_ = fVar350 * fVar248 * fVar356;
            auVar115._8_4_ = fVar316 * fVar353 * fVar319;
            auVar115._12_4_ = fVar321 * fVar355 * fVar324;
            auVar115._16_4_ = fVar236 * 0.0;
            auVar115._20_4_ = fVar238 * 0.0;
            auVar115._24_4_ = fVar243 * 0.0;
            auVar115._28_4_ = auVar158._28_4_;
            auVar116._4_4_ = fVar327 * fVar351 * fVar311;
            auVar116._0_4_ = fVar352 * fVar248 * fVar356;
            auVar116._8_4_ = fVar317 * fVar353 * fVar319;
            auVar116._12_4_ = fVar322 * fVar355 * fVar324;
            auVar116._16_4_ = fVar326 * 0.0 * fVar236;
            auVar116._20_4_ = fVar240 * 0.0 * fVar238;
            auVar116._24_4_ = fVar245 * 0.0 * fVar243;
            auVar116._28_4_ = uVar247;
            auVar117._4_4_ = fVar310 * fVar351 * fVar311;
            auVar117._0_4_ = fVar354 * fVar248 * fVar356;
            auVar117._8_4_ = fVar318 * fVar353 * fVar319;
            auVar117._12_4_ = fVar323 * fVar355 * fVar324;
            auVar117._16_4_ = fVar342 * 0.0 * fVar236;
            auVar117._20_4_ = fVar241 * 0.0 * fVar238;
            auVar117._24_4_ = fVar246 * 0.0 * fVar243;
            auVar117._28_4_ = 0;
            auVar158 = vfmadd231ps_avx512vl(auVar114,auVar231,auVar184);
            auVar177 = vfmadd231ps_avx512vl(auVar115,auVar231,auVar159);
            auVar180 = vfmadd231ps_avx512vl(auVar116,auVar231,auVar181);
            auVar183 = vfmadd231ps_avx512vl(auVar117,auVar182,auVar231);
            auVar189 = vsubps_avx512vl(auVar227,auVar184);
            auVar184 = vfmadd213ps_avx512vl(auVar189,auVar176,auVar184);
            auVar189 = vsubps_avx512vl(auVar228,auVar159);
            auVar159 = vfmadd213ps_avx512vl(auVar189,auVar176,auVar159);
            auVar189 = vsubps_avx512vl(auVar229,auVar181);
            auVar181 = vfmadd213ps_avx512vl(auVar189,auVar176,auVar181);
            auVar189 = vsubps_avx512vl(auVar230,auVar182);
            auVar182 = vfmadd213ps_avx512vl(auVar189,auVar176,auVar182);
            fVar327 = auVar175._28_4_;
            auVar364._0_4_ =
                 auVar182._0_4_ * auVar182._0_4_ +
                 auVar181._0_4_ * auVar181._0_4_ +
                 auVar184._0_4_ * auVar184._0_4_ + auVar159._0_4_ * auVar159._0_4_;
            auVar364._4_4_ =
                 auVar182._4_4_ * auVar182._4_4_ +
                 auVar181._4_4_ * auVar181._4_4_ +
                 auVar184._4_4_ * auVar184._4_4_ + auVar159._4_4_ * auVar159._4_4_;
            auVar364._8_4_ =
                 auVar182._8_4_ * auVar182._8_4_ +
                 auVar181._8_4_ * auVar181._8_4_ +
                 auVar184._8_4_ * auVar184._8_4_ + auVar159._8_4_ * auVar159._8_4_;
            auVar364._12_4_ =
                 auVar182._12_4_ * auVar182._12_4_ +
                 auVar181._12_4_ * auVar181._12_4_ +
                 auVar184._12_4_ * auVar184._12_4_ + auVar159._12_4_ * auVar159._12_4_;
            auVar364._16_4_ =
                 auVar182._16_4_ * auVar182._16_4_ +
                 auVar181._16_4_ * auVar181._16_4_ +
                 auVar184._16_4_ * auVar184._16_4_ + auVar159._16_4_ * auVar159._16_4_;
            auVar364._20_4_ =
                 auVar182._20_4_ * auVar182._20_4_ +
                 auVar181._20_4_ * auVar181._20_4_ +
                 auVar184._20_4_ * auVar184._20_4_ + auVar159._20_4_ * auVar159._20_4_;
            auVar364._24_4_ =
                 auVar182._24_4_ * auVar182._24_4_ +
                 auVar181._24_4_ * auVar181._24_4_ +
                 auVar184._24_4_ * auVar184._24_4_ + auVar159._24_4_ * auVar159._24_4_;
            auVar364._28_4_ =
                 fVar327 + fVar327 + (float)(bVar7 * uVar247 | (uint)!bVar7 * (uVar247 ^ 0x80000000)
                                            ) + fVar327;
            auVar189 = vrsqrt14ps_avx512vl(auVar364);
            fVar343 = auVar189._0_4_;
            fVar350 = auVar189._4_4_;
            fVar352 = auVar189._8_4_;
            fVar354 = auVar189._12_4_;
            fVar356 = auVar189._16_4_;
            fVar357 = auVar189._20_4_;
            fVar358 = auVar189._24_4_;
            auVar118._4_4_ = auVar364._4_4_ * -0.5 * fVar350 * fVar350 * fVar350;
            auVar118._0_4_ = auVar364._0_4_ * -0.5 * fVar343 * fVar343 * fVar343;
            auVar118._8_4_ = auVar364._8_4_ * -0.5 * fVar352 * fVar352 * fVar352;
            auVar118._12_4_ = auVar364._12_4_ * -0.5 * fVar354 * fVar354 * fVar354;
            auVar118._16_4_ = auVar364._16_4_ * -0.5 * fVar356 * fVar356 * fVar356;
            auVar118._20_4_ = auVar364._20_4_ * -0.5 * fVar357 * fVar357 * fVar357;
            auVar118._24_4_ = auVar364._24_4_ * -0.5 * fVar358 * fVar358 * fVar358;
            auVar118._28_4_ = 0xbf000000;
            auVar152 = vfmadd231ps_fma(auVar118,auVar189,auVar370);
            auVar54._8_4_ = 0x3f7fdf3b;
            auVar54._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar54._12_4_ = 0x3f7fdf3b;
            auVar54._16_4_ = 0x3f7fdf3b;
            auVar54._20_4_ = 0x3f7fdf3b;
            auVar54._24_4_ = 0x3f7fdf3b;
            auVar54._28_4_ = 0x3f7fdf3b;
            uVar146 = vcmpps_avx512vl(auVar186,auVar54,6);
            auVar186 = vmulps_avx512vl(auVar184,ZEXT1632(auVar152));
            bVar144 = (byte)uVar146;
            fVar354 = (float)((uint)(bVar144 & 1) * auVar186._0_4_ |
                             (uint)!(bool)(bVar144 & 1) * auVar158._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            fVar310 = (float)((uint)bVar7 * auVar186._4_4_ | (uint)!bVar7 * auVar158._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            fVar317 = (float)((uint)bVar7 * auVar186._8_4_ | (uint)!bVar7 * auVar158._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            fVar321 = (float)((uint)bVar7 * auVar186._12_4_ | (uint)!bVar7 * auVar158._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            fVar325 = (float)((uint)bVar7 * auVar186._16_4_ | (uint)!bVar7 * auVar158._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            fVar239 = (float)((uint)bVar7 * auVar186._20_4_ | (uint)!bVar7 * auVar158._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            fVar244 = (float)((uint)bVar7 * auVar186._24_4_ | (uint)!bVar7 * auVar158._24_4_);
            bVar7 = SUB81(uVar146 >> 7,0);
            fVar248 = (float)((uint)bVar7 * auVar186._28_4_ | (uint)!bVar7 * auVar158._28_4_);
            auVar158 = vmulps_avx512vl(auVar159,ZEXT1632(auVar152));
            fVar356 = (float)((uint)(bVar144 & 1) * auVar158._0_4_ |
                             (uint)!(bool)(bVar144 & 1) * auVar177._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            fVar311 = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * auVar177._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            fVar318 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * auVar177._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            fVar322 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * auVar177._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            fVar326 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * auVar177._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            fVar240 = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * auVar177._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            fVar245 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * auVar177._24_4_);
            auVar158 = vmulps_avx512vl(auVar181,ZEXT1632(auVar152));
            fVar357 = (float)((uint)(bVar144 & 1) * auVar158._0_4_ |
                             (uint)!(bool)(bVar144 & 1) * auVar180._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            fVar315 = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * auVar180._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            fVar319 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * auVar180._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            fVar323 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * auVar180._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            fVar342 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * auVar180._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            fVar241 = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * auVar180._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            fVar246 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * auVar180._24_4_);
            auVar158 = vmulps_avx512vl(auVar182,ZEXT1632(auVar152));
            fVar358 = (float)((uint)(bVar144 & 1) * auVar158._0_4_ |
                             (uint)!(bool)(bVar144 & 1) * auVar183._0_4_);
            bVar7 = (bool)((byte)(uVar146 >> 1) & 1);
            fVar316 = (float)((uint)bVar7 * auVar158._4_4_ | (uint)!bVar7 * auVar183._4_4_);
            bVar7 = (bool)((byte)(uVar146 >> 2) & 1);
            fVar320 = (float)((uint)bVar7 * auVar158._8_4_ | (uint)!bVar7 * auVar183._8_4_);
            bVar7 = (bool)((byte)(uVar146 >> 3) & 1);
            fVar324 = (float)((uint)bVar7 * auVar158._12_4_ | (uint)!bVar7 * auVar183._12_4_);
            bVar7 = (bool)((byte)(uVar146 >> 4) & 1);
            fVar236 = (float)((uint)bVar7 * auVar158._16_4_ | (uint)!bVar7 * auVar183._16_4_);
            bVar7 = (bool)((byte)(uVar146 >> 5) & 1);
            fVar238 = (float)((uint)bVar7 * auVar158._20_4_ | (uint)!bVar7 * auVar183._20_4_);
            bVar7 = (bool)((byte)(uVar146 >> 6) & 1);
            fVar243 = (float)((uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * auVar183._24_4_);
            auVar158 = vsubps_avx(auVar283,auVar176);
            auVar186 = vmulps_avx512vl(auVar176,auVar185);
            auVar177 = vfmadd213ps_avx512vl(auVar178,auVar158,auVar186);
            auVar186 = vmulps_avx512vl(auVar176,auVar187);
            auVar178 = vfmadd213ps_avx512vl(auVar179,auVar158,auVar186);
            auVar186 = vmulps_avx512vl(auVar176,auVar188);
            auVar179 = vfmadd213ps_avx512vl(local_160,auVar158,auVar186);
            auVar186 = vmulps_avx512vl(auVar176,auVar200);
            auVar175 = vmulps_avx512vl(auVar176,auVar207);
            auVar159 = vmulps_avx512vl(auVar176,auVar208);
            auVar180 = vfmadd213ps_avx512vl(local_200,auVar158,auVar186);
            auVar183 = vfmadd213ps_avx512vl(local_260,auVar158,auVar175);
            auVar185 = vfmadd213ps_avx512vl(local_1e0,auVar158,auVar159);
            auVar119._4_4_ = fVar257 * fStack_11c;
            auVar119._0_4_ = fVar249 * local_120;
            auVar119._8_4_ = fVar258 * fStack_118;
            auVar119._12_4_ = fVar259 * fStack_114;
            auVar119._16_4_ = fVar260 * fStack_110;
            auVar119._20_4_ = fVar261 * fStack_10c;
            fVar343 = auVar186._28_4_;
            auVar119._24_4_ = fVar262 * fStack_108;
            auVar119._28_4_ = fVar343;
            auVar120._4_4_ = fVar257 * fStack_fc;
            auVar120._0_4_ = fVar249 * local_100;
            auVar120._8_4_ = fVar258 * fStack_f8;
            auVar120._12_4_ = fVar259 * fStack_f4;
            auVar120._16_4_ = fVar260 * fStack_f0;
            auVar120._20_4_ = fVar261 * fStack_ec;
            fVar350 = auVar175._28_4_;
            auVar120._24_4_ = fVar262 * fStack_e8;
            auVar120._28_4_ = fVar350;
            auVar121._4_4_ = fVar257 * fStack_dc;
            auVar121._0_4_ = fVar249 * local_e0;
            auVar121._8_4_ = fVar258 * fStack_d8;
            auVar121._12_4_ = fVar259 * fStack_d4;
            auVar121._16_4_ = fVar260 * fStack_d0;
            auVar121._20_4_ = fVar261 * fStack_cc;
            fVar352 = auVar159._28_4_;
            auVar121._24_4_ = fVar262 * fStack_c8;
            auVar121._28_4_ = fVar352;
            auVar159 = vfmadd213ps_avx512vl(local_2a0,auVar158,auVar119);
            auVar187 = vfmadd213ps_avx512vl(local_220,auVar158,auVar120);
            auVar188 = vfmadd213ps_avx512vl(local_1c0,auVar158,auVar121);
            auVar122._4_4_ = fVar257 * fStack_bc;
            auVar122._0_4_ = fVar249 * local_c0;
            auVar122._8_4_ = fVar258 * fStack_b8;
            auVar122._12_4_ = fVar259 * fStack_b4;
            auVar122._16_4_ = fVar260 * fStack_b0;
            auVar122._20_4_ = fVar261 * fStack_ac;
            auVar122._24_4_ = fVar262 * fStack_a8;
            auVar122._28_4_ = fVar343;
            auVar123._4_4_ = fVar257 * fStack_9c;
            auVar123._0_4_ = fVar249 * local_a0;
            auVar123._8_4_ = fVar258 * fStack_98;
            auVar123._12_4_ = fVar259 * fStack_94;
            auVar123._16_4_ = fVar260 * fStack_90;
            auVar123._20_4_ = fVar261 * fStack_8c;
            auVar123._24_4_ = fVar262 * fStack_88;
            auVar123._28_4_ = fVar350;
            auVar142._4_4_ = fVar257 * fStack_17c;
            auVar142._0_4_ = fVar249 * local_180;
            auVar142._8_4_ = fVar258 * fStack_178;
            auVar142._12_4_ = fVar259 * fStack_174;
            auVar142._16_4_ = fVar260 * fStack_170;
            auVar142._20_4_ = fVar261 * fStack_16c;
            auVar142._24_4_ = fVar262 * fStack_168;
            auVar142._28_4_ = auVar176._28_4_;
            auVar200 = vfmadd213ps_avx512vl(_local_280,auVar158,auVar122);
            auVar207 = vfmadd213ps_avx512vl(_local_240,auVar158,auVar123);
            auVar208 = vfmadd213ps_avx512vl(local_2c0,auVar158,auVar142);
            auVar124._4_4_ = fVar310 * fVar310;
            auVar124._0_4_ = fVar354 * fVar354;
            auVar124._8_4_ = fVar317 * fVar317;
            auVar124._12_4_ = fVar321 * fVar321;
            auVar124._16_4_ = fVar325 * fVar325;
            auVar124._20_4_ = fVar239 * fVar239;
            auVar124._24_4_ = fVar244 * fVar244;
            auVar124._28_4_ = fVar343;
            auVar125._4_4_ = fVar311 * fVar311;
            auVar125._0_4_ = fVar356 * fVar356;
            auVar125._8_4_ = fVar318 * fVar318;
            auVar125._12_4_ = fVar322 * fVar322;
            auVar125._16_4_ = fVar326 * fVar326;
            auVar125._20_4_ = fVar240 * fVar240;
            auVar125._24_4_ = fVar245 * fVar245;
            auVar125._28_4_ = fVar350;
            auVar255._0_4_ = fVar354 * fVar354 + fVar356 * fVar356;
            auVar255._4_4_ = fVar310 * fVar310 + fVar311 * fVar311;
            auVar255._8_4_ = fVar317 * fVar317 + fVar318 * fVar318;
            auVar255._12_4_ = fVar321 * fVar321 + fVar322 * fVar322;
            auVar255._16_4_ = fVar325 * fVar325 + fVar326 * fVar326;
            auVar255._20_4_ = fVar239 * fVar239 + fVar240 * fVar240;
            auVar255._24_4_ = fVar244 * fVar244 + fVar245 * fVar245;
            auVar255._28_4_ = fVar343 + fVar350;
            auVar126._4_4_ = fVar315 * fVar315;
            auVar126._0_4_ = fVar357 * fVar357;
            auVar126._8_4_ = fVar319 * fVar319;
            auVar126._12_4_ = fVar323 * fVar323;
            auVar126._16_4_ = fVar342 * fVar342;
            auVar126._20_4_ = fVar241 * fVar241;
            auVar126._24_4_ = fVar246 * fVar246;
            auVar126._28_4_ = auVar181._28_4_;
            auVar158 = vsubps_avx(auVar255,auVar126);
            auVar127._4_4_ = fVar316 * fVar316;
            auVar127._0_4_ = fVar358 * fVar358;
            auVar127._8_4_ = fVar320 * fVar320;
            auVar127._12_4_ = fVar324 * fVar324;
            auVar127._16_4_ = fVar236 * fVar236;
            auVar127._20_4_ = fVar238 * fVar238;
            auVar127._24_4_ = fVar243 * fVar243;
            auVar127._28_4_ = auVar182._28_4_;
            auVar158 = vsubps_avx(auVar158,auVar127);
            auVar128._4_4_ = fVar311 * fVar315;
            auVar128._0_4_ = fVar356 * fVar357;
            auVar128._8_4_ = fVar318 * fVar319;
            auVar128._12_4_ = fVar322 * fVar323;
            auVar128._16_4_ = fVar326 * fVar342;
            auVar128._20_4_ = fVar240 * fVar241;
            auVar128._24_4_ = fVar245 * fVar246;
            auVar128._28_4_ = fVar352;
            auVar129._4_4_ = fVar316 * fVar310;
            auVar129._0_4_ = fVar358 * fVar354;
            auVar129._8_4_ = fVar320 * fVar317;
            auVar129._12_4_ = fVar324 * fVar321;
            auVar129._16_4_ = fVar236 * fVar325;
            auVar129._20_4_ = fVar238 * fVar239;
            auVar129._24_4_ = fVar243 * fVar244;
            auVar129._28_4_ = auVar184._28_4_;
            fVar249 = fVar356 * fVar357 + fVar358 * fVar354;
            fVar257 = fVar311 * fVar315 + fVar316 * fVar310;
            fVar258 = fVar318 * fVar319 + fVar320 * fVar317;
            fVar259 = fVar322 * fVar323 + fVar324 * fVar321;
            fVar260 = fVar326 * fVar342 + fVar236 * fVar325;
            fVar261 = fVar240 * fVar241 + fVar238 * fVar239;
            fVar262 = fVar245 * fVar246 + fVar243 * fVar244;
            fVar352 = fVar352 + auVar184._28_4_;
            auVar256._0_4_ = fVar249 + fVar249;
            auVar256._4_4_ = fVar257 + fVar257;
            auVar256._8_4_ = fVar258 + fVar258;
            auVar256._12_4_ = fVar259 + fVar259;
            auVar256._16_4_ = fVar260 + fVar260;
            auVar256._20_4_ = fVar261 + fVar261;
            auVar256._24_4_ = fVar262 + fVar262;
            auVar256._28_4_ = fVar352 + fVar352;
            auVar130._4_4_ = fVar316 * fVar311;
            auVar130._0_4_ = fVar358 * fVar356;
            auVar130._8_4_ = fVar320 * fVar318;
            auVar130._12_4_ = fVar324 * fVar322;
            auVar130._16_4_ = fVar236 * fVar326;
            auVar130._20_4_ = fVar238 * fVar240;
            auVar130._24_4_ = fVar243 * fVar245;
            auVar130._28_4_ = auVar189._28_4_;
            auVar131._4_4_ = fVar310 * fVar315;
            auVar131._0_4_ = fVar354 * fVar357;
            auVar131._8_4_ = fVar317 * fVar319;
            auVar131._12_4_ = fVar321 * fVar323;
            auVar131._16_4_ = fVar325 * fVar342;
            auVar131._20_4_ = fVar239 * fVar241;
            auVar131._24_4_ = fVar244 * fVar246;
            auVar131._28_4_ = fVar327;
            auVar186 = vsubps_avx(auVar130,auVar131);
            auVar371._0_4_ = auVar186._0_4_ + auVar186._0_4_;
            auVar371._4_4_ = auVar186._4_4_ + auVar186._4_4_;
            auVar371._8_4_ = auVar186._8_4_ + auVar186._8_4_;
            auVar371._12_4_ = auVar186._12_4_ + auVar186._12_4_;
            auVar371._16_4_ = auVar186._16_4_ + auVar186._16_4_;
            auVar371._20_4_ = auVar186._20_4_ + auVar186._20_4_;
            auVar371._24_4_ = auVar186._24_4_ + auVar186._24_4_;
            auVar371._28_4_ = auVar186._28_4_ + auVar186._28_4_;
            auVar186 = vsubps_avx(auVar128,auVar129);
            auVar184 = vaddps_avx512vl(auVar186,auVar186);
            auVar186 = vsubps_avx(auVar124,auVar125);
            auVar294._0_4_ = fVar357 * fVar357 + auVar186._0_4_;
            auVar294._4_4_ = fVar315 * fVar315 + auVar186._4_4_;
            auVar294._8_4_ = fVar319 * fVar319 + auVar186._8_4_;
            auVar294._12_4_ = fVar323 * fVar323 + auVar186._12_4_;
            auVar294._16_4_ = fVar342 * fVar342 + auVar186._16_4_;
            auVar294._20_4_ = fVar241 * fVar241 + auVar186._20_4_;
            auVar294._24_4_ = fVar246 * fVar246 + auVar186._24_4_;
            auVar294._28_4_ = auVar181._28_4_ + auVar186._28_4_;
            auVar175 = vsubps_avx(auVar294,auVar127);
            auVar132._4_4_ = fVar316 * fVar315;
            auVar132._0_4_ = fVar358 * fVar357;
            auVar132._8_4_ = fVar320 * fVar319;
            auVar132._12_4_ = fVar324 * fVar323;
            auVar132._16_4_ = fVar236 * fVar342;
            auVar132._20_4_ = fVar238 * fVar241;
            auVar132._24_4_ = fVar243 * fVar246;
            auVar132._28_4_ = auVar294._28_4_;
            auVar133._4_4_ = fVar310 * fVar311;
            auVar133._0_4_ = fVar354 * fVar356;
            auVar133._8_4_ = fVar317 * fVar318;
            auVar133._12_4_ = fVar321 * fVar322;
            auVar133._16_4_ = fVar325 * fVar326;
            auVar133._20_4_ = fVar239 * fVar240;
            auVar133._24_4_ = fVar244 * fVar245;
            auVar133._28_4_ = fVar248;
            fVar249 = fVar358 * fVar357 + fVar354 * fVar356;
            fVar257 = fVar316 * fVar315 + fVar310 * fVar311;
            fVar258 = fVar320 * fVar319 + fVar317 * fVar318;
            fVar259 = fVar324 * fVar323 + fVar321 * fVar322;
            fVar260 = fVar236 * fVar342 + fVar325 * fVar326;
            fVar261 = fVar238 * fVar241 + fVar239 * fVar240;
            fVar262 = fVar243 * fVar246 + fVar244 * fVar245;
            auVar309._0_4_ = fVar249 + fVar249;
            auVar309._4_4_ = fVar257 + fVar257;
            auVar309._8_4_ = fVar258 + fVar258;
            auVar309._12_4_ = fVar259 + fVar259;
            auVar309._16_4_ = fVar260 + fVar260;
            auVar309._20_4_ = fVar261 + fVar261;
            auVar309._24_4_ = fVar262 + fVar262;
            auVar309._28_4_ = auVar294._28_4_ + fVar248 + auVar294._28_4_ + fVar248;
            fVar249 = fVar358 * fVar356 + fVar354 * fVar357;
            fVar257 = fVar316 * fVar311 + fVar310 * fVar315;
            fVar258 = fVar320 * fVar318 + fVar317 * fVar319;
            fVar259 = fVar324 * fVar322 + fVar321 * fVar323;
            fVar260 = fVar236 * fVar326 + fVar325 * fVar342;
            fVar261 = fVar238 * fVar240 + fVar239 * fVar241;
            fVar262 = fVar243 * fVar245 + fVar244 * fVar246;
            fVar327 = auVar189._28_4_ + fVar327;
            auVar314._0_4_ = fVar249 + fVar249;
            auVar314._4_4_ = fVar257 + fVar257;
            auVar314._8_4_ = fVar258 + fVar258;
            auVar314._12_4_ = fVar259 + fVar259;
            auVar314._16_4_ = fVar260 + fVar260;
            auVar314._20_4_ = fVar261 + fVar261;
            auVar314._24_4_ = fVar262 + fVar262;
            auVar314._28_4_ = fVar327 + fVar327;
            auVar176 = vsubps_avx(auVar132,auVar133);
            auVar341._0_4_ = auVar176._0_4_ + auVar176._0_4_;
            auVar341._4_4_ = auVar176._4_4_ + auVar176._4_4_;
            auVar341._8_4_ = auVar176._8_4_ + auVar176._8_4_;
            auVar341._12_4_ = auVar176._12_4_ + auVar176._12_4_;
            auVar341._16_4_ = auVar176._16_4_ + auVar176._16_4_;
            auVar341._20_4_ = auVar176._20_4_ + auVar176._20_4_;
            auVar341._24_4_ = auVar176._24_4_ + auVar176._24_4_;
            fVar249 = auVar176._28_4_;
            auVar341._28_4_ = fVar249 + fVar249;
            auVar186 = vsubps_avx(auVar186,auVar126);
            auVar284._0_4_ = fVar358 * fVar358 + auVar186._0_4_;
            auVar284._4_4_ = fVar316 * fVar316 + auVar186._4_4_;
            auVar284._8_4_ = fVar320 * fVar320 + auVar186._8_4_;
            auVar284._12_4_ = fVar324 * fVar324 + auVar186._12_4_;
            auVar284._16_4_ = fVar236 * fVar236 + auVar186._16_4_;
            auVar284._20_4_ = fVar238 * fVar238 + auVar186._20_4_;
            auVar284._24_4_ = fVar243 * fVar243 + auVar186._24_4_;
            auVar284._28_4_ = auVar182._28_4_ + auVar186._28_4_;
            auVar186 = ZEXT832(0) << 0x20;
            auVar134._4_4_ = auVar371._4_4_ * 0.0;
            auVar134._0_4_ = auVar371._0_4_ * 0.0;
            auVar134._8_4_ = auVar371._8_4_ * 0.0;
            auVar134._12_4_ = auVar371._12_4_ * 0.0;
            auVar134._16_4_ = auVar371._16_4_ * 0.0;
            auVar134._20_4_ = auVar371._20_4_ * 0.0;
            auVar134._24_4_ = auVar371._24_4_ * 0.0;
            auVar134._28_4_ = fVar249;
            auVar152 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar256,auVar134);
            auVar295._0_4_ = auVar256._0_4_ + auVar371._0_4_ * 0.0;
            auVar295._4_4_ = auVar256._4_4_ + auVar371._4_4_ * 0.0;
            auVar295._8_4_ = auVar256._8_4_ + auVar371._8_4_ * 0.0;
            auVar295._12_4_ = auVar256._12_4_ + auVar371._12_4_ * 0.0;
            auVar295._16_4_ = auVar256._16_4_ + auVar371._16_4_ * 0.0;
            auVar295._20_4_ = auVar256._20_4_ + auVar371._20_4_ * 0.0;
            auVar295._24_4_ = auVar256._24_4_ + auVar371._24_4_ * 0.0;
            auVar295._28_4_ = auVar256._28_4_ + fVar249;
            auVar157 = vfmadd213ps_fma(auVar256,auVar186,auVar371);
            auVar154 = vfmadd231ps_fma(auVar295,auVar158,auVar186);
            auVar155 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar186,auVar158);
            auVar189 = ZEXT832(0) << 0x20;
            auVar135._4_4_ = auVar309._4_4_ * 0.0;
            auVar135._0_4_ = auVar309._0_4_ * 0.0;
            auVar135._8_4_ = auVar309._8_4_ * 0.0;
            auVar135._12_4_ = auVar309._12_4_ * 0.0;
            auVar135._16_4_ = auVar309._16_4_ * 0.0;
            auVar135._20_4_ = auVar309._20_4_ * 0.0;
            auVar135._24_4_ = auVar309._24_4_ * 0.0;
            auVar135._28_4_ = fVar248;
            auVar157 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar175,auVar135);
            auVar365._0_4_ = auVar175._0_4_ + auVar309._0_4_ * 0.0;
            auVar365._4_4_ = auVar175._4_4_ + auVar309._4_4_ * 0.0;
            auVar365._8_4_ = auVar175._8_4_ + auVar309._8_4_ * 0.0;
            auVar365._12_4_ = auVar175._12_4_ + auVar309._12_4_ * 0.0;
            auVar365._16_4_ = auVar175._16_4_ + auVar309._16_4_ * 0.0;
            auVar365._20_4_ = auVar175._20_4_ + auVar309._20_4_ * 0.0;
            auVar365._24_4_ = auVar175._24_4_ + auVar309._24_4_ * 0.0;
            auVar365._28_4_ = auVar175._28_4_ + fVar248;
            auVar153 = vfmadd213ps_fma(auVar175,auVar189,auVar309);
            auVar186 = vaddps_avx512vl(auVar184,ZEXT1632(auVar157));
            auVar175 = vfmadd231ps_avx512vl(auVar365,auVar184,auVar189);
            auVar176 = vfmadd231ps_avx512vl(ZEXT1632(auVar153),auVar189,auVar184);
            auVar136._4_4_ = auVar284._4_4_ * 0.0;
            auVar136._0_4_ = auVar284._0_4_ * 0.0;
            auVar136._8_4_ = auVar284._8_4_ * 0.0;
            auVar136._12_4_ = auVar284._12_4_ * 0.0;
            auVar136._16_4_ = auVar284._16_4_ * 0.0;
            auVar136._20_4_ = auVar284._20_4_ * 0.0;
            auVar136._24_4_ = auVar284._24_4_ * 0.0;
            auVar136._28_4_ = fVar248;
            auVar157 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar341,auVar136);
            auVar181 = vaddps_avx512vl(auVar341,auVar136);
            auVar153 = vfmadd213ps_fma(auVar341,auVar189,auVar284);
            auVar182 = vaddps_avx512vl(auVar314,ZEXT1632(auVar157));
            auVar181 = vfmadd231ps_avx512vl(auVar181,auVar314,auVar189);
            auVar156 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar189,auVar314);
            auVar204 = ZEXT832(0) << 0x20;
            auVar178 = vaddps_avx512vl(auVar178,auVar204);
            auVar179 = vaddps_avx512vl(auVar179,auVar204);
            auVar184 = vaddps_avx512vl(auVar185,auVar204);
            auVar185 = vmulps_avx512vl(auVar182,auVar204);
            auVar189 = vmulps_avx512vl(auVar181,auVar204);
            auVar203 = vmulps_avx512vl(ZEXT1632(auVar156),auVar204);
            auVar157 = vfmadd213ps_fma(ZEXT432(0) << 0x20,auVar186,auVar185);
            auVar153 = vfmadd213ps_fma(ZEXT832(0) << 0x20,auVar175,auVar189);
            auVar204 = vfmadd213ps_avx512vl(auVar204,auVar176,auVar203);
            auVar185 = vfmadd231ps_avx512vl(auVar185,auVar183,auVar186);
            auVar189 = vfmadd231ps_avx512vl(auVar189,auVar183,auVar175);
            auVar183 = vfmadd213ps_avx512vl(auVar183,auVar176,auVar203);
            auVar203 = vmulps_avx512vl(auVar188,auVar182);
            auVar205 = vmulps_avx512vl(auVar188,auVar181);
            auVar188 = vmulps_avx512vl(auVar188,ZEXT1632(auVar156));
            auVar203 = vfmadd231ps_avx512vl(auVar203,auVar187,auVar186);
            auVar205 = vfmadd231ps_avx512vl(auVar205,auVar187,auVar175);
            auVar187 = vfmadd231ps_avx512vl(auVar188,auVar176,auVar187);
            auVar182 = vmulps_avx512vl(auVar208,auVar182);
            auVar181 = vmulps_avx512vl(auVar208,auVar181);
            auVar188 = vmulps_avx512vl(auVar208,ZEXT1632(auVar156));
            auVar186 = vfmadd231ps_avx512vl(auVar182,auVar207,auVar186);
            auVar175 = vfmadd231ps_avx512vl(auVar181,auVar207,auVar175);
            auVar176 = vfmadd231ps_avx512vl(auVar188,auVar207,auVar176);
            auVar277._0_4_ = auVar152._0_4_ + auVar158._0_4_;
            auVar277._4_4_ = auVar152._4_4_ + auVar158._4_4_;
            auVar277._8_4_ = auVar152._8_4_ + auVar158._8_4_;
            auVar277._12_4_ = auVar152._12_4_ + auVar158._12_4_;
            auVar277._16_4_ = auVar158._16_4_ + 0.0;
            auVar277._20_4_ = auVar158._20_4_ + 0.0;
            auVar277._24_4_ = auVar158._24_4_ + 0.0;
            auVar277._28_4_ = auVar158._28_4_ + 0.0;
            auVar158 = vfmadd231ps_avx512vl(ZEXT1632(auVar157),auVar177,auVar277);
            auVar181 = vfmadd231ps_avx512vl(ZEXT1632(auVar153),auVar177,ZEXT1632(auVar154));
            auVar177 = vfmadd231ps_avx512vl(auVar204,ZEXT1632(auVar155),auVar177);
            auVar182 = vfmadd231ps_avx512vl(auVar185,auVar180,auVar277);
            auVar185 = vfmadd231ps_avx512vl(auVar189,auVar180,ZEXT1632(auVar154));
            auVar183 = vfmadd231ps_avx512vl(auVar183,ZEXT1632(auVar155),auVar180);
            auVar188 = vfmadd231ps_avx512vl(auVar203,auVar159,auVar277);
            auVar189 = vfmadd231ps_avx512vl(auVar205,auVar159,ZEXT1632(auVar154));
            auVar159 = vfmadd231ps_avx512vl(auVar187,ZEXT1632(auVar155),auVar159);
            auVar186 = vfmadd231ps_avx512vl(auVar186,auVar200,auVar277);
            auVar180 = vaddps_avx512vl(auVar178,auVar186);
            auVar186 = vfmadd231ps_avx512vl(auVar175,auVar200,ZEXT1632(auVar154));
            auVar187 = vaddps_avx512vl(auVar179,auVar186);
            auVar186 = vfmadd231ps_avx512vl(auVar176,auVar200,ZEXT1632(auVar155));
            fVar249 = auVar184._0_4_ + auVar186._0_4_;
            fVar257 = auVar184._4_4_ + auVar186._4_4_;
            fVar258 = auVar184._8_4_ + auVar186._8_4_;
            fVar259 = auVar184._12_4_ + auVar186._12_4_;
            fVar260 = auVar184._16_4_ + auVar186._16_4_;
            fVar261 = auVar184._20_4_ + auVar186._20_4_;
            fVar262 = auVar184._24_4_ + auVar186._24_4_;
            auVar186 = vmulps_avx512vl(auVar189,auVar183);
            auVar186 = vfmsub231ps_avx512vl(auVar186,auVar185,auVar159);
            auVar175 = vmulps_avx512vl(auVar159,auVar182);
            auVar176 = vfmsub231ps_avx512vl(auVar175,auVar183,auVar188);
            auVar175 = vmulps_avx512vl(auVar188,auVar185);
            auVar184 = vfmsub231ps_avx512vl(auVar175,auVar182,auVar189);
            auVar175 = vmulps_avx512vl(auVar177,auVar188);
            auVar200 = vfmsub231ps_avx512vl(auVar175,auVar158,auVar159);
            auVar175 = vmulps_avx512vl(auVar181,auVar159);
            auVar175 = vfmsub231ps_avx512vl(auVar175,auVar189,auVar177);
            auVar178 = vmulps_avx512vl(auVar158,auVar189);
            auVar188 = vfmsub231ps_avx512vl(auVar178,auVar181,auVar188);
            auVar137._4_4_ = auVar185._4_4_ * auVar177._4_4_;
            auVar137._0_4_ = auVar185._0_4_ * auVar177._0_4_;
            auVar137._8_4_ = auVar185._8_4_ * auVar177._8_4_;
            auVar137._12_4_ = auVar185._12_4_ * auVar177._12_4_;
            auVar137._16_4_ = auVar185._16_4_ * auVar177._16_4_;
            auVar137._20_4_ = auVar185._20_4_ * auVar177._20_4_;
            auVar137._24_4_ = auVar185._24_4_ * auVar177._24_4_;
            auVar137._28_4_ = auVar179._28_4_;
            auVar189 = vfmsub231ps_avx512vl(auVar137,auVar181,auVar183);
            auVar178 = vmulps_avx512vl(auVar183,auVar158);
            auVar152 = vfmsub231ps_fma(auVar178,auVar177,auVar182);
            auVar178 = vmulps_avx512vl(auVar182,auVar181);
            auVar182 = vfmsub231ps_avx512vl(auVar178,auVar158,auVar185);
            auVar177 = vmulps_avx512vl(auVar177,auVar184);
            auVar177 = vfmadd231ps_avx512vl(auVar177,auVar176,auVar181);
            auVar181 = vfmadd231ps_avx512vl(auVar177,auVar186,auVar158);
            auVar158 = vdivps_avx512vl(auVar186,auVar181);
            auVar186 = vdivps_avx512vl(auVar175,auVar181);
            auVar175 = vdivps_avx512vl(auVar189,auVar181);
            auVar176 = vdivps_avx512vl(auVar176,auVar181);
            auVar177 = vdivps_avx512vl(auVar200,auVar181);
            auVar178 = vdivps_avx512vl(ZEXT1632(auVar152),auVar181);
            auVar179 = vdivps_avx512vl(auVar184,auVar181);
            auVar159 = vdivps_avx512vl(auVar188,auVar181);
            auVar181 = vdivps_avx512vl(auVar182,auVar181);
            auVar138._4_4_ = fVar257 * auVar179._4_4_;
            auVar138._0_4_ = fVar249 * auVar179._0_4_;
            auVar138._8_4_ = fVar258 * auVar179._8_4_;
            auVar138._12_4_ = fVar259 * auVar179._12_4_;
            auVar138._16_4_ = fVar260 * auVar179._16_4_;
            auVar138._20_4_ = fVar261 * auVar179._20_4_;
            auVar138._24_4_ = fVar262 * auVar179._24_4_;
            auVar138._28_4_ = auVar200._28_4_;
            auVar139._4_4_ = fVar257 * auVar159._4_4_;
            auVar139._0_4_ = fVar249 * auVar159._0_4_;
            auVar139._8_4_ = fVar258 * auVar159._8_4_;
            auVar139._12_4_ = fVar259 * auVar159._12_4_;
            auVar139._16_4_ = fVar260 * auVar159._16_4_;
            auVar139._20_4_ = fVar261 * auVar159._20_4_;
            auVar139._24_4_ = fVar262 * auVar159._24_4_;
            auVar139._28_4_ = auVar188._28_4_;
            auVar140._4_4_ = fVar257 * auVar181._4_4_;
            auVar140._0_4_ = fVar249 * auVar181._0_4_;
            auVar140._8_4_ = fVar258 * auVar181._8_4_;
            auVar140._12_4_ = fVar259 * auVar181._12_4_;
            auVar140._16_4_ = fVar260 * auVar181._16_4_;
            auVar140._20_4_ = fVar261 * auVar181._20_4_;
            auVar140._24_4_ = fVar262 * auVar181._24_4_;
            auVar140._28_4_ = auVar189._28_4_;
            auVar152 = vfmadd231ps_fma(auVar138,auVar187,auVar176);
            auVar153 = vfmadd231ps_fma(auVar139,auVar187,auVar177);
            auVar157 = vfmadd231ps_fma(auVar140,auVar178,auVar187);
          }
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar180,auVar158);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar180,auVar186);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar175,auVar180);
        }
        else {
          BVar2 = pGVar4->time_range;
          auVar250._8_8_ = 0;
          auVar250._0_4_ = BVar2.lower;
          auVar250._4_4_ = BVar2.upper;
          fVar249 = BVar2.lower;
          auVar268._4_4_ = fVar249;
          auVar268._0_4_ = fVar249;
          auVar268._8_4_ = fVar249;
          auVar268._12_4_ = fVar249;
          auVar268._16_4_ = fVar249;
          auVar268._20_4_ = fVar249;
          auVar268._24_4_ = fVar249;
          auVar268._28_4_ = fVar249;
          fVar249 = pGVar4->fnumTimeSegments;
          auVar158 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar268);
          auVar152 = vmovshdup_avx(auVar250);
          auVar285 = ZEXT1664(auVar152);
          auVar179 = ZEXT1632(auVar152);
          auVar152 = vsubps_avx(auVar152,auVar250);
          auVar251._0_4_ = auVar152._0_4_;
          auVar251._4_4_ = auVar251._0_4_;
          auVar251._8_4_ = auVar251._0_4_;
          auVar251._12_4_ = auVar251._0_4_;
          auVar251._16_4_ = auVar251._0_4_;
          auVar251._20_4_ = auVar251._0_4_;
          auVar251._24_4_ = auVar251._0_4_;
          auVar251._28_4_ = auVar251._0_4_;
          auVar158 = vdivps_avx(auVar158,auVar251);
          auVar55._4_4_ = fVar249 * auVar158._4_4_;
          auVar55._0_4_ = fVar249 * auVar158._0_4_;
          auVar55._8_4_ = fVar249 * auVar158._8_4_;
          auVar55._12_4_ = fVar249 * auVar158._12_4_;
          auVar55._16_4_ = fVar249 * auVar158._16_4_;
          auVar55._20_4_ = fVar249 * auVar158._20_4_;
          auVar55._24_4_ = fVar249 * auVar158._24_4_;
          auVar55._28_4_ = auVar158._28_4_;
          auVar158 = vroundps_avx(auVar55,1);
          fVar249 = fVar249 + -1.0;
          auVar273._4_4_ = fVar249;
          auVar273._0_4_ = fVar249;
          auVar273._8_4_ = fVar249;
          auVar273._12_4_ = fVar249;
          auVar273._16_4_ = fVar249;
          auVar273._20_4_ = fVar249;
          auVar273._24_4_ = fVar249;
          auVar273._28_4_ = fVar249;
          auVar158 = vminps_avx(auVar158,auVar273);
          auVar143 = ZEXT412(0);
          auVar278 = ZEXT1264(auVar143) << 0x20;
          auVar178 = ZEXT1232(auVar143) << 0x20;
          auVar158 = vmaxps_avx(auVar158,ZEXT1232(auVar143) << 0x20);
          auVar186 = vsubps_avx(auVar55,auVar158);
          auVar158 = vcvtps2dq_avx512vl(auVar158);
          local_140 = vmovdqa64_avx512vl(auVar158);
          uVar151 = 0;
          for (uVar232 = (uint)bVar144; (uVar232 & 1) == 0; uVar232 = uVar232 >> 1 | 0x80000000) {
            uVar151 = uVar151 + 1;
          }
          auVar159 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpeqd_avx512vl(auVar158,auVar159);
          if ((byte)(~bVar144 | (byte)uVar16) == 0xff) {
            plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                             (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
            iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                            (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
            if (iVar3 == 0x9134) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28);
              auVar159 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28);
              auVar178 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28);
              auVar179 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28);
              auVar175 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0x9234) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar279._8_8_ = 0;
              auVar279._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
              auVar296._8_8_ = 0;
              auVar296._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                            auVar279);
              auVar159 = ZEXT1632(auVar152);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),_DAT_01fefe80,
                                            auVar296);
              auVar178 = ZEXT1632(auVar152);
              auVar297._8_8_ = 0;
              auVar297._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),_DAT_01fefe80
                                            ,auVar297);
              auVar179 = ZEXT1632(auVar152);
              auVar298._8_8_ = 0;
              auVar298._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
              auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),_DAT_01fefe80
                                            ,auVar298);
              auVar175 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0xb001) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar264._8_8_ = 0;
              auVar264._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
              auVar152 = vinsertps_avx(auVar264,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
              auVar265._8_8_ = 0;
              auVar265._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
              auVar153 = vpermt2ps_avx512vl(auVar265,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + lVar147)));
              auVar303._8_8_ = 0;
              auVar303._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
              fVar249 = *(float *)(lVar6 + 0x24 + lVar147);
              fVar257 = *(float *)(lVar6 + 0x28 + lVar147);
              fVar258 = *(float *)(lVar6 + 0x2c + lVar147);
              auVar154 = vpermt2ps_avx512vl(auVar303,_DAT_01fefe90,
                                            ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
              fVar259 = *(float *)(lVar6 + 0x30 + lVar147);
              auVar157 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar257)),ZEXT416((uint)fVar249),
                                         ZEXT416((uint)fVar249));
              auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar258),ZEXT416((uint)fVar258));
              auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar259),ZEXT416((uint)fVar259));
              auVar155 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar157._0_4_));
              fVar260 = auVar155._0_4_;
              fVar260 = fVar260 * 1.5 + fVar260 * fVar260 * fVar260 * auVar157._0_4_ * -0.5;
              auVar157 = vinsertps_avx(auVar154,ZEXT416((uint)(fVar249 * fVar260)),0x30);
              auVar175 = ZEXT1632(auVar157);
              auVar157 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar257 * fVar260)),0x30);
              auVar159 = ZEXT1632(auVar157);
              auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar259 * fVar260)),0x30);
              auVar179 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
              auVar152 = vinsertps_avx(auVar152,ZEXT416((uint)(fVar258 * fVar260)),0x30);
              auVar178 = ZEXT1632(auVar152);
            }
            else if (iVar3 == 0x9244) {
              lVar6 = *plVar1;
              lVar147 = plVar1[2] * uVar146;
              auVar159 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar147));
              auVar178 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
              auVar179 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
              auVar175 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
            }
            auVar367._8_4_ = 1;
            auVar367._0_8_ = 0x100000001;
            auVar367._12_4_ = 1;
            auVar367._16_4_ = 1;
            auVar367._20_4_ = 1;
            auVar367._24_4_ = 1;
            auVar367._28_4_ = 1;
            auVar158 = vbroadcastss_avx512vl(ZEXT416(2));
            iVar3 = (int)plVar1[0xb];
            if (iVar3 == 0x9134) {
              lVar6 = plVar1[7];
              lVar147 = uVar146 * plVar1[9];
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
              auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),0x28);
              auVar176 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),0x28)
              ;
              auVar177 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),0x28)
              ;
              auVar182 = ZEXT1632(auVar152);
              auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
              auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),0x28)
              ;
              auVar180 = ZEXT1632(auVar152);
            }
            else {
              auVar161._16_16_ = auVar158._16_16_;
              if (iVar3 == 0x9234) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar286._8_8_ = 0;
                auVar286._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                auVar304._8_8_ = 0;
                auVar304._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                              auVar286);
                auVar176 = ZEXT1632(auVar152);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                              _DAT_01fefe80,auVar304);
                auVar177 = ZEXT1632(auVar152);
                auVar287._8_8_ = 0;
                auVar287._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                              _DAT_01fefe80,auVar287);
                auVar182 = ZEXT1632(auVar152);
                auVar288._8_8_ = 0;
                auVar288._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                              _DAT_01fefe80,auVar288);
                auVar180 = ZEXT1632(auVar152);
              }
              else if (iVar3 == 0xb001) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar289._8_8_ = 0;
                auVar289._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                auVar152 = vinsertps_avx(auVar289,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20);
                auVar299._8_8_ = 0;
                auVar299._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                auVar153 = vpermt2ps_avx512vl(auVar299,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + lVar147)));
                auVar330._8_8_ = 0;
                auVar330._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                fVar249 = *(float *)(lVar6 + 0x24 + lVar147);
                fVar257 = *(float *)(lVar6 + 0x28 + lVar147);
                fVar258 = *(float *)(lVar6 + 0x2c + lVar147);
                auVar154 = vpermt2ps_avx512vl(auVar330,_DAT_01fefe90,
                                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                fVar259 = *(float *)(lVar6 + 0x30 + lVar147);
                auVar157 = vfmadd231ss_fma(ZEXT416((uint)(fVar257 * fVar257)),ZEXT416((uint)fVar249)
                                           ,ZEXT416((uint)fVar249));
                auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar258),ZEXT416((uint)fVar258));
                auVar157 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar259),ZEXT416((uint)fVar259));
                auVar161._0_16_ = ZEXT816(0) << 0x40;
                auVar160._4_28_ = auVar161._4_28_;
                auVar160._0_4_ = auVar157._0_4_;
                auVar155 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar160._0_16_);
                auVar156 = vmulss_avx512f(auVar155,ZEXT416(0x3fc00000));
                fVar260 = auVar155._0_4_;
                auVar157 = vaddss_avx512f(auVar156,ZEXT416((uint)(fVar260 * fVar260 *
                                                                 fVar260 * auVar157._0_4_ * -0.5)));
                fVar260 = auVar157._0_4_;
                auVar157 = vinsertps_avx512f(auVar154,ZEXT416((uint)(fVar249 * fVar260)),0x30);
                auVar180 = ZEXT1632(auVar157);
                auVar157 = vinsertps_avx(auVar153,ZEXT416((uint)(fVar257 * fVar260)),0x30);
                auVar176 = ZEXT1632(auVar157);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416((uint)(fVar259 * fVar260)),0x30);
                auVar182 = ZEXT1632(auVar152);
                auVar152 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                         ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                auVar152 = vinsertps_avx(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),0x20);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416((uint)(fVar258 * fVar260)),0x30);
                auVar177 = ZEXT1632(auVar152);
              }
              else if (iVar3 == 0x9244) {
                lVar6 = plVar1[7];
                lVar147 = uVar146 * plVar1[9];
                auVar176 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + lVar147));
                auVar177 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
                auVar182 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
                auVar180 = ZEXT1632(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
              }
            }
            uVar263 = auVar159._0_4_;
            auVar194._4_4_ = uVar263;
            auVar194._0_4_ = uVar263;
            auVar194._8_4_ = uVar263;
            auVar194._12_4_ = uVar263;
            auVar194._16_4_ = uVar263;
            auVar194._20_4_ = uVar263;
            auVar194._24_4_ = uVar263;
            auVar194._28_4_ = uVar263;
            auVar195 = vpermps_avx2(auVar367,auVar159);
            auVar162 = vpermps_avx512vl(auVar158,auVar159);
            uVar263 = auVar178._0_4_;
            auVar196._4_4_ = uVar263;
            auVar196._0_4_ = uVar263;
            auVar196._8_4_ = uVar263;
            auVar196._12_4_ = uVar263;
            auVar196._16_4_ = uVar263;
            auVar196._20_4_ = uVar263;
            auVar196._24_4_ = uVar263;
            auVar196._28_4_ = uVar263;
            auVar197 = vpermps_avx2(auVar367,auVar178);
            auVar163 = vpermps_avx512vl(auVar158,auVar178);
            uVar263 = auVar179._0_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(uVar263,CONCAT424(uVar263,CONCAT420(uVar263,CONCAT416(
                                                  uVar263,CONCAT412(uVar263,CONCAT48(uVar263,
                                                  CONCAT44(uVar263,uVar263))))))));
            auVar198 = vpermps_avx2(auVar367,auVar179);
            auVar164 = vpermps_avx512vl(auVar158,auVar179);
            uVar263 = auVar175._0_4_;
            auVar285 = ZEXT3264(CONCAT428(uVar263,CONCAT424(uVar263,CONCAT420(uVar263,CONCAT416(
                                                  uVar263,CONCAT412(uVar263,CONCAT48(uVar263,
                                                  CONCAT44(uVar263,uVar263))))))));
            auVar199 = vpermps_avx2(auVar367,auVar175);
            auVar165 = vpermps_avx512vl(auVar158,auVar175);
            auVar166 = vbroadcastss_avx512vl(auVar176._0_16_);
            auVar167 = vpermps_avx512vl(auVar367,auVar176);
            auVar168 = vpermps_avx512vl(auVar158,auVar176);
            auVar169 = vbroadcastss_avx512vl(auVar177._0_16_);
            auVar170 = vpermps_avx512vl(auVar367,auVar177);
            auVar171 = vpermps_avx512vl(auVar158,auVar177);
            auVar172 = vbroadcastss_avx512vl(auVar182._0_16_);
            auVar173 = vpermps_avx512vl(auVar367,auVar182);
            auVar174 = vpermps_avx512vl(auVar158,auVar182);
            auVar175 = vbroadcastss_avx512vl(auVar180._0_16_);
            in_ZMM15 = ZEXT3264(auVar175);
            auVar175 = vpermps_avx512vl(auVar367,auVar180);
            in_ZMM14 = ZEXT3264(auVar175);
            auVar158 = vpermps_avx512vl(auVar158,auVar180);
            in_ZMM13 = ZEXT3264(auVar158);
          }
          else {
            auVar175 = vbroadcastss_avx512vl(ZEXT416(2));
            auVar387 = ZEXT3264(auVar175);
            uVar149 = uVar145 & 0xffffffff;
            local_2c0 = auVar180;
            local_2a0 = auVar180;
            _local_280 = auVar180;
            local_260 = auVar180;
            _local_240 = auVar180;
            do {
              uVar151 = 0;
              for (uVar232 = (uint)uVar149 & 0xff; (uVar232 & 1) == 0;
                  uVar232 = uVar232 >> 1 | 0x80000000) {
                uVar151 = uVar151 + 1;
              }
              plVar1 = (long *)(*(long *)&pGVar4[1].fnumTimeSegments +
                               (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
              iVar3 = *(int *)(*(long *)&pGVar4[1].fnumTimeSegments + 0x20 +
                              (long)*(int *)(local_140 + (ulong)uVar151 * 4) * 0x38);
              if (iVar3 == 0x9134) {
                lVar6 = *plVar1;
                lVar147 = plVar1[2] * uVar146;
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
                auVar157 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),
                                             0x28);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
                auVar153 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                             0x28);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
                auVar154 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),
                                             0x28);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),
                                             0x28);
LAB_008f5069:
                local_260 = ZEXT1632(auVar157);
                _local_280 = ZEXT1632(auVar153);
                local_2a0 = ZEXT1632(auVar154);
                _local_240 = ZEXT1632(auVar152);
              }
              else {
                auVar191._16_16_ = in_ZMM30._16_16_;
                if (iVar3 == 0x9234) {
                  lVar6 = *plVar1;
                  lVar147 = plVar1[2] * uVar146;
                  auVar384._8_8_ = 0;
                  auVar384._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                  auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                                auVar384);
                  local_260 = ZEXT1632(auVar152);
                  auVar377._8_8_ = 0;
                  auVar377._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                  auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                                _DAT_01fefe80,auVar377);
                  _local_280 = ZEXT1632(auVar152);
                  auVar374._8_8_ = 0;
                  auVar374._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                  auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                                _DAT_01fefe80,auVar374);
                  local_2a0 = ZEXT1632(auVar152);
                  auVar375._8_8_ = 0;
                  auVar375._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                  auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                                _DAT_01fefe80,auVar375);
                  _local_240 = ZEXT1632(auVar152);
                }
                else if (iVar3 == 0xb001) {
                  lVar6 = *plVar1;
                  lVar147 = plVar1[2] * uVar146;
                  auVar378._8_8_ = 0;
                  auVar378._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                  auVar152 = vinsertps_avx512f(auVar378,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20
                                              );
                  auVar381._8_8_ = 0;
                  auVar381._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                  auVar153 = vpermt2ps_avx512vl(auVar381,_DAT_01fefe90,
                                                ZEXT416(*(uint *)(lVar6 + lVar147)));
                  auVar385._8_8_ = 0;
                  auVar385._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                  auVar157 = vpermt2ps_avx512vl(auVar385,_DAT_01fefe90,
                                                ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                  uVar151 = *(uint *)(lVar6 + 0x24 + lVar147);
                  uVar232 = *(uint *)(lVar6 + 0x28 + lVar147);
                  uVar233 = *(uint *)(lVar6 + 0x2c + lVar147);
                  uVar234 = *(uint *)(lVar6 + 0x30 + lVar147);
                  auVar154 = vmulss_avx512f(ZEXT416(uVar232),ZEXT416(uVar232));
                  auVar154 = vfmadd231ss_avx512f(auVar154,ZEXT416(uVar151),ZEXT416(uVar151));
                  auVar154 = vfmadd231ss_avx512f(auVar154,ZEXT416(uVar233),ZEXT416(uVar233));
                  auVar155 = ZEXT416(uVar234);
                  auVar154 = vfmadd231ss_avx512f(auVar154,auVar155,auVar155);
                  auVar191._0_16_ = vxorps_avx512vl(auVar155,auVar155);
                  auVar190._4_28_ = auVar191._4_28_;
                  auVar190._0_4_ = auVar154._0_4_;
                  auVar155 = vrsqrt14ss_avx512f(auVar191._0_16_,auVar190._0_16_);
                  auVar156 = vmulss_avx512f(auVar155,ZEXT416(0x3fc00000));
                  auVar154 = vmulss_avx512f(auVar154,ZEXT416(0xbf000000));
                  auVar154 = vmulss_avx512f(auVar155,auVar154);
                  auVar155 = vmulss_avx512f(auVar155,auVar155);
                  auVar154 = vmulss_avx512f(auVar155,auVar154);
                  auVar175 = vbroadcastss_avx512vl(ZEXT416(2));
                  auVar387 = ZEXT3264(auVar175);
                  auVar154 = vaddss_avx512f(auVar156,auVar154);
                  auVar155 = vmulss_avx512f(ZEXT416(uVar151),auVar154);
                  auVar157 = vinsertps_avx512f(auVar157,auVar155,0x30);
                  _local_240 = ZEXT1632(auVar157);
                  auVar157 = vmulss_avx512f(auVar154,ZEXT416(uVar232));
                  auVar157 = vinsertps_avx512f(auVar153,auVar157,0x30);
                  local_260 = ZEXT1632(auVar157);
                  auVar157 = vmulss_avx512f(auVar154,ZEXT416(uVar233));
                  auVar153 = vmulss_avx512f(auVar154,ZEXT416(uVar234));
                  auVar152 = vinsertps_avx512f(auVar152,auVar153,0x30);
                  local_2a0 = ZEXT1632(auVar152);
                  auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                               ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                  auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),
                                               0x20);
                  auVar152 = vinsertps_avx512f(auVar152,auVar157,0x30);
                  _local_280 = ZEXT1632(auVar152);
                }
                else if (iVar3 == 0x9244) {
                  lVar6 = *plVar1;
                  lVar147 = plVar1[2] * uVar146;
                  auVar157 = *(undefined1 (*) [16])(lVar6 + lVar147);
                  auVar153 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar147);
                  auVar154 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar147);
                  auVar152 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar147);
                  goto LAB_008f5069;
                }
              }
              auVar175 = vpbroadcastd_avx512vl();
              uVar16 = vpcmpeqd_avx512vl(auVar175,auVar158);
              iVar3 = (int)plVar1[0xb];
              if (iVar3 == 0x9134) {
                lVar6 = plVar1[7];
                lVar147 = plVar1[9] * uVar146;
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x10 + lVar147)),0x1c);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar147)),
                                             0x28);
                in_ZMM28 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x14 + lVar147)),0x1c);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                             0x28);
                in_ZMM27 = ZEXT1664(auVar152);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),0x1c);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar147)),
                                             0x28);
                local_2c0 = ZEXT1632(auVar152);
                auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                             ZEXT416(*(uint *)(lVar6 + 0x1c + lVar147)),0x1c);
                auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar147)),
                                             0x28);
                in_ZMM30 = ZEXT1664(auVar152);
              }
              else {
                auVar193._16_16_ = auVar175._16_16_;
                if (iVar3 == 0x9234) {
                  lVar6 = plVar1[7];
                  lVar147 = plVar1[9] * uVar146;
                  local_2c0._8_8_ = 0;
                  local_2c0._0_8_ = *(ulong *)(lVar6 + 4 + lVar147);
                  auVar152 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + lVar147)),_DAT_01fefe80,
                                                local_2c0._0_16_);
                  auVar382._8_8_ = 0;
                  auVar382._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                  auVar157 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                                _DAT_01fefe80,auVar382);
                  in_ZMM27 = ZEXT1664(auVar157);
                  auVar379._8_8_ = 0;
                  auVar379._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                  auVar157 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)),
                                                _DAT_01fefe80,auVar379);
                  local_2c0 = ZEXT1632(auVar157);
                  auVar380._8_8_ = 0;
                  auVar380._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar147);
                  auVar157 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar147)),
                                                _DAT_01fefe80,auVar380);
                  in_ZMM30 = ZEXT1664(auVar157);
                  in_ZMM28 = ZEXT1664(auVar152);
                }
                else if (iVar3 == 0xb001) {
                  lVar6 = plVar1[7];
                  lVar147 = plVar1[9] * uVar146;
                  auVar376._8_8_ = 0;
                  auVar376._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar147);
                  auVar152 = vinsertps_avx512f(auVar376,ZEXT416(*(uint *)(lVar6 + 8 + lVar147)),0x20
                                              );
                  auVar383._8_8_ = 0;
                  auVar383._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar147);
                  auVar153 = vpermt2ps_avx512vl(auVar383,_DAT_01fefe90,
                                                ZEXT416(*(uint *)(lVar6 + lVar147)));
                  auVar386._8_8_ = 0;
                  auVar386._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar147);
                  auVar157 = vpermt2ps_avx512vl(auVar386,_DAT_01fefe90,
                                                ZEXT416(*(uint *)(lVar6 + 0x18 + lVar147)));
                  uVar151 = *(uint *)(lVar6 + 0x24 + lVar147);
                  uVar232 = *(uint *)(lVar6 + 0x28 + lVar147);
                  uVar233 = *(uint *)(lVar6 + 0x2c + lVar147);
                  uVar234 = *(uint *)(lVar6 + 0x30 + lVar147);
                  auVar154 = vmulss_avx512f(ZEXT416(uVar232),ZEXT416(uVar232));
                  auVar154 = vfmadd231ss_avx512f(auVar154,ZEXT416(uVar151),ZEXT416(uVar151));
                  auVar154 = vfmadd231ss_avx512f(auVar154,ZEXT416(uVar233),ZEXT416(uVar233));
                  auVar155 = ZEXT416(uVar234);
                  auVar154 = vfmadd231ss_avx512f(auVar154,auVar155,auVar155);
                  auVar193._0_16_ = vxorps_avx512vl(auVar155,auVar155);
                  auVar192._4_28_ = auVar193._4_28_;
                  auVar192._0_4_ = auVar154._0_4_;
                  auVar155 = vrsqrt14ss_avx512f(auVar193._0_16_,auVar192._0_16_);
                  auVar156 = vmulss_avx512f(auVar155,ZEXT416(0x3fc00000));
                  auVar154 = vmulss_avx512f(auVar154,ZEXT416(0xbf000000));
                  auVar154 = vmulss_avx512f(auVar155,auVar154);
                  auVar155 = vmulss_avx512f(auVar155,auVar155);
                  auVar154 = vmulss_avx512f(auVar155,auVar154);
                  auVar154 = vaddss_avx512f(auVar156,auVar154);
                  auVar155 = vmulss_avx512f(ZEXT416(uVar151),auVar154);
                  auVar157 = vinsertps_avx512f(auVar157,auVar155,0x30);
                  in_ZMM30 = ZEXT1664(auVar157);
                  auVar175 = vbroadcastss_avx512vl(ZEXT416(2));
                  auVar387 = ZEXT3264(auVar175);
                  auVar157 = vmulss_avx512f(auVar154,ZEXT416(uVar232));
                  auVar157 = vinsertps_avx512f(auVar153,auVar157,0x30);
                  in_ZMM28 = ZEXT1664(auVar157);
                  auVar157 = vmulss_avx512f(auVar154,ZEXT416(uVar233));
                  auVar153 = vmulss_avx512f(auVar154,ZEXT416(uVar234));
                  auVar152 = vinsertps_avx512f(auVar152,auVar153,0x30);
                  local_2c0 = ZEXT1632(auVar152);
                  auVar152 = vinsertps_avx512f(ZEXT416(*(uint *)(lVar6 + 0xc + lVar147)),
                                               ZEXT416(*(uint *)(lVar6 + 4 + lVar147)),0x10);
                  auVar152 = vinsertps_avx512f(auVar152,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar147)),
                                               0x20);
                  auVar152 = vinsertps_avx512f(auVar152,auVar157,0x30);
                  in_ZMM27 = ZEXT1664(auVar152);
                }
                else {
                  in_ZMM28 = ZEXT3264(in_ZMM28._0_32_);
                  in_ZMM27 = ZEXT3264(in_ZMM27._0_32_);
                  in_ZMM30 = ZEXT3264(in_ZMM30._0_32_);
                  if (iVar3 == 0x9244) {
                    lVar6 = plVar1[7];
                    lVar147 = plVar1[9] * uVar146;
                    in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + lVar147));
                    in_ZMM27 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x10 + lVar147));
                    auVar152 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(lVar6 + 0x20 + lVar147));
                    local_2c0 = vmovdqa64_avx512vl(ZEXT1632(auVar152));
                    in_ZMM30 = ZEXT1664(*(undefined1 (*) [16])(lVar6 + 0x30 + lVar147));
                  }
                }
              }
              bVar148 = (byte)uVar149 & (byte)uVar16;
              bVar144 = ~bVar148 & (byte)uVar149;
              uVar149 = (ulong)bVar144;
              auVar175 = vbroadcastss_avx512vl(local_260._0_16_);
              auVar194._0_4_ =
                   (uint)(bVar148 & 1) * auVar175._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM12._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar194._4_4_ = (uint)bVar7 * auVar175._4_4_ | (uint)!bVar7 * in_ZMM12._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar194._8_4_ = (uint)bVar7 * auVar175._8_4_ | (uint)!bVar7 * in_ZMM12._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar194._12_4_ = (uint)bVar7 * auVar175._12_4_ | (uint)!bVar7 * in_ZMM12._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar194._16_4_ = (uint)bVar7 * auVar175._16_4_ | (uint)!bVar7 * in_ZMM12._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar194._20_4_ = (uint)bVar7 * auVar175._20_4_ | (uint)!bVar7 * in_ZMM12._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar194._24_4_ = (uint)bVar7 * auVar175._24_4_ | (uint)!bVar7 * in_ZMM12._24_4_;
              auVar194._28_4_ =
                   (uint)(bVar148 >> 7) * auVar175._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM12._28_4_;
              in_ZMM12 = ZEXT3264(auVar194);
              auVar175 = vbroadcastss_avx512vl(ZEXT416(1));
              auVar176 = vpermps_avx512vl(auVar175,local_260);
              auVar195._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM11._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar195._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM11._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar195._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM11._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar195._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM11._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar195._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM11._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar195._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM11._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar195._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM11._24_4_;
              auVar195._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM11._28_4_;
              in_ZMM11 = ZEXT3264(auVar195);
              auVar177 = auVar387._0_32_;
              auVar176 = vpermps_avx512vl(auVar177,local_260);
              auVar162._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM10._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar162._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM10._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar162._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM10._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar162._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM10._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar162._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM10._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar162._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM10._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar162._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM10._24_4_;
              auVar162._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM10._28_4_;
              in_ZMM10 = ZEXT3264(auVar162);
              auVar176 = vbroadcastss_avx512vl(local_280._0_16_);
              auVar196._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar148 & 1) * in_ZMM9._0_4_
              ;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar196._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM9._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar196._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM9._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar196._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM9._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar196._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM9._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar196._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM9._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar196._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM9._24_4_;
              auVar196._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM9._28_4_;
              in_ZMM9 = ZEXT3264(auVar196);
              auVar176 = vpermps_avx512vl(auVar175,_local_280);
              auVar197._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar148 & 1) * in_ZMM8._0_4_
              ;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar197._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM8._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar197._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM8._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar197._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM8._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar197._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM8._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar197._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM8._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar197._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM8._24_4_;
              auVar197._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM8._28_4_;
              in_ZMM8 = ZEXT3264(auVar197);
              auVar176 = vpermps_avx512vl(auVar177,_local_280);
              auVar163._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar148 & 1) * in_ZMM7._0_4_
              ;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar163._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM7._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar163._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM7._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar163._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM7._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar163._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM7._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar163._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM7._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar163._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM7._24_4_;
              auVar163._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM7._28_4_;
              in_ZMM7 = ZEXT3264(auVar163);
              auVar176 = vbroadcastss_avx512vl(local_2a0._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              in_ZMM6 = ZEXT3264(CONCAT428((uint)(bVar148 >> 7) * auVar176._28_4_ |
                                           (uint)!(bool)(bVar148 >> 7) * in_ZMM6._28_4_,
                                           CONCAT424((uint)bVar12 * auVar176._24_4_ |
                                                     (uint)!bVar12 * in_ZMM6._24_4_,
                                                     CONCAT420((uint)bVar11 * auVar176._20_4_ |
                                                               (uint)!bVar11 * in_ZMM6._20_4_,
                                                               CONCAT416((uint)bVar10 *
                                                                         auVar176._16_4_ |
                                                                         (uint)!bVar10 *
                                                                         in_ZMM6._16_4_,
                                                                         CONCAT412((uint)bVar9 *
                                                                                   auVar176._12_4_ |
                                                                                   (uint)!bVar9 *
                                                                                   in_ZMM6._12_4_,
                                                                                   CONCAT48((uint)
                                                  bVar8 * auVar176._8_4_ |
                                                  (uint)!bVar8 * in_ZMM6._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar176._4_4_ |
                                                           (uint)!bVar7 * in_ZMM6._4_4_,
                                                           (uint)(bVar148 & 1) * auVar176._0_4_ |
                                                           (uint)!(bool)(bVar148 & 1) *
                                                           in_ZMM6._0_4_))))))));
              auVar176 = vpermps_avx512vl(auVar175,local_2a0);
              auVar198._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar148 & 1) * in_ZMM5._0_4_
              ;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar198._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM5._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar198._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM5._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar198._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM5._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar198._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM5._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar198._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM5._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar198._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM5._24_4_;
              auVar198._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM5._28_4_;
              in_ZMM5 = ZEXT3264(auVar198);
              auVar176 = vpermps_avx512vl(auVar177,local_2a0);
              auVar164._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ | (uint)!(bool)(bVar148 & 1) * in_ZMM4._0_4_
              ;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar164._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM4._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar164._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM4._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar164._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM4._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar164._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM4._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar164._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM4._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar164._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM4._24_4_;
              auVar164._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM4._28_4_;
              in_ZMM4 = ZEXT3264(auVar164);
              auVar176 = vbroadcastss_avx512vl(local_240._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              auVar285 = ZEXT3264(CONCAT428((uint)(bVar148 >> 7) * auVar176._28_4_ |
                                            (uint)!(bool)(bVar148 >> 7) * auVar285._28_4_,
                                            CONCAT424((uint)bVar12 * auVar176._24_4_ |
                                                      (uint)!bVar12 * auVar285._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar176._20_4_ |
                                                                (uint)!bVar11 * auVar285._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar176._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          auVar285._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar176._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      auVar285.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar176._8_4_ |
                                                                  (uint)!bVar8 * auVar285._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar176._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           auVar285._4_4_,
                                                                           (uint)(bVar148 & 1) *
                                                                           auVar176._0_4_ |
                                                                           (uint)!(bool)(bVar148 & 1
                                                                                        ) *
                                                                           auVar285._0_4_))))))));
              auVar176 = vpermps_avx512vl(auVar175,_local_240);
              auVar199._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * auVar278._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar199._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * auVar278._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar199._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * auVar278._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar199._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * auVar278._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar199._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * auVar278._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar199._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * auVar278._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar199._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * auVar278._24_4_;
              auVar199._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * auVar278._28_4_;
              auVar278 = ZEXT3264(auVar199);
              auVar176 = vpermps_avx512vl(auVar177,_local_240);
              auVar165._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * auVar159._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar165._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * auVar159._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar165._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * auVar159._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar165._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * auVar159._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar165._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * auVar159._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar165._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * auVar159._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar165._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * auVar159._24_4_;
              auVar165._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * auVar159._28_4_;
              auVar176 = vbroadcastss_avx512vl(in_ZMM28._0_16_);
              auVar166._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM24._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar166._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM24._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar166._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM24._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar166._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM24._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar166._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM24._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar166._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM24._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar166._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM24._24_4_;
              auVar166._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM24._28_4_;
              in_ZMM24 = ZEXT3264(auVar166);
              auVar176 = vpermps_avx512vl(auVar175,in_ZMM28._0_32_);
              auVar167._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM23._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar167._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM23._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar167._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM23._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar167._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM23._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar167._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM23._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar167._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM23._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar167._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM23._24_4_;
              auVar167._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM23._28_4_;
              in_ZMM23 = ZEXT3264(auVar167);
              auVar176 = vpermps_avx512vl(auVar177,in_ZMM28._0_32_);
              auVar168._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM22._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar168._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM22._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar168._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM22._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar168._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM22._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar168._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM22._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar168._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM22._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar168._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM22._24_4_;
              auVar168._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM22._28_4_;
              in_ZMM22 = ZEXT3264(auVar168);
              auVar176 = vbroadcastss_avx512vl(in_ZMM27._0_16_);
              auVar169._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM21._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar169._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM21._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar169._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM21._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar169._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM21._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar169._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM21._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar169._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM21._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar169._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM21._24_4_;
              auVar169._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM21._28_4_;
              in_ZMM21 = ZEXT3264(auVar169);
              auVar176 = vpermps_avx512vl(auVar175,in_ZMM27._0_32_);
              auVar170._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM20._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar170._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM20._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar170._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM20._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar170._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM20._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar170._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM20._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar170._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM20._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar170._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM20._24_4_;
              auVar170._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM20._28_4_;
              in_ZMM20 = ZEXT3264(auVar170);
              auVar176 = vpermps_avx512vl(auVar177,in_ZMM27._0_32_);
              auVar171._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM19._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar171._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM19._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar171._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM19._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar171._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM19._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar171._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM19._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar171._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM19._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar171._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM19._24_4_;
              auVar171._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM19._28_4_;
              in_ZMM19 = ZEXT3264(auVar171);
              auVar176 = vbroadcastss_avx512vl(local_2c0._0_16_);
              auVar172._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM18._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar172._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM18._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar172._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM18._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar172._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM18._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar172._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM18._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar172._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM18._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar172._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM18._24_4_;
              auVar172._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM18._28_4_;
              in_ZMM18 = ZEXT3264(auVar172);
              auVar176 = vpermps_avx512vl(auVar175,local_2c0);
              auVar173._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM17._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar173._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM17._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar173._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM17._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar173._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM17._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar173._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM17._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar173._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM17._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar173._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM17._24_4_;
              auVar173._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM17._28_4_;
              in_ZMM17 = ZEXT3264(auVar173);
              auVar176 = vpermps_avx512vl(auVar177,local_2c0);
              auVar174._0_4_ =
                   (uint)(bVar148 & 1) * auVar176._0_4_ |
                   (uint)!(bool)(bVar148 & 1) * in_ZMM16._0_4_;
              bVar7 = (bool)(bVar148 >> 1 & 1);
              auVar174._4_4_ = (uint)bVar7 * auVar176._4_4_ | (uint)!bVar7 * in_ZMM16._4_4_;
              bVar7 = (bool)(bVar148 >> 2 & 1);
              auVar174._8_4_ = (uint)bVar7 * auVar176._8_4_ | (uint)!bVar7 * in_ZMM16._8_4_;
              bVar7 = (bool)(bVar148 >> 3 & 1);
              auVar174._12_4_ = (uint)bVar7 * auVar176._12_4_ | (uint)!bVar7 * in_ZMM16._12_4_;
              bVar7 = (bool)(bVar148 >> 4 & 1);
              auVar174._16_4_ = (uint)bVar7 * auVar176._16_4_ | (uint)!bVar7 * in_ZMM16._16_4_;
              bVar7 = (bool)(bVar148 >> 5 & 1);
              auVar174._20_4_ = (uint)bVar7 * auVar176._20_4_ | (uint)!bVar7 * in_ZMM16._20_4_;
              bVar7 = (bool)(bVar148 >> 6 & 1);
              auVar174._24_4_ = (uint)bVar7 * auVar176._24_4_ | (uint)!bVar7 * in_ZMM16._24_4_;
              auVar174._28_4_ =
                   (uint)(bVar148 >> 7) * auVar176._28_4_ |
                   (uint)!(bool)(bVar148 >> 7) * in_ZMM16._28_4_;
              in_ZMM16 = ZEXT3264(auVar174);
              auVar176 = vbroadcastss_avx512vl(in_ZMM30._0_16_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              in_ZMM15 = ZEXT3264(CONCAT428((uint)(bVar148 >> 7) * auVar176._28_4_ |
                                            (uint)!(bool)(bVar148 >> 7) * in_ZMM15._28_4_,
                                            CONCAT424((uint)bVar12 * auVar176._24_4_ |
                                                      (uint)!bVar12 * in_ZMM15._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar176._20_4_ |
                                                                (uint)!bVar11 * in_ZMM15._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar176._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM15._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar176._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM15.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar176._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM15._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar176._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM15._4_4_,
                                                                           (uint)(bVar148 & 1) *
                                                                           auVar176._0_4_ |
                                                                           (uint)!(bool)(bVar148 & 1
                                                                                        ) *
                                                                           in_ZMM15._0_4_))))))));
              auVar175 = vpermps_avx512vl(auVar175,in_ZMM30._0_32_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              in_ZMM14 = ZEXT3264(CONCAT428((uint)(bVar148 >> 7) * auVar175._28_4_ |
                                            (uint)!(bool)(bVar148 >> 7) * in_ZMM14._28_4_,
                                            CONCAT424((uint)bVar12 * auVar175._24_4_ |
                                                      (uint)!bVar12 * in_ZMM14._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar175._20_4_ |
                                                                (uint)!bVar11 * in_ZMM14._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar175._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM14._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar175._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM14.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar175._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM14._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar175._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM14._4_4_,
                                                                           (uint)(bVar148 & 1) *
                                                                           auVar175._0_4_ |
                                                                           (uint)!(bool)(bVar148 & 1
                                                                                        ) *
                                                                           in_ZMM14._0_4_))))))));
              auVar175 = vpermps_avx512vl(auVar177,in_ZMM30._0_32_);
              bVar7 = (bool)(bVar148 >> 1 & 1);
              bVar8 = (bool)(bVar148 >> 2 & 1);
              bVar9 = (bool)(bVar148 >> 3 & 1);
              bVar10 = (bool)(bVar148 >> 4 & 1);
              bVar11 = (bool)(bVar148 >> 5 & 1);
              bVar12 = (bool)(bVar148 >> 6 & 1);
              in_ZMM13 = ZEXT3264(CONCAT428((uint)(bVar148 >> 7) * auVar175._28_4_ |
                                            (uint)!(bool)(bVar148 >> 7) * in_ZMM13._28_4_,
                                            CONCAT424((uint)bVar12 * auVar175._24_4_ |
                                                      (uint)!bVar12 * in_ZMM13._24_4_,
                                                      CONCAT420((uint)bVar11 * auVar175._20_4_ |
                                                                (uint)!bVar11 * in_ZMM13._20_4_,
                                                                CONCAT416((uint)bVar10 *
                                                                          auVar175._16_4_ |
                                                                          (uint)!bVar10 *
                                                                          in_ZMM13._16_4_,
                                                                          CONCAT412((uint)bVar9 *
                                                                                    auVar175._12_4_
                                                                                    | (uint)!bVar9 *
                                                                                      in_ZMM13.
                                                  _12_4_,CONCAT48((uint)bVar8 * auVar175._8_4_ |
                                                                  (uint)!bVar8 * in_ZMM13._8_4_,
                                                                  CONCAT44((uint)bVar7 *
                                                                           auVar175._4_4_ |
                                                                           (uint)!bVar7 *
                                                                           in_ZMM13._4_4_,
                                                                           (uint)(bVar148 & 1) *
                                                                           auVar175._0_4_ |
                                                                           (uint)!(bool)(bVar148 & 1
                                                                                        ) *
                                                                           in_ZMM13._0_4_))))))));
              auVar159 = auVar165;
            } while (bVar144 != 0);
          }
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar158 = vsubps_avx512vl(auVar158,auVar186);
          auVar175 = vmulps_avx512vl(auVar186,auVar166);
          auVar176 = vmulps_avx512vl(auVar186,auVar167);
          auVar177 = vmulps_avx512vl(auVar186,auVar168);
          auVar175 = vfmadd231ps_avx512vl(auVar175,auVar158,auVar194);
          auVar176 = vfmadd231ps_avx512vl(auVar176,auVar158,auVar195);
          auVar177 = vfmadd231ps_avx512vl(auVar177,auVar158,auVar162);
          auVar178 = vmulps_avx512vl(auVar186,auVar169);
          auVar179 = vmulps_avx512vl(auVar186,auVar170);
          auVar159 = vmulps_avx512vl(auVar186,auVar171);
          auVar178 = vfmadd231ps_avx512vl(auVar178,auVar158,auVar196);
          auVar179 = vfmadd231ps_avx512vl(auVar179,auVar158,auVar197);
          auVar180 = vfmadd231ps_avx512vl(auVar159,auVar158,auVar163);
          auVar159 = vmulps_avx512vl(auVar186,auVar172);
          auVar181 = vmulps_avx512vl(auVar186,auVar173);
          auVar182 = vmulps_avx512vl(auVar186,auVar174);
          auVar159 = vfmadd231ps_avx512vl(auVar159,auVar158,in_ZMM6._0_32_);
          auVar181 = vfmadd231ps_avx512vl(auVar181,auVar158,auVar198);
          auVar182 = vfmadd231ps_avx512vl(auVar182,auVar158,auVar164);
          fVar249 = auVar186._0_4_;
          auVar372._0_4_ = in_ZMM15._0_4_ * fVar249;
          fVar257 = auVar186._4_4_;
          auVar372._4_4_ = in_ZMM15._4_4_ * fVar257;
          fVar258 = auVar186._8_4_;
          auVar372._8_4_ = in_ZMM15._8_4_ * fVar258;
          fVar259 = auVar186._12_4_;
          auVar372._12_4_ = in_ZMM15._12_4_ * fVar259;
          fVar260 = auVar186._16_4_;
          auVar372._16_4_ = in_ZMM15._16_4_ * fVar260;
          fVar261 = auVar186._20_4_;
          auVar372._20_4_ = in_ZMM15._20_4_ * fVar261;
          fVar262 = auVar186._24_4_;
          auVar372._28_36_ = in_ZMM15._28_36_;
          auVar372._24_4_ = in_ZMM15._24_4_ * fVar262;
          auVar369._0_4_ = in_ZMM14._0_4_ * fVar249;
          auVar369._4_4_ = in_ZMM14._4_4_ * fVar257;
          auVar369._8_4_ = in_ZMM14._8_4_ * fVar258;
          auVar369._12_4_ = in_ZMM14._12_4_ * fVar259;
          auVar369._16_4_ = in_ZMM14._16_4_ * fVar260;
          auVar369._20_4_ = in_ZMM14._20_4_ * fVar261;
          auVar369._28_36_ = in_ZMM14._28_36_;
          auVar369._24_4_ = in_ZMM14._24_4_ * fVar262;
          auVar387._0_4_ = in_ZMM13._0_4_ * fVar249;
          auVar387._4_4_ = in_ZMM13._4_4_ * fVar257;
          auVar387._8_4_ = in_ZMM13._8_4_ * fVar258;
          auVar387._12_4_ = in_ZMM13._12_4_ * fVar259;
          auVar387._16_4_ = in_ZMM13._16_4_ * fVar260;
          auVar387._20_4_ = in_ZMM13._20_4_ * fVar261;
          auVar387._28_36_ = in_ZMM13._28_36_;
          auVar387._24_4_ = in_ZMM13._24_4_ * fVar262;
          auVar183 = vfmadd231ps_avx512vl(auVar372._0_32_,auVar158,auVar285._0_32_);
          auVar184 = vfmadd231ps_avx512vl(auVar369._0_32_,auVar158,auVar199);
          auVar185 = vfmadd231ps_avx512vl(auVar387._0_32_,auVar158,auVar165);
          auVar56._4_4_ = auVar181._4_4_ * auVar180._4_4_;
          auVar56._0_4_ = auVar181._0_4_ * auVar180._0_4_;
          auVar56._8_4_ = auVar181._8_4_ * auVar180._8_4_;
          auVar56._12_4_ = auVar181._12_4_ * auVar180._12_4_;
          auVar56._16_4_ = auVar181._16_4_ * auVar180._16_4_;
          auVar56._20_4_ = auVar181._20_4_ * auVar180._20_4_;
          auVar56._24_4_ = auVar181._24_4_ * auVar180._24_4_;
          auVar56._28_4_ = auVar186._28_4_;
          auVar152 = vfmsub231ps_fma(auVar56,auVar179,auVar182);
          auVar278._0_4_ = auVar182._0_4_ * auVar178._0_4_;
          auVar278._4_4_ = auVar182._4_4_ * auVar178._4_4_;
          auVar278._8_4_ = auVar182._8_4_ * auVar178._8_4_;
          auVar278._12_4_ = auVar182._12_4_ * auVar178._12_4_;
          auVar278._16_4_ = auVar182._16_4_ * auVar178._16_4_;
          auVar278._20_4_ = auVar182._20_4_ * auVar178._20_4_;
          auVar278._28_36_ = auVar285._28_36_;
          auVar278._24_4_ = auVar182._24_4_ * auVar178._24_4_;
          auVar157 = vfmsub231ps_fma(auVar278._0_32_,auVar180,auVar159);
          auVar285._0_4_ = auVar179._0_4_ * auVar159._0_4_;
          auVar285._4_4_ = auVar179._4_4_ * auVar159._4_4_;
          auVar285._8_4_ = auVar179._8_4_ * auVar159._8_4_;
          auVar285._12_4_ = auVar179._12_4_ * auVar159._12_4_;
          auVar285._16_4_ = auVar179._16_4_ * auVar159._16_4_;
          auVar285._20_4_ = auVar179._20_4_ * auVar159._20_4_;
          auVar285._28_36_ = in_ZMM6._28_36_;
          auVar285._24_4_ = auVar179._24_4_ * auVar159._24_4_;
          auVar153 = vfmsub231ps_fma(auVar285._0_32_,auVar178,auVar181);
          auVar158 = vmulps_avx512vl(auVar176,auVar182);
          auVar186 = vfmsub231ps_avx512vl(auVar158,auVar181,auVar177);
          auVar158 = vmulps_avx512vl(auVar177,auVar159);
          auVar182 = vfmsub231ps_avx512vl(auVar158,auVar175,auVar182);
          auVar158 = vmulps_avx512vl(auVar175,auVar181);
          auVar159 = vfmsub231ps_avx512vl(auVar158,auVar176,auVar159);
          auVar158 = vmulps_avx512vl(auVar179,auVar177);
          auVar181 = vfmsub231ps_avx512vl(auVar158,auVar176,auVar180);
          auVar158 = vmulps_avx512vl(auVar180,auVar175);
          auVar187 = vfmsub231ps_avx512vl(auVar158,auVar177,auVar178);
          auVar158 = vmulps_avx512vl(auVar178,auVar176);
          auVar188 = vfmsub231ps_avx512vl(auVar158,auVar175,auVar179);
          auVar158 = vmulps_avx512vl(auVar177,ZEXT1632(auVar153));
          auVar158 = vfmadd231ps_avx512vl(auVar158,ZEXT1632(auVar157),auVar176);
          auVar189 = vfmadd231ps_avx512vl(auVar158,ZEXT1632(auVar152),auVar175);
          auVar158 = vdivps_avx(ZEXT1632(auVar152),auVar189);
          auVar186 = vdivps_avx(auVar186,auVar189);
          auVar175 = vdivps_avx(auVar181,auVar189);
          auVar176 = vdivps_avx(ZEXT1632(auVar157),auVar189);
          auVar177 = vdivps_avx(auVar182,auVar189);
          auVar178 = vdivps_avx(auVar187,auVar189);
          auVar179 = vdivps_avx(ZEXT1632(auVar153),auVar189);
          auVar159 = vdivps_avx(auVar159,auVar189);
          auVar181 = vdivps_avx(auVar188,auVar189);
          fVar249 = auVar185._0_4_;
          fVar257 = auVar185._4_4_;
          auVar57._4_4_ = fVar257 * auVar179._4_4_;
          auVar57._0_4_ = fVar249 * auVar179._0_4_;
          fVar258 = auVar185._8_4_;
          auVar57._8_4_ = fVar258 * auVar179._8_4_;
          fVar259 = auVar185._12_4_;
          auVar57._12_4_ = fVar259 * auVar179._12_4_;
          fVar260 = auVar185._16_4_;
          auVar57._16_4_ = fVar260 * auVar179._16_4_;
          fVar261 = auVar185._20_4_;
          auVar57._20_4_ = fVar261 * auVar179._20_4_;
          fVar262 = auVar185._24_4_;
          auVar57._24_4_ = fVar262 * auVar179._24_4_;
          auVar57._28_4_ = auVar188._28_4_;
          auVar58._4_4_ = fVar257 * auVar159._4_4_;
          auVar58._0_4_ = fVar249 * auVar159._0_4_;
          auVar58._8_4_ = fVar258 * auVar159._8_4_;
          auVar58._12_4_ = fVar259 * auVar159._12_4_;
          auVar58._16_4_ = fVar260 * auVar159._16_4_;
          auVar58._20_4_ = fVar261 * auVar159._20_4_;
          auVar58._24_4_ = fVar262 * auVar159._24_4_;
          auVar58._28_4_ = auVar189._28_4_;
          auVar59._4_4_ = fVar257 * auVar181._4_4_;
          auVar59._0_4_ = fVar249 * auVar181._0_4_;
          auVar59._8_4_ = fVar258 * auVar181._8_4_;
          auVar59._12_4_ = fVar259 * auVar181._12_4_;
          auVar59._16_4_ = fVar260 * auVar181._16_4_;
          auVar59._20_4_ = fVar261 * auVar181._20_4_;
          auVar59._24_4_ = fVar262 * auVar181._24_4_;
          auVar59._28_4_ = auVar180._28_4_;
          auVar152 = vfmadd231ps_fma(auVar57,auVar184,auVar176);
          auVar157 = vfmadd231ps_fma(auVar58,auVar184,auVar177);
          auVar155 = vfmadd231ps_fma(auVar59,auVar178,auVar184);
          auVar154 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar183,auVar158);
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar183,auVar186);
          auVar152 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar175,auVar183);
        }
        auVar346._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
        auVar346._8_4_ = auVar154._8_4_ ^ 0x80000000;
        auVar346._12_4_ = auVar154._12_4_ ^ 0x80000000;
        auVar346._16_4_ = 0x80000000;
        auVar346._20_4_ = 0x80000000;
        auVar346._24_4_ = 0x80000000;
        auVar346._28_4_ = 0x80000000;
        auVar332._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
        auVar332._8_4_ = auVar153._8_4_ ^ 0x80000000;
        auVar332._12_4_ = auVar153._12_4_ ^ 0x80000000;
        auVar332._16_4_ = 0x80000000;
        auVar332._20_4_ = 0x80000000;
        auVar332._24_4_ = 0x80000000;
        auVar332._28_4_ = 0x80000000;
        auVar338._0_8_ = auVar152._0_8_ ^ 0x8000000080000000;
        auVar338._8_4_ = auVar152._8_4_ ^ 0x80000000;
        auVar338._12_4_ = auVar152._12_4_ ^ 0x80000000;
        auVar338._16_4_ = 0x80000000;
        auVar338._20_4_ = 0x80000000;
        auVar338._24_4_ = 0x80000000;
        auVar338._28_4_ = 0x80000000;
        auVar180 = *(undefined1 (*) [32])ray;
        auVar182 = *(undefined1 (*) [32])(ray + 0x20);
        auVar183 = *(undefined1 (*) [32])(ray + 0x40);
        auVar184 = *(undefined1 (*) [32])(ray + 0x80);
        auVar185 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar187 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar152 = vfmadd231ps_fma(auVar346,auVar183,auVar179);
        auVar157 = vfmadd231ps_fma(auVar332,auVar183,auVar159);
        auVar153 = vfmadd231ps_fma(auVar338,auVar183,auVar181);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar182,auVar176);
        auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar182,auVar177);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar182,auVar178);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar180,auVar158);
        auVar157 = vfmadd231ps_fma(ZEXT1632(auVar157),auVar180,auVar186);
        *(undefined1 (*) [32])ray = ZEXT1632(auVar152);
        auVar152 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar180,auVar175);
        *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar157);
        *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar152);
        auVar179 = vmulps_avx512vl(auVar179,auVar187);
        auVar159 = vmulps_avx512vl(auVar159,auVar187);
        auVar181 = vmulps_avx512vl(auVar181,auVar187);
        auVar176 = vfmadd231ps_avx512vl(auVar179,auVar185,auVar176);
        auVar177 = vfmadd231ps_avx512vl(auVar159,auVar185,auVar177);
        auVar178 = vfmadd231ps_avx512vl(auVar181,auVar185,auVar178);
        auVar152 = vfmadd231ps_fma(auVar176,auVar184,auVar158);
        auVar157 = vfmadd231ps_fma(auVar177,auVar184,auVar186);
        auVar153 = vfmadd231ps_fma(auVar178,auVar184,auVar175);
        *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar152);
        *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar157);
        *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar153);
        local_58 = context->args;
        local_140 = vpmovm2d_avx512vl(uVar145 & 0xffffffff);
        local_60 = pRVar5;
        (**(code **)(local_68 + 0xe8))(local_140,local_68 + 0x58,ray);
        local_2a0._0_8_ = auVar180._0_8_;
        local_2a0._8_8_ = auVar180._8_8_;
        local_2a0._16_8_ = auVar180._16_8_;
        local_2a0._24_8_ = auVar180._24_8_;
        *(undefined8 *)ray = local_2a0._0_8_;
        *(undefined8 *)(ray + 8) = local_2a0._8_8_;
        *(undefined8 *)(ray + 0x10) = local_2a0._16_8_;
        *(undefined8 *)(ray + 0x18) = local_2a0._24_8_;
        local_280 = auVar182._0_8_;
        uStack_278 = auVar182._8_8_;
        uStack_270 = auVar182._16_8_;
        uStack_268 = auVar182._24_8_;
        *(undefined1 (*) [8])(ray + 0x20) = local_280;
        *(undefined8 *)(ray + 0x28) = uStack_278;
        *(undefined8 *)(ray + 0x30) = uStack_270;
        *(undefined8 *)(ray + 0x38) = uStack_268;
        local_260._0_8_ = auVar183._0_8_;
        local_260._8_8_ = auVar183._8_8_;
        local_260._16_8_ = auVar183._16_8_;
        local_260._24_8_ = auVar183._24_8_;
        *(undefined8 *)(ray + 0x40) = local_260._0_8_;
        *(undefined8 *)(ray + 0x48) = local_260._8_8_;
        *(undefined8 *)(ray + 0x50) = local_260._16_8_;
        *(undefined8 *)(ray + 0x58) = local_260._24_8_;
        local_220._0_8_ = auVar184._0_8_;
        local_220._8_8_ = auVar184._8_8_;
        local_220._16_8_ = auVar184._16_8_;
        local_220._24_8_ = auVar184._24_8_;
        *(undefined8 *)(ray + 0x80) = local_220._0_8_;
        *(undefined8 *)(ray + 0x88) = local_220._8_8_;
        *(undefined8 *)(ray + 0x90) = local_220._16_8_;
        *(undefined8 *)(ray + 0x98) = local_220._24_8_;
        local_2c0._0_8_ = auVar185._0_8_;
        local_2c0._8_8_ = auVar185._8_8_;
        local_2c0._16_8_ = auVar185._16_8_;
        local_2c0._24_8_ = auVar185._24_8_;
        *(undefined8 *)(ray + 0xa0) = local_2c0._0_8_;
        *(undefined8 *)(ray + 0xa8) = local_2c0._8_8_;
        *(undefined8 *)(ray + 0xb0) = local_2c0._16_8_;
        *(undefined8 *)(ray + 0xb8) = local_2c0._24_8_;
        local_240 = auVar187._0_8_;
        uStack_238 = auVar187._8_8_;
        uStack_230 = auVar187._16_8_;
        uStack_228 = auVar187._24_8_;
        *(undefined1 (*) [8])(ray + 0xc0) = local_240;
        *(undefined8 *)(ray + 200) = uStack_238;
        *(undefined8 *)(ray + 0xd0) = uStack_230;
        *(undefined8 *)(ray + 0xd8) = uStack_228;
        uVar16 = vcmpps_avx512vl(ZEXT832(0) << 0x20,*(undefined1 (*) [32])(ray + 0x100),0xe);
        *this = SUB81(uVar16,0);
        pRVar5->instID[0] = 0xffffffff;
        pRVar5->instPrimID[0] = 0xffffffff;
      }
      goto LAB_008f4bb9;
    }
  }
  *this = (InstanceArrayIntersectorKMB<8>)0x0;
LAB_008f4bb9:
  return (vbool<8>_conflict)(__mmask8)this;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }